

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_a64_insn(CPUARMState_conflict *env,DisasContext_conflict1 *s)

{
  target_ulong *ptVar1;
  abi_ptr addr;
  void *pvVar2;
  uc_struct_conflict2 *val;
  target_ulong val_00;
  hook *phVar3;
  unsigned_long uVar4;
  uint64_t pc;
  byte *a1;
  byte *a1_00;
  TCGArg a2;
  TCGArg a2_00;
  TCGv_ptr pTVar5;
  bool bVar6;
  uint8_t **ppuVar7;
  MemOp memop;
  char cVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  uintptr_t o_3;
  TCGv_i32 pTVar12;
  TCGv_i64 pTVar13;
  TCGv_i64 pTVar14;
  TCGContext_conflict1 *pTVar15;
  AArch64DecodeFn **ppAVar16;
  undefined7 uVar27;
  TCGLabel *pTVar17;
  TCGTemp *pTVar18;
  TCGContext_conflict1 *pTVar19;
  TCGv_i32 pTVar20;
  TCGv_i32 pTVar21;
  undefined8 *puVar22;
  TCGContext_conflict1 *pTVar23;
  int *piVar24;
  TCGContext_conflict1 *pTVar25;
  bool iss_sf;
  uintptr_t o_5;
  uint *a2_01;
  TCGArg TVar28;
  TCGv_i64 *ppTVar29;
  uintptr_t o_8;
  list_item *plVar30;
  ulong uVar31;
  undefined1 *puVar32;
  TCGArg extraout_RDX;
  TCGContext_conflict1 *extraout_RDX_00;
  _Bool _Var33;
  a64_shift_type shift_type;
  uintptr_t o_6;
  uint64_t uVar34;
  ulong uVar35;
  TCGv_i64 pTVar36;
  undefined1 *puVar37;
  undefined1 *puVar38;
  code **ppcVar39;
  byte bVar40;
  uintptr_t o_14;
  uint uVar41;
  uint uVar42;
  undefined4 uVar43;
  TCGOpcode TVar44;
  code *pcVar45;
  TCGPool *pc_00;
  int64_t val_01;
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o_40;
  ulong uVar46;
  ulong uVar47;
  TCGContext_conflict1 *args_00;
  undefined1 extend;
  TCGRegSet TVar48;
  TCGContext_conflict1 *pTVar49;
  uint uVar50;
  int iVar51;
  int iVar52;
  uintptr_t o_27;
  uintptr_t uVar53;
  uint uVar54;
  int iVar55;
  uintptr_t o_2;
  TCGTemp *pTVar56;
  TCGContext_conflict1 *pTVar57;
  uint uVar58;
  uintptr_t o;
  undefined1 *puVar59;
  long lVar60;
  uintptr_t o_1;
  TCGTemp *pTVar61;
  TCGv_i32 v;
  bool bVar62;
  code *pcStack_100;
  undefined1 auStack_f8 [8];
  uintptr_t o_12;
  TCGContext_conflict1 *local_e8;
  TCGContext_conflict1 *local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  TCGTemp *args [1];
  TCGTemp *local_b0;
  ulong local_90;
  _Bool local_88;
  char local_80;
  uint local_78;
  uint local_70;
  TCGContext_conflict1 *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  char *pcVar26;
  
  puVar38 = auStack_f8;
  ppcVar39 = (code **)auStack_f8;
  puVar32 = auStack_f8;
  puVar59 = auStack_f8;
  addr = (s->base).pc_next;
  s->pc_curr = addr;
  iVar55 = s->sctlr_b;
  pcStack_100 = (code *)0x6987e6;
  uVar9 = cpu_ldl_code_aarch64(env,addr);
  uVar11 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  if (iVar55 == 0) {
    uVar11 = uVar9;
  }
  s->insn = uVar11;
  ptVar1 = &(s->base).pc_next;
  *ptVar1 = *ptVar1 + 4;
  plVar30 = env->uc->hook[2].head;
  local_e0 = (TCGContext_conflict1 *)(ulong)uVar11;
  if (plVar30 != (list_item *)0x0) {
    uVar35 = s->pc_curr;
LAB_0069881b:
    pvVar2 = plVar30->data;
    if ((*(ulong *)((long)pvVar2 + 0x18) <= *(ulong *)((long)pvVar2 + 0x20) &&
         (*(ulong *)((long)pvVar2 + 0x20) < uVar35 || uVar35 < *(ulong *)((long)pvVar2 + 0x18))) ||
       (*(char *)((long)pvVar2 + 0x14) == '\x01')) goto LAB_0069884e;
    pTVar23 = env->uc->tcg_ctx;
    pcStack_100 = (code *)0x69887a;
    tcg_gen_op2_aarch64(pTVar23,INDEX_op_movi_i64,(TCGArg)(pTVar23->cpu_pc_arm64 + (long)pTVar23),
                        uVar35);
    val = env->uc;
    val_00 = s->pc_curr;
    pcStack_100 = (code *)0x69889c;
    local_e8 = (TCGContext_conflict1 *)s;
    local_d0 = (TCGContext_conflict1 *)env;
    pTVar12 = tcg_const_i32_aarch64(pTVar23,4);
    pcStack_100 = (code *)0x6988aa;
    pTVar13 = tcg_const_i64_aarch64(pTVar23,(int64_t)val);
    pcStack_100 = (code *)0x6988b8;
    pTVar14 = tcg_const_i64_aarch64(pTVar23,val_00);
    local_d8 = (TCGContext_conflict1 *)(pTVar13 + (long)pTVar23);
    pTVar61 = (TCGTemp *)(pTVar14 + (long)pTVar23);
    pTVar56 = (TCGTemp *)(pTVar12 + (long)pTVar23);
    local_40 = (TCGTemp *)0x0;
    o_12 = (uintptr_t)pTVar56;
    local_58 = local_d8;
    local_50 = pTVar61;
    local_48 = pTVar56;
    if (val->hooks_count[2] == 1) {
      for (plVar30 = val->hook[2].head; plVar30 != (list_item *)0x0; plVar30 = plVar30->next) {
        phVar3 = (hook *)plVar30->data;
        if (phVar3->to_delete == false) {
          pcStack_100 = (code *)0x698922;
          pTVar13 = tcg_const_i64_aarch64(pTVar23,(int64_t)phVar3->user_data);
          pcStack_100 = (code *)0x698947;
          local_40 = (TCGTemp *)(pTVar13 + (long)pTVar23);
          (*val->add_inline_hook)(val,phVar3,&local_58,4);
          pcStack_100 = (code *)0x698952;
          tcg_temp_free_internal_aarch64(pTVar23,(TCGTemp *)(pTVar13 + (long)pTVar23));
        }
      }
    }
    else {
      pcStack_100 = (code *)0x698965;
      pTVar12 = tcg_const_i32_aarch64(pTVar23,2);
      local_b0 = (TCGTemp *)(pTVar12 + (long)pTVar23);
      pcStack_100 = (code *)0x698993;
      args[0] = pTVar56;
      tcg_gen_callN_aarch64(pTVar23,helper_uc_tracecode,(TCGTemp *)0x0,4,args);
      pcStack_100 = (code *)0x69899e;
      tcg_temp_free_internal_aarch64(pTVar23,local_b0);
    }
    pcStack_100 = (code *)0x6989a9;
    tcg_temp_free_internal_aarch64(pTVar23,pTVar61);
    pcStack_100 = (code *)0x6989b6;
    tcg_temp_free_internal_aarch64(pTVar23,(TCGTemp *)local_d8);
    pcStack_100 = (code *)0x6989c3;
    tcg_temp_free_internal_aarch64(pTVar23,(TCGTemp *)o_12);
    pcStack_100 = (code *)0x6989cb;
    check_exit_request_aarch64(pTVar23);
    s = (DisasContext_conflict1 *)local_e8;
    env = (CPUARMState_conflict *)local_d0;
  }
LAB_006989da:
  pTVar15 = local_e0;
  *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 0;
  lVar60 = *(long *)&((TCGContext_conflict1 *)s)->nb_labels;
  uVar11 = (uint)local_e0;
  uVar50 = (uint)((ulong)local_e0 >> 0x10);
  pTVar23 = (TCGContext_conflict1 *)o_12;
  if (((*(byte *)(lVar60 + 0x60) & 0xf) != 0) &&
     (*(int *)((long)&((TCGContext_conflict1 *)s)->pool_current + 4) == 1)) {
    uVar54 = (uint)((TCGContext_conflict1 *)s)->current_frame_offset;
    uVar41 = uVar54 & 0xf;
    uVar46 = (ulong)(uVar41 << 4);
    uVar47 = (ulong)((TCGContext_conflict1 *)s)->pool_end >>
             (*(byte *)(*(long *)(((TCGContext_conflict1 *)env)->temps[0xd3].val + 0x290) + 4) &
             0x3f) & *(ulong *)((long)env + (uVar46 - 0xd0)) >> 6;
    uVar35 = *(ulong *)(*(long *)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x290) + 8);
    if (((uVar35 | 0x200) & *(ulong *)(*(long *)((long)env + (uVar46 - 200)) + 0x10 + uVar47 * 0x40)
        ) == ((ulong)((TCGContext_conflict1 *)s)->pool_end & uVar35)) {
      uVar41 = *(uint *)(*(long *)((long)env + (ulong)uVar41 * 0x2b8 + -0x1ec0) + 8 +
                        (uVar47 & 0xffffffff) * 0x10) & 0x100000;
      *(char *)((long)&((TCGContext_conflict1 *)s)->code_gen_buffer_size + 1) =
           (char)(uVar41 >> 0x14);
      bVar40 = (byte)((TCGContext_conflict1 *)s)->code_gen_buffer_size;
      if ((bVar40 != 0) && (uVar41 != 0)) {
        uVar41 = (uint)bVar40;
        if ((uVar11 & 0xfffff01f) == 0xd503201f) {
          uVar42 = (uint)((ulong)local_e0 >> 5) & 0x7f;
          if (uVar42 < 0x22) {
            if (((uVar42 != 0x19) && (uVar42 != 0x1b)) ||
               ((uVar41 == 3 &&
                (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 6) != '\0'))))
            goto LAB_0069a3b9;
          }
          else if (uVar42 == 0x22) {
            if (uVar41 == 3) goto LAB_0069a3b9;
          }
          else if (uVar42 == 0x24) {
            if (uVar41 == 2) goto LAB_0069a3b9;
          }
          else if (uVar42 != 0x26) {
LAB_0069a3b9:
            uVar34._0_4_ = ((TCGContext_conflict1 *)s)->nb_temps;
            uVar34._4_4_ = ((TCGContext_conflict1 *)s)->nb_indirects;
            if ((uVar54 != 0x17) ||
               (uVar9 = 3, *(char *)((long)&((TCGContext_conflict1 *)s)->frame_end + 4) == '\0')) {
              uVar9 = 1;
              if (1 < (int)*(uint32_t *)&((TCGContext_conflict1 *)s)->code_gen_epilogue) {
                uVar9 = *(uint32_t *)&((TCGContext_conflict1 *)s)->code_gen_epilogue;
              }
            }
            pcStack_100 = (code *)0x69a3f6;
            gen_exception_insn(s,uVar34,1,uVar41 | 0x34000000,uVar9);
            return;
          }
        }
        else if (((uVar11 & 0xffe0001f) + 0x2be00000 & 0xffc0001f) != 0) goto LAB_0069a3b9;
      }
      goto LAB_00698b26;
    }
    *(undefined1 *)((long)&((TCGContext_conflict1 *)s)->code_gen_buffer_size + 1) = 0;
    uVar54 = (uint)((ulong)local_e0 >> 0x19);
    uVar41 = uVar54 & 0x7f;
    puVar37 = auStack_f8;
    switch(uVar54 & 0xf) {
    case 0:
    case 1:
    case 3:
      goto switchD_00698b3f_caseD_0;
    case 2:
      goto switchD_00698b3f_caseD_2;
    default:
      goto switchD_00698b3f_caseD_4;
    case 5:
    case 0xd:
      goto switchD_00698b3f_caseD_5;
    case 7:
    case 0xf:
      goto switchD_00698b3f_caseD_7;
    case 8:
    case 9:
      goto switchD_00698b3f_caseD_8;
    case 10:
    case 0xb:
      goto switchD_00698b3f_caseD_a;
    }
  }
LAB_00698b26:
  uVar54 = (uint)((ulong)local_e0 >> 0x19);
  uVar41 = uVar54 & 0x7f;
  puVar37 = auStack_f8;
  switch(uVar54 & 0xf) {
  case 0:
  case 1:
  case 3:
    goto switchD_00698b3f_caseD_0;
  case 2:
switchD_00698b3f_caseD_2:
    puVar37 = auStack_f8;
    if ((*(byte *)(lVar60 + 0x5c) & 0xf) != 0) {
      pcStack_100 = (code *)0x6990f0;
      _Var33 = disas_sve_aarch64(s,uVar11);
      puVar37 = auStack_f8;
      pTVar23 = (TCGContext_conflict1 *)o_12;
      if (_Var33) goto LAB_0069a72e;
    }
    goto switchD_00698b3f_caseD_0;
  default:
switchD_00698b3f_caseD_4:
    uVar46._0_4_ = ((TCGContext_conflict1 *)s)->nb_temps;
    uVar46._4_4_ = ((TCGContext_conflict1 *)s)->nb_indirects;
    uVar4 = ((TCGContext_conflict1 *)s)->free_temps[1].l[1];
    for (puVar22 = *(undefined8 **)(uVar4 + 0x418); puVar22 != (undefined8 *)0x0;
        puVar22 = (undefined8 *)*puVar22) {
      lVar60 = puVar22[1];
      if ((*(ulong *)(lVar60 + 0x20) < *(ulong *)(lVar60 + 0x18) ||
           uVar46 <= *(ulong *)(lVar60 + 0x20) && *(ulong *)(lVar60 + 0x18) <= uVar46) &&
         (*(char *)(lVar60 + 0x14) != '\x01')) goto LAB_00698e7c;
    }
    for (puVar22 = *(undefined8 **)(uVar4 + 0x430); puVar22 != (undefined8 *)0x0;
        puVar22 = (undefined8 *)*puVar22) {
      lVar60 = puVar22[1];
      if ((*(ulong *)(lVar60 + 0x20) < *(ulong *)(lVar60 + 0x18) ||
           uVar46 <= *(ulong *)(lVar60 + 0x20) && *(ulong *)(lVar60 + 0x18) <= uVar46) &&
         (*(char *)(lVar60 + 0x14) != '\x01')) goto LAB_00698e7c;
    }
    goto LAB_00698e9c;
  case 5:
  case 0xd:
switchD_00698b3f_caseD_5:
    uVar35 = (ulong)local_e0 >> 0x15;
    uVar54 = (uint)uVar35;
    uVar46 = (ulong)local_e0 >> 10;
    uVar42 = (uint)uVar46;
    uVar10 = uVar42 & 0x3f;
    if ((uVar11 >> 0x1c & 1) == 0) {
      if ((uVar11 >> 0x18 & 1) != 0) {
        uVar54 = uVar11 & 0x1f;
        uVar53 = *(uintptr_t *)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        if ((uVar11 >> 0x15 & 1) == 0) {
          shift_type = (a64_shift_type)((ulong)local_e0 >> 0x16) & A64_SHIFT_TYPE_ROR;
          pcStack_100 = (code *)0x699303;
          local_e8 = (TCGContext_conflict1 *)s;
          pTVar15 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar54);
          pTVar23 = local_e8;
          if ((shift_type == A64_SHIFT_TYPE_ROR) || (-1 < (int)uVar11 && 0x1f < uVar10))
          goto switchD_00699076_caseD_1;
          uVar50 = (uint)local_e0;
          uVar35 = (ulong)local_e0 >> 0x10;
          uVar11 = (uint)((ulong)local_e0 >> 0x1f) & 1;
          pcStack_100 = (code *)0x699354;
          o_12 = uVar53;
          local_d8 = pTVar15;
          local_d0 = (TCGContext_conflict1 *)
                     read_cpu_reg_aarch64
                               ((DisasContext_conflict1 *)local_e8,
                                (uint)((ulong)local_e0 >> 5) & 0x1f,uVar11);
          pTVar19 = (TCGContext_conflict1 *)o_12;
          pcStack_100 = (code *)0x69936b;
          pTVar13 = read_cpu_reg_aarch64
                              ((DisasContext_conflict1 *)pTVar23,(uint)uVar35 & 0x1f,uVar11);
          pcStack_100 = (code *)0x699385;
          shift_reg_imm(pTVar19,pTVar13,pTVar13,uVar11,shift_type,uVar10);
          pcStack_100 = (code *)0x699394;
          pTVar56 = tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false);
          pTVar57 = (TCGContext_conflict1 *)((long)pTVar56 - (long)pTVar19);
          if ((uVar50 >> 0x1d & 1) == 0) {
            if ((uVar50 >> 0x1e & 1) == 0) {
              pcStack_100 = (code *)0x6993d1;
              tcg_gen_op3_aarch64(pTVar19,INDEX_op_add_i64,(TCGArg)pTVar56,
                                  (long)&local_d0->pool_cur + (long)pTVar19,
                                  (TCGArg)(pTVar13 + (long)pTVar19));
            }
            else {
              pcStack_100 = (code *)0x69b7bd;
              tcg_gen_sub_i64(pTVar19,(TCGv_i64)pTVar57,(TCGv_i64)local_d0,pTVar13);
            }
          }
          else if ((uVar50 >> 0x1e & 1) == 0) {
            pcStack_100 = (code *)0x69aa97;
            gen_add_CC(pTVar19,uVar11,(TCGv_i64)pTVar57,(TCGv_i64)local_d0,pTVar13);
          }
          else {
            pcStack_100 = (code *)0x69b7cc;
            gen_sub_CC(pTVar19,uVar11,(TCGv_i64)pTVar57,(TCGv_i64)local_d0,pTVar13);
          }
          pTVar15 = local_d8;
          if ((int)(uint)local_e0 < 0) {
            if (local_d8 == pTVar57) goto LAB_0069b800;
            puVar59 = (undefined1 *)((long)&local_d8->pool_cur + (long)pTVar19);
            goto LAB_0069b7fb;
          }
          goto LAB_0069b7de;
        }
        local_e8 = (TCGContext_conflict1 *)s;
        if (((ulong)local_e0 & 0xc00000) != 0 || 4 < (uVar42 & 7)) goto switchD_00699076_caseD_1;
        uVar35 = (ulong)local_e0 >> 5;
        uVar46 = (ulong)local_e0 >> 0xd;
        if ((uVar11 >> 0x1d & 1) == 0) {
          local_d8 = *(TCGContext_conflict1 **)(uVar53 + 0xaeb0 + (ulong)uVar54 * 8);
          o_12 = uVar53;
        }
        else {
          pcStack_100 = (code *)0x69a9bd;
          o_12 = uVar53;
          local_d8 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar54);
        }
        uVar54 = (uint)((ulong)local_e0 >> 0x1f) & 1;
        pcStack_100 = (code *)0x69a9da;
        pTVar13 = read_cpu_reg_sp_aarch64(s,(uint)uVar35 & 0x1f,uVar54);
        pcStack_100 = (code *)0x69a9ea;
        pTVar14 = read_cpu_reg_aarch64(s,uVar50 & 0x1f,uVar54);
        pTVar19 = (TCGContext_conflict1 *)o_12;
        pcStack_100 = (code *)0x69aa06;
        ext_and_shift_reg((TCGContext_conflict1 *)o_12,pTVar14,pTVar14,(uint)uVar46 & 7,uVar42 & 7);
        pcStack_100 = (code *)0x69aa15;
        pTVar56 = tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false);
        pTVar57 = (TCGContext_conflict1 *)((long)pTVar56 - (long)pTVar19);
        uVar11 = (uint)local_e0;
        if ((uVar11 >> 0x1d & 1) == 0) {
          if ((uVar11 >> 0x1e & 1) == 0) {
            pcStack_100 = (code *)0x69aa4f;
            tcg_gen_op3_aarch64(pTVar19,INDEX_op_add_i64,(TCGArg)pTVar56,
                                (TCGArg)(pTVar13 + (long)pTVar19),(TCGArg)(pTVar14 + (long)pTVar19))
            ;
          }
          else {
            pcStack_100 = (code *)0x69b77c;
            tcg_gen_sub_i64(pTVar19,(TCGv_i64)pTVar57,pTVar13,pTVar14);
          }
        }
        else if ((uVar11 >> 0x1e & 1) == 0) {
          pcStack_100 = (code *)0x69aa71;
          gen_add_CC(pTVar19,uVar54,(TCGv_i64)pTVar57,pTVar13,pTVar14);
        }
        else {
          pcStack_100 = (code *)0x69b789;
          gen_sub_CC(pTVar19,uVar54,(TCGv_i64)pTVar57,pTVar13,pTVar14);
        }
        pTVar15 = local_d8;
        if (-1 < (int)(uint)local_e0) goto LAB_0069b7de;
        if (local_d8 != pTVar57) {
          puVar59 = (undefined1 *)((long)&local_d8->pool_cur + (long)pTVar19);
          goto LAB_0069b7fb;
        }
        goto LAB_0069b800;
      }
      local_e8 = (TCGContext_conflict1 *)s;
      if ((uVar11 & 0x80008000) != 0x8000) {
        pTVar23 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        local_d8 = (TCGContext_conflict1 *)(ulong)((uint)((ulong)local_e0 >> 0x1d) & 3);
        uVar47 = (ulong)local_e0 >> 0x16;
        uVar41 = (uint)((ulong)local_e0 >> 5) & 0x1f;
        pcStack_100 = (code *)0x698c6f;
        o_12 = (uintptr_t)cpu_reg_aarch64(s,uVar11 & 0x1f);
        s = (DisasContext_conflict1 *)local_e8;
        local_d0 = pTVar23;
        if (((uVar41 != 0x1f) || ((int)local_d8 != 1)) ||
           ((uVar46 & 0x3f) != 0 || (uVar47 & 3) != 0)) {
          uVar11 = (uint)((ulong)local_e0 >> 0x1f) & 1;
          pcStack_100 = (code *)0x69a33e;
          pTVar13 = read_cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,uVar50 & 0x1f,uVar11);
          if ((uVar46 & 0x3f) != 0) {
            pcStack_100 = (code *)0x69a35f;
            shift_reg_imm(local_d0,pTVar13,pTVar13,uVar11,
                          (a64_shift_type)uVar47 & A64_SHIFT_TYPE_ROR,uVar10);
          }
          pcStack_100 = (code *)0x69a36c;
          cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,uVar41);
          (*(code *)(&DAT_00d7836c +
                    *(int *)(&DAT_00d7836c + (ulong)((int)local_d8 + (uVar54 & 1) * 4) * 4)))();
          return;
        }
        pcStack_100 = (code *)0x698ca8;
        pTVar15 = (TCGContext_conflict1 *)
                  cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,uVar50 & 0x1f);
        if ((uVar35 & 1) != 0) {
          pcStack_100 = (code *)0x69a996;
          tcg_gen_not_i64_aarch64(pTVar23,(TCGv_i64)o_12,(TCGv_i64)pTVar15);
          pTVar15 = local_d0;
          pTVar19 = (TCGContext_conflict1 *)o_12;
          iVar55 = (uint)local_e0;
          goto joined_r0x0069b936;
        }
        pTVar19 = (TCGContext_conflict1 *)o_12;
        if (-1 < (int)(uint)local_e0) goto LAB_0069d56e;
        puVar59 = auStack_f8;
        s = (DisasContext_conflict1 *)local_e8;
        if ((TCGContext_conflict1 *)o_12 == pTVar15) goto LAB_0069a72e;
        pTVar13 = (TCGv_i64)((long)&local_d0->pool_cur + o_12);
        puVar59 = (undefined1 *)((long)&local_d0->pool_cur + (long)&pTVar15->pool_cur);
        TVar44 = INDEX_op_mov_i64;
        pTVar15 = local_d0;
        goto LAB_00698e72;
      }
      goto switchD_00699076_caseD_1;
    }
    uVar54 = uVar54 & 0xf;
    local_e8 = (TCGContext_conflict1 *)s;
    if (0xf < (ushort)uVar54) goto switchD_00699076_caseD_1;
    uVar35 = (ulong)local_e0 >> 0x1e;
    switch(uVar54) {
    case 0:
      if (uVar10 < 0x33) {
        if ((0x4000400040004U >> uVar10 & 1) != 0) {
          puVar37 = auStack_f8;
          if (((uVar11 & 0xe01f801f) == 0x2000000d) &&
             (puVar37 = auStack_f8, (*(byte *)(lVar60 + 0x4e) & 0xf0) != 0)) {
            tcg_ctx = *(TCGContext_conflict1 **)
                       (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
            uVar35 = (ulong)local_e0 >> 5;
            bVar62 = (uVar11 >> 0xe & 1) == 0;
            pcStack_100 = (code *)0x69a677;
            pTVar56 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
            pTVar57 = (TCGContext_conflict1 *)((long)pTVar56 - (long)tcg_ctx);
            pcStack_100 = (code *)0x69a687;
            pTVar13 = cpu_reg_aarch64(s,(uint)uVar35 & 0x1f);
            pcStack_100 = (code *)0x69a695;
            tcg_gen_extrl_i64_i32_aarch64(tcg_ctx,(TCGv_i32)pTVar57,pTVar13);
            pcStack_100 = (code *)0x69a6aa;
            tcg_gen_shli_i32_aarch64
                      (tcg_ctx,tcg_ctx->cpu_NF,(TCGv_i32)pTVar57,(uint)bVar62 * 8 + 0x10);
            pcStack_100 = (code *)0x69a6c4;
            tcg_gen_shli_i32_aarch64
                      (tcg_ctx,tcg_ctx->cpu_VF,(TCGv_i32)pTVar57,(uint)bVar62 * 8 + 0xf);
            args_00 = (TCGContext_conflict1 *)tcg_ctx->cpu_ZF;
            pTVar15 = tcg_ctx;
            if (args_00 != (TCGContext_conflict1 *)tcg_ctx->cpu_NF) {
              TVar28 = (long)&tcg_ctx->pool_cur + (long)&args_00->pool_cur;
              a2_01 = (uint *)((long)&tcg_ctx->pool_cur +
                              (long)&((TCGContext_conflict1 *)tcg_ctx->cpu_NF)->pool_cur);
              TVar44 = INDEX_op_mov_i32;
code_r0x0069a6e8:
              pcStack_100 = (code *)0x69a6ed;
              tcg_gen_op2_aarch64(tcg_ctx,TVar44,TVar28,(TCGArg)a2_01);
switchD_0069aba8_caseD_e:
              args_00 = (TCGContext_conflict1 *)pTVar15->cpu_NF;
            }
LAB_0069a6f4:
            pcStack_100 = (code *)0x69a711;
            tcg_gen_op3_aarch64(pTVar15,INDEX_op_xor_i32,(TCGArg)(pTVar15->cpu_VF + (long)pTVar15),
                                (TCGArg)(pTVar15->cpu_VF + (long)pTVar15),
                                (long)&pTVar15->pool_cur + (long)&args_00->pool_cur);
            pTVar19 = pTVar15;
            goto LAB_0069b4a4;
          }
          goto switchD_00698b3f_caseD_0;
        }
        if ((0x200000002U >> uVar10 & 1) != 0) {
          pcStack_100 = (code *)0x69b4d6;
          disas_rotate_right_into_flags(s,uVar11);
          puVar59 = auStack_f8;
          goto LAB_0069a72e;
        }
        if ((uVar46 & 0x3f) == 0) {
          pcStack_100 = (code *)0x69c0c5;
          disas_adc_sbc(s,uVar11);
          puVar59 = auStack_f8;
          goto LAB_0069a72e;
        }
      }
    case 1:
    case 3:
    case 5:
    case 7:
      goto switchD_00699076_caseD_1;
    case 2:
      if ((uVar11 >> 0x1d & 1) != 0) {
        if (((ulong)local_e0 & 0x410) != 0) {
          pcStack_100 = (code *)0x69b319;
          unallocated_encoding_aarch64(s);
          puVar59 = auStack_f8;
          goto LAB_0069a72e;
        }
        pTVar19 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        uVar35 = (ulong)local_e0 >> 0xc;
        uVar46 = (ulong)local_e0 >> 5;
        pcStack_100 = (code *)0x69c102;
        local_d8 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I32,false)
        ;
        pTVar12 = (TCGv_i32)((long)local_d8 - (long)pTVar19);
        pcStack_100 = (code *)0x69c120;
        arm_test_cc_aarch64(pTVar19,(DisasCompare *)args,(uint)uVar35 & 0xf);
        pcStack_100 = (code *)0x69c13f;
        o_12 = (uintptr_t)pTVar12;
        tcg_gen_setcondi_i32_aarch64
                  (pTVar19,(TCGCond)args[0] ^ TCG_COND_ALWAYS,pTVar12,(TCGv_i32)local_b0,0);
        pcStack_100 = (code *)0x69c14a;
        arm_free_cc_aarch64(pTVar19,(DisasCompare *)args);
        pTVar23 = local_e8;
        if (((uint)local_e0 >> 0xb & 1) == 0) {
          pcStack_100 = (code *)0x69c165;
          pTVar13 = cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,uVar50 & 0x1f);
        }
        else {
          pcStack_100 = (code *)0x69cfc7;
          pTVar13 = new_tmp_a64_aarch64((DisasContext_conflict1 *)local_e8);
          pcStack_100 = (code *)0x69cfdd;
          tcg_gen_op2_aarch64(pTVar19,INDEX_op_movi_i64,(TCGArg)(pTVar13 + (long)pTVar19),
                              (ulong)(uVar50 & 0x1f));
        }
        uVar50 = (uint)local_e0;
        uVar11 = (uint)((ulong)local_e0 >> 0x1f) & 1;
        pcStack_100 = (code *)0x69cff2;
        pTVar14 = cpu_reg_aarch64((DisasContext_conflict1 *)pTVar23,(uint)uVar46 & 0x1f);
        pcStack_100 = (code *)0x69d004;
        pTVar56 = tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false);
        pTVar36 = (TCGv_i64)((long)pTVar56 - (long)pTVar19);
        if ((uVar50 >> 0x1e & 1) == 0) {
          pcStack_100 = (code *)0x69d024;
          gen_add_CC(pTVar19,uVar11,pTVar36,pTVar14,pTVar13);
        }
        else {
          pcStack_100 = (code *)0x69d02b;
          gen_sub_CC(pTVar19,uVar11,pTVar36,pTVar14,pTVar13);
        }
        pcStack_100 = (code *)0x69d039;
        tcg_temp_free_internal_aarch64(pTVar19,(TCGTemp *)(pTVar36 + (long)pTVar19));
        pcStack_100 = (code *)0x69d045;
        pTVar15 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I32,false);
        pTVar12 = (TCGv_i32)((long)pTVar15 - (long)pTVar19);
        pcStack_100 = (code *)0x69d05a;
        local_d0 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I32,false)
        ;
        pTVar23 = local_d8;
        pTVar57 = (TCGContext_conflict1 *)((long)local_d0 - (long)pTVar19);
        pcStack_100 = (code *)0x69d07d;
        tcg_gen_op2_aarch64(pTVar19,INDEX_op_neg_i32,(TCGArg)pTVar15,(TCGArg)local_d8);
        uVar53 = o_12;
        pcStack_100 = (code *)0x69d095;
        tcg_gen_subi_i32_aarch64(pTVar19,(TCGv_i32)pTVar57,(TCGv_i32)o_12,1);
        if (((ulong)local_e0 & 8) == 0) {
          pTVar20 = pTVar19->cpu_NF;
          if (have_bmi1_aarch64 != true) {
            TVar44 = INDEX_op_and_i32;
            pTVar25 = local_d0;
            goto LAB_0069d58b;
          }
          pcStack_100 = (code *)0x69d0c1;
          tcg_gen_andc_i32_aarch64(pTVar19,pTVar20,pTVar20,pTVar12);
        }
        else {
          pTVar20 = pTVar19->cpu_NF;
          TVar44 = INDEX_op_or_i32;
          pTVar25 = pTVar15;
LAB_0069d58b:
          pcStack_100 = (code *)0x69d590;
          tcg_gen_op3_aarch64(pTVar19,TVar44,(TCGArg)(pTVar20 + (long)pTVar19),
                              (TCGArg)(pTVar20 + (long)pTVar19),(TCGArg)pTVar25);
        }
        if (((ulong)local_e0 & 4) == 0) {
          pTVar20 = pTVar19->cpu_ZF;
          TVar44 = INDEX_op_or_i32;
          pTVar25 = pTVar23;
LAB_0069d5e7:
          pcStack_100 = (code *)0x69d5ec;
          tcg_gen_op3_aarch64(pTVar19,TVar44,(TCGArg)(pTVar20 + (long)pTVar19),
                              (TCGArg)(pTVar20 + (long)pTVar19),(TCGArg)pTVar25);
        }
        else {
          pTVar20 = pTVar19->cpu_ZF;
          if (have_bmi1_aarch64 != true) {
            TVar44 = INDEX_op_and_i32;
            pTVar25 = local_d0;
            goto LAB_0069d5e7;
          }
          pcStack_100 = (code *)0x69d5d2;
          tcg_gen_andc_i32_aarch64(pTVar19,pTVar20,pTVar20,pTVar12);
        }
        if (((ulong)local_e0 & 2) == 0) {
          pTVar20 = pTVar19->cpu_CF;
          if (have_bmi1_aarch64 != true) {
            TVar44 = INDEX_op_and_i32;
            pTVar23 = local_d0;
            goto LAB_0069d643;
          }
          pcStack_100 = (code *)0x69d614;
          tcg_gen_andc_i32_aarch64(pTVar19,pTVar20,pTVar20,pTVar12);
        }
        else {
          pTVar20 = pTVar19->cpu_CF;
          TVar44 = INDEX_op_or_i32;
LAB_0069d643:
          pcStack_100 = (code *)0x69d648;
          tcg_gen_op3_aarch64(pTVar19,TVar44,(TCGArg)(pTVar20 + (long)pTVar19),
                              (TCGArg)(pTVar20 + (long)pTVar19),(TCGArg)pTVar23);
        }
        if (((ulong)local_e0 & 1) == 0) {
          pTVar20 = pTVar19->cpu_VF;
          if (have_bmi1_aarch64 != true) {
            TVar44 = INDEX_op_and_i32;
            pTVar15 = local_d0;
            goto LAB_0069d69f;
          }
          pcStack_100 = (code *)0x69d670;
          tcg_gen_andc_i32_aarch64(pTVar19,pTVar20,pTVar20,pTVar12);
        }
        else {
          pTVar20 = pTVar19->cpu_VF;
          TVar44 = INDEX_op_or_i32;
LAB_0069d69f:
          pcStack_100 = (code *)0x69d6a4;
          tcg_gen_op3_aarch64(pTVar19,TVar44,(TCGArg)(pTVar20 + (long)pTVar19),
                              (TCGArg)(pTVar20 + (long)pTVar19),(TCGArg)pTVar15);
        }
        pcStack_100 = (code *)0x69d6b2;
        tcg_temp_free_internal_aarch64(pTVar19,(TCGTemp *)((long)&pTVar19->pool_cur + uVar53));
        pTVar56 = (TCGTemp *)(pTVar12 + (long)pTVar19);
        goto LAB_0069a97c;
      }
      goto switchD_00699076_caseD_1;
    case 4:
      if (((ulong)local_e0 & 0x20000800) != 0) {
        pcStack_100 = (code *)0x69a5f6;
        unallocated_encoding_aarch64(s);
        puVar59 = auStack_f8;
        s = (DisasContext_conflict1 *)local_e8;
        goto LAB_0069a72e;
      }
      pTVar23 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      uVar46 = (ulong)local_e0 >> 0xc;
      o_12 = CONCAT44(o_12._4_4_,uVar42) & 0xffffffff00000001;
      local_c8 = (TCGContext_conflict1 *)
                 (CONCAT44(local_c8._4_4_,(int)((ulong)local_e0 >> 5)) & 0xffffffff07ffffff);
      pcStack_100 = (code *)0x69b85a;
      local_d0 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar11 & 0x1f);
      pcStack_100 = (code *)0x69b86f;
      a64_test_cc(pTVar23,(DisasCompare64 *)args,(uint)uVar46 & 0xf);
      pcStack_100 = (code *)0x69b87e;
      local_d8 = pTVar23;
      pTVar13 = tcg_const_i64_aarch64(pTVar23,0);
      pTVar15 = local_d0;
      pTVar23 = local_d8;
      pTVar19 = local_e8;
      local_c0 = (TCGv_i64)(CONCAT44(local_c0._4_4_,uVar50) & 0xffffffff0000001f);
      if ((uint)o_12 == ((uint)uVar35 & 1) || (uVar50 & 0x1f & (MemOp)local_c8) != 0x1f) {
        pcStack_100 = (code *)0x69b8b4;
        pTVar14 = cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,(MemOp)local_c8 & 0x1f);
        pcStack_100 = (code *)0x69b8c8;
        pTVar36 = read_cpu_reg_aarch64((DisasContext_conflict1 *)pTVar19,(int)local_c0,1);
        pTVar15 = local_d0;
        pTVar23 = local_d8;
        if (((uint)uVar35 & 3 & uVar42 & 0x3fffff) == 1) {
          pcStack_100 = (code *)0x69b8f3;
          tcg_gen_op2_aarch64(local_d8,INDEX_op_neg_i64,(TCGArg)(pTVar36 + (long)local_d8),
                              (TCGArg)(pTVar36 + (long)local_d8));
          pTVar15 = local_d0;
        }
        else if ((uVar35 & 1) == 0) {
          if ((uint)o_12 != 0) {
            pcStack_100 = (code *)0x69cfb5;
            tcg_gen_addi_i64_aarch64(local_d8,pTVar36,pTVar36,1);
          }
        }
        else {
          pcStack_100 = (code *)0x69d517;
          tcg_gen_not_i64_aarch64(local_d8,pTVar36,pTVar36);
        }
        tcg_gen_movcond_i64_aarch64
                  (pTVar23,(TCGCond)args[0],(TCGv_i64)pTVar15,(TCGv_i64)local_b0,pTVar13,pTVar14,
                   pTVar36);
      }
      else {
        pcStack_100 = (code *)0x69c085;
        tcg_gen_setcond_i64_aarch64
                  (local_d8,(TCGCond)args[0] ^ TCG_COND_ALWAYS,(TCGv_i64)local_d0,(TCGv_i64)local_b0
                   ,pTVar13);
        if ((uVar35 & 1) != 0) {
          TVar28 = (long)&pTVar23->pool_cur + (long)&pTVar15->pool_cur;
          pcStack_100 = (code *)0x69c0a7;
          tcg_gen_op2_aarch64(pTVar23,INDEX_op_neg_i64,TVar28,TVar28);
        }
      }
      pcStack_100 = (code *)0x69d54c;
      tcg_temp_free_internal_aarch64(pTVar23,(TCGTemp *)(pTVar13 + (long)pTVar23));
      pcStack_100 = (code *)0x69d55a;
      tcg_temp_free_internal_aarch64
                (pTVar23,(TCGTemp *)((long)&pTVar23->pool_cur + (long)&local_b0->field_0x0));
      puVar59 = auStack_f8;
      pTVar19 = pTVar15;
      s = (DisasContext_conflict1 *)local_e8;
      if ((int)(uint)local_e0 < 0) goto LAB_0069a72e;
LAB_0069d56e:
      pcStack_100 = (code *)0x69d573;
      tcg_gen_ext32u_i64_aarch64(pTVar23,(TCGv_i64)pTVar19,(TCGv_i64)pTVar15);
      puVar59 = auStack_f8;
      s = (DisasContext_conflict1 *)local_e8;
      goto LAB_0069a72e;
    case 6:
      if ((uVar35 & 1) == 0) {
        pcStack_100 = (code *)0x69a7ba;
        disas_data_proc_2src(s,uVar11);
        puVar59 = auStack_f8;
        goto LAB_0069a72e;
      }
      puVar37 = auStack_f8;
      if ((uVar11 >> 0x1d & 1) != 0) goto switchD_00698b3f_caseD_0;
      break;
    default:
      pTVar19 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      uVar10 = (uint)((ulong)local_e0 >> 0x14) & 0xe | uVar41 & 0xfffffff0;
      uVar41 = (uint)((ulong)local_e0 >> 0xf) & 1;
      uVar43 = 0;
      uVar54 = (uVar41 + uVar10) - 0x40;
      if (uVar54 < 0xd) {
        if ((0x1c03U >> (uVar54 & 0x1f) & 1) == 0) {
          if ((0x1cU >> (uVar54 & 0x1f) & 1) == 0) goto LAB_00699ef9;
          uVar43 = 1;
        }
      }
      else {
LAB_00699ef9:
        puVar37 = auStack_f8;
        if (1 < uVar10 + uVar41) goto switchD_00698b3f_caseD_0;
      }
      local_d8 = (TCGContext_conflict1 *)CONCAT44(local_d8._4_4_,uVar43);
      uVar54 = (uint)((ulong)local_e0 >> 5) & 0x1f;
      uVar50 = uVar50 & 0x1f;
      pcStack_100 = (code *)0x699f39;
      local_c8 = (TCGContext_conflict1 *)(ulong)uVar41;
      pTVar56 = tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false);
      pTVar23 = local_e8;
      o_12 = (long)pTVar56 - (long)pTVar19;
      if (((uint)local_e0 >> 0x16 & 1) != 0) {
        pcStack_100 = (code *)0x69a015;
        pTVar13 = cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,uVar11 & 0x1f);
        pcStack_100 = (code *)0x69a022;
        pTVar14 = cpu_reg_aarch64((DisasContext_conflict1 *)pTVar23,uVar54);
        pcStack_100 = (code *)0x69a030;
        pTVar36 = cpu_reg_aarch64((DisasContext_conflict1 *)pTVar23,uVar50);
        uVar53 = o_12;
        if ((char)local_d8 == '\0') {
          pcStack_100 = (code *)0x69a315;
          tcg_gen_mulu2_i64_aarch64(pTVar19,(TCGv_i64)o_12,pTVar13,pTVar14,pTVar36);
        }
        else {
          pcStack_100 = (code *)0x69a057;
          tcg_gen_muls2_i64_aarch64(pTVar19,(TCGv_i64)o_12,pTVar13,pTVar14,pTVar36);
        }
        pTVar56 = (TCGTemp *)((long)&pTVar19->pool_cur + uVar53);
        goto LAB_0069b809;
      }
      local_c0 = (TCGv_i64)(CONCAT44(local_c0._4_4_,uVar11) & 0xffffffff0000001f);
      pcStack_100 = (code *)0x699f6c;
      pTVar61 = tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false);
      local_d0 = (TCGContext_conflict1 *)((long)pTVar61 - (long)pTVar19);
      pcStack_100 = (code *)0x699f88;
      pTVar18 = tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false);
      pcStack_100 = (code *)0x699f99;
      pTVar13 = cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,uVar54);
      uVar53 = o_12;
      if (uVar10 < 0x42) {
        if (pTVar13 != (TCGv_i64)o_12) {
          pcStack_100 = (code *)0x699fc8;
          tcg_gen_op2_aarch64(pTVar19,INDEX_op_mov_i64,(TCGArg)pTVar56,
                              (TCGArg)(pTVar13 + (long)pTVar19));
        }
        pcStack_100 = (code *)0x699fd5;
        pTVar23 = (TCGContext_conflict1 *)cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,uVar50)
        ;
        if (pTVar23 != local_d0) {
          pcStack_100 = (code *)0x699ffd;
          tcg_gen_op2_aarch64(pTVar19,INDEX_op_mov_i64,(TCGArg)pTVar61,
                              (long)&pTVar19->pool_cur + (long)&pTVar23->pool_cur);
        }
      }
      else if ((char)local_d8 == '\0') {
        pcStack_100 = (code *)0x69a855;
        tcg_gen_ext32u_i64_aarch64(pTVar19,(TCGv_i64)o_12,pTVar13);
        pcStack_100 = (code *)0x69a862;
        pTVar13 = cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,uVar50);
        pcStack_100 = (code *)0x69a872;
        tcg_gen_ext32u_i64_aarch64(pTVar19,(TCGv_i64)local_d0,pTVar13);
      }
      else {
        pcStack_100 = (code *)0x69a2d7;
        tcg_gen_ext32s_i64_aarch64(pTVar19,(TCGv_i64)o_12,pTVar13);
        pcStack_100 = (code *)0x69a2e4;
        pTVar13 = cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,uVar50);
        pcStack_100 = (code *)0x69a2f4;
        tcg_gen_ext32s_i64_aarch64(pTVar19,(TCGv_i64)local_d0,pTVar13);
      }
      pTVar57 = (TCGContext_conflict1 *)((long)pTVar18 - (long)pTVar19);
      iVar55 = (int)local_c8;
      if ((uVar42 & 0x1f) == 0x1f && iVar55 == 0) {
        iVar55 = (int)local_c0;
        pcStack_100 = (code *)0x69a8ee;
        pTVar13 = cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,(int)local_c0);
        pcStack_100 = (code *)0x69a909;
        tcg_gen_op3_aarch64(pTVar19,INDEX_op_mul_i64,(TCGArg)(pTVar13 + (long)pTVar19),
                            (TCGArg)pTVar56,(TCGArg)pTVar61);
      }
      else {
        pcStack_100 = (code *)0x69a8a8;
        tcg_gen_op3_aarch64(pTVar19,INDEX_op_mul_i64,(TCGArg)pTVar18,(TCGArg)pTVar56,(TCGArg)pTVar61
                           );
        pTVar23 = local_e8;
        pcStack_100 = (code *)0x69a8b9;
        pTVar13 = cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,(int)local_c0);
        pcStack_100 = (code *)0x69a8c6;
        pTVar14 = cpu_reg_aarch64((DisasContext_conflict1 *)pTVar23,uVar42 & 0x1f);
        if (iVar55 == 0) {
          pcStack_100 = (code *)0x69a929;
          tcg_gen_op3_aarch64(pTVar19,INDEX_op_add_i64,(TCGArg)(pTVar13 + (long)pTVar19),
                              (TCGArg)(pTVar14 + (long)pTVar19),(TCGArg)pTVar18);
        }
        else {
          pcStack_100 = (code *)0x69a8dc;
          tcg_gen_sub_i64(pTVar19,pTVar13,pTVar14,(TCGv_i64)pTVar57);
        }
        uVar53 = o_12;
        iVar55 = (int)local_c0;
      }
      pTVar23 = local_e8;
      if (-1 < (int)(uint)local_e0) {
        pcStack_100 = (code *)0x69a948;
        pTVar13 = cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,iVar55);
        pcStack_100 = (code *)0x69a955;
        pTVar14 = cpu_reg_aarch64((DisasContext_conflict1 *)pTVar23,iVar55);
        pcStack_100 = (code *)0x69a963;
        tcg_gen_ext32u_i64_aarch64(pTVar19,pTVar13,pTVar14);
      }
      pcStack_100 = (code *)0x69a971;
      tcg_temp_free_internal_aarch64(pTVar19,(TCGTemp *)((long)&pTVar19->pool_cur + uVar53));
      pTVar56 = (TCGTemp *)((long)&pTVar19->pool_cur + (long)&local_d0->pool_cur);
LAB_0069a97c:
      pcStack_100 = (code *)0x69a981;
      tcg_temp_free_internal_aarch64(pTVar19,pTVar56);
      goto LAB_0069b800;
    }
    break;
  case 7:
  case 0xf:
switchD_00698b3f_caseD_7:
    if ((uVar11 & 0x50000000) != 0x10000000) {
      uVar50 = 0x9f200400;
      ppAVar16 = &data_proc_simd[0].disas_fn;
      do {
        if ((uVar50 & uVar11) == ((AArch64DecodeTable *)(ppAVar16 + -1))->pattern) {
          puVar37 = auStack_f8;
          if (*ppAVar16 != (AArch64DecodeFn *)0x0) {
            pcStack_100 = (code *)0x6992c5;
            (**ppAVar16)(s,uVar11);
            puVar59 = auStack_f8;
            goto LAB_0069a72e;
          }
          break;
        }
        uVar50 = *(uint *)((long)ppAVar16 + 0xc);
        ppAVar16 = ppAVar16 + 2;
        puVar37 = auStack_f8;
      } while (uVar50 != 0);
      goto switchD_00698b3f_caseD_0;
    }
    if ((uVar11 >> 0x18 & 1) != 0) {
      puVar37 = auStack_f8;
      if (0x1fffffff < uVar11) goto switchD_00698b3f_caseD_0;
      uVar54 = (uint)((ulong)local_e0 >> 5) & 0x1f;
      uVar41 = (uint)((ulong)local_e0 >> 10) & 0x1f;
      uVar50 = uVar50 & 0x1f;
      switch((uint)((ulong)local_e0 >> 0x16) & 3) {
      case 0:
        *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
        uVar9 = (uint32_t)((TCGContext_conflict1 *)s)->frame_start;
        if (uVar9 != 0) {
LAB_0069ade7:
          pc._0_4_ = ((TCGContext_conflict1 *)s)->nb_temps;
          pc._4_4_ = ((TCGContext_conflict1 *)s)->nb_indirects;
          pcStack_100 = (code *)0x69adfd;
          gen_exception_insn(s,pc,1,0x1fe0000a,uVar9);
          puVar59 = auStack_f8;
          goto LAB_0069a72e;
        }
        o_12 = CONCAT44(o_12._4_4_,uVar11) & 0xffffffff0000001f;
        pTVar19 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        pcStack_100 = (code *)0x69945c;
        local_d8 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I32,false)
        ;
        pcStack_100 = (code *)0x699470;
        pTVar56 = tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false);
        local_d0 = (TCGContext_conflict1 *)((long)pTVar56 - (long)pTVar19);
        pcStack_100 = (code *)0x69948f;
        tcg_gen_addi_i64_aarch64(pTVar19,(TCGv_i64)local_d0,(TCGv_i64)pTVar19->cpu_env,0x2ec8);
        pcStack_100 = (code *)0x6994a5;
        pTVar12 = read_fp_sreg(*(DisasContext_conflict1 **)
                                (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8),uVar54);
        pcStack_100 = (code *)0x6994be;
        local_c8 = (TCGContext_conflict1 *)
                   read_fp_sreg(*(DisasContext_conflict1 **)
                                 (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8),uVar50);
        pcStack_100 = (code *)0x6994d9;
        pTVar20 = read_fp_sreg(*(DisasContext_conflict1 **)
                                (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8),uVar41);
        if (((uint)local_e0 >> 0x15 & 1) != 0) {
          args[0] = (TCGTemp *)(pTVar20 + (long)pTVar19);
          pcStack_100 = (code *)0x699507;
          tcg_gen_callN_aarch64(pTVar19,helper_vfp_negs_aarch64,args[0],1,args);
        }
        pTVar23 = local_c8;
        if ((short)local_e0 < 0 != (bool)((byte)((ulong)local_e0 >> 0x15) & 1)) {
          args[0] = (TCGTemp *)(pTVar12 + (long)&pTVar19->pool_cur);
          pcStack_100 = (code *)0x699549;
          tcg_gen_callN_aarch64(pTVar19,helper_vfp_negs_aarch64,args[0],1,args);
        }
        pTVar21 = (TCGv_i32)((long)local_d8 - (long)pTVar19);
        local_e0 = (TCGContext_conflict1 *)(pTVar12 + (long)pTVar19);
        pTVar18 = (TCGTemp *)((long)&pTVar19->pool_cur + (long)&pTVar23->pool_cur);
        pTVar56 = (TCGTemp *)(pTVar20 + (long)pTVar19);
        pTVar61 = (TCGTemp *)((long)&pTVar19->pool_cur + (long)&local_d0->pool_cur);
        pcStack_100 = (code *)0x69c2ce;
        args[0] = (TCGTemp *)local_e0;
        tcg_gen_callN_aarch64(pTVar19,helper_vfp_muladds_aarch64,(TCGTemp *)local_d8,4,args);
        pcStack_100 = (code *)0x69c2dd;
        write_fp_sreg(s,(uint)o_12,pTVar21);
        break;
      case 1:
        *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
        uVar9 = (uint32_t)((TCGContext_conflict1 *)s)->frame_start;
        if (uVar9 != 0) goto LAB_0069ade7;
        o_12 = CONCAT44(o_12._4_4_,uVar11) & 0xffffffff0000001f;
        pTVar19 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        pcStack_100 = (code *)0x69bb37;
        local_d8 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false)
        ;
        pcStack_100 = (code *)0x69bb4b;
        pTVar56 = tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false);
        local_d0 = (TCGContext_conflict1 *)((long)pTVar56 - (long)pTVar19);
        pcStack_100 = (code *)0x69bb6a;
        tcg_gen_addi_i64_aarch64(pTVar19,(TCGv_i64)local_d0,(TCGv_i64)pTVar19->cpu_env,0x2ec8);
        pcStack_100 = (code *)0x69bb80;
        pTVar13 = read_fp_dreg(*(DisasContext_conflict1 **)
                                (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8),uVar54);
        pcStack_100 = (code *)0x69bb99;
        local_c8 = (TCGContext_conflict1 *)
                   read_fp_dreg(*(DisasContext_conflict1 **)
                                 (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8),uVar50);
        pcStack_100 = (code *)0x69bbb4;
        pTVar14 = read_fp_dreg(*(DisasContext_conflict1 **)
                                (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8),uVar41);
        if (((uint)local_e0 >> 0x15 & 1) != 0) {
          args[0] = (TCGTemp *)(pTVar14 + (long)pTVar19);
          pcStack_100 = (code *)0x69bbe2;
          tcg_gen_callN_aarch64(pTVar19,helper_vfp_negd_aarch64,args[0],1,args);
        }
        pTVar23 = local_c8;
        if ((short)local_e0 < 0 != (bool)((byte)((ulong)local_e0 >> 0x15) & 1)) {
          args[0] = (TCGTemp *)(pTVar13 + (long)&pTVar19->pool_cur);
          pcStack_100 = (code *)0x69bc24;
          tcg_gen_callN_aarch64(pTVar19,helper_vfp_negd_aarch64,args[0],1,args);
        }
        pTVar36 = (TCGv_i64)((long)local_d8 - (long)pTVar19);
        local_e0 = (TCGContext_conflict1 *)(pTVar13 + (long)pTVar19);
        pTVar18 = (TCGTemp *)((long)&pTVar19->pool_cur + (long)&pTVar23->pool_cur);
        pTVar56 = (TCGTemp *)(pTVar14 + (long)pTVar19);
        pTVar61 = (TCGTemp *)((long)&pTVar19->pool_cur + (long)&local_d0->pool_cur);
        pcStack_100 = (code *)0x69c330;
        args[0] = (TCGTemp *)local_e0;
        tcg_gen_callN_aarch64(pTVar19,helper_vfp_muladdd_aarch64,(TCGTemp *)local_d8,4,args);
        pcStack_100 = (code *)0x69c33f;
        write_fp_dreg_aarch64(s,(uint)o_12,pTVar36);
        break;
      case 2:
switchD_00699424_caseD_2:
        puVar38 = auStack_f8;
        goto LAB_0069a729;
      case 3:
        if ((*(uint *)(lVar60 + 0x58) & 0xf0000) != 0x10000) goto switchD_00699424_caseD_2;
        *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
        uVar9 = (uint32_t)((TCGContext_conflict1 *)s)->frame_start;
        if (uVar9 != 0) goto LAB_0069ade7;
        o_12 = CONCAT44(o_12._4_4_,uVar11) & 0xffffffff0000001f;
        pTVar19 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        pcStack_100 = (code *)0x69ac15;
        local_d8 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I32,false)
        ;
        pcStack_100 = (code *)0x69ac29;
        pTVar56 = tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false);
        local_d0 = (TCGContext_conflict1 *)((long)pTVar56 - (long)pTVar19);
        pcStack_100 = (code *)0x69ac48;
        tcg_gen_addi_i64_aarch64(pTVar19,(TCGv_i64)local_d0,(TCGv_i64)pTVar19->cpu_env,0x2ed0);
        pcStack_100 = (code *)0x69ac5e;
        pTVar12 = read_fp_hreg(*(DisasContext_conflict1 **)
                                (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8),uVar54);
        pcStack_100 = (code *)0x69ac77;
        pTVar20 = read_fp_hreg(*(DisasContext_conflict1 **)
                                (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8),uVar50);
        pcStack_100 = (code *)0x69ac90;
        pTVar21 = read_fp_hreg(*(DisasContext_conflict1 **)
                                (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8),uVar41);
        if (((uint)local_e0 >> 0x15 & 1) != 0) {
          pcStack_100 = (code *)0x69acb1;
          tcg_gen_xori_i32_aarch64(pTVar19,pTVar21,pTVar21,0x8000);
        }
        if ((short)local_e0 < 0 != (bool)((byte)((ulong)local_e0 >> 0x15) & 1)) {
          pcStack_100 = (code *)0x69acdb;
          tcg_gen_xori_i32_aarch64(pTVar19,pTVar12,pTVar12,0x8000);
        }
        v = (TCGv_i32)((long)local_d8 - (long)pTVar19);
        local_e0 = (TCGContext_conflict1 *)(pTVar20 + (long)pTVar19);
        pTVar56 = (TCGTemp *)(pTVar21 + (long)pTVar19);
        ppuVar7 = &local_d0->pool_cur;
        pcStack_100 = (code *)0x69ad27;
        args[0] = (TCGTemp *)(pTVar12 + (long)pTVar19);
        tcg_gen_callN_aarch64(pTVar19,helper_advsimd_muladdh_aarch64,(TCGTemp *)local_d8,4,args);
        pcStack_100 = (code *)0x69ad36;
        write_fp_sreg(s,(uint)o_12,v);
        pcStack_100 = (code *)0x69ad41;
        tcg_temp_free_internal_aarch64
                  (pTVar19,(TCGTemp *)((long)&pTVar19->pool_cur + (long)ppuVar7));
        pcStack_100 = (code *)0x69ad4f;
        tcg_temp_free_internal_aarch64(pTVar19,(TCGTemp *)(pTVar12 + (long)pTVar19));
        pcStack_100 = (code *)0x69ad5c;
        tcg_temp_free_internal_aarch64(pTVar19,(TCGTemp *)local_e0);
        goto LAB_0069c36b;
      }
      pcStack_100 = (code *)0x69c34a;
      tcg_temp_free_internal_aarch64(pTVar19,pTVar61);
      pcStack_100 = (code *)0x69c35a;
      tcg_temp_free_internal_aarch64(pTVar19,(TCGTemp *)local_e0);
      pcStack_100 = (code *)0x69c365;
      tcg_temp_free_internal_aarch64(pTVar19,pTVar18);
LAB_0069c36b:
      pcStack_100 = (code *)0x69c370;
      tcg_temp_free_internal_aarch64(pTVar19,pTVar56);
      pTVar25 = local_d8;
      goto LAB_0069c378;
    }
    if ((uVar11 >> 0x15 & 1) == 0) {
      uVar41 = (uint)((ulong)local_e0 >> 10) & 0x3f;
      puVar37 = auStack_f8;
      if (((uVar11 >> 0x1d & 1) == 0) && (puVar37 = auStack_f8, (int)uVar11 < 0 || 0x1f < uVar41)) {
        uVar42 = uVar11 >> 0x16 & 3;
        if ((((uVar42 < 2) ||
             ((puVar37 = auStack_f8, uVar42 != 2 &&
              (puVar37 = auStack_f8, (*(uint *)(lVar60 + 0x58) & 0xf0000) == 0x10000)))) &&
            (uVar10 = (uVar50 & 0x1f) - 2, puVar37 = auStack_f8, uVar10 < 0x18)) &&
           (puVar37 = auStack_f8, (0xc00003U >> (uVar10 & 0x1f) & 1) != 0)) {
          *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
          uVar54 = (uint)((TCGContext_conflict1 *)s)->frame_start;
          ppcVar39 = (code **)auStack_f8;
          if (uVar54 == 0) {
            handle_fpfpcvt(s,uVar11 & 0x1f,(uint)((ulong)local_e0 >> 5) & 0x1f,uVar50 & 7,
                           (0x3fffffU >> (uVar10 & 0x1f) & 1) != 0,3,uVar41,
                           (uint)((ulong)local_e0 >> 0x1f) & 1,uVar42);
            puVar59 = auStack_f8;
            goto LAB_0069a72e;
          }
          goto LAB_0069cdb5;
        }
      }
      goto switchD_00698b3f_caseD_0;
    }
    pTVar49 = local_e0;
    switch((uint)((ulong)local_e0 >> 10) & 3) {
    case 0:
      uVar35 = (ulong)local_e0 >> 0xc;
      if ((uVar35 & 0xf) == 0) {
        iVar55 = 0x20;
      }
      else {
        iVar55 = 0;
        if ((uVar35 & 0xf) != 0) {
          for (; (((uint)uVar35 & 0xf) >> iVar55 & 1) == 0; iVar55 = iVar55 + 1) {
          }
        }
      }
      puVar37 = auStack_f8;
      switch(iVar55) {
      case 0:
        pcStack_100 = (code *)0x69bb11;
        disas_fp_imm(s,uVar11);
        puVar59 = auStack_f8;
        break;
      case 1:
        pcStack_100 = (code *)0x69c204;
        disas_fp_compare(s,uVar11);
        puVar59 = auStack_f8;
        break;
      case 2:
        pcStack_100 = (code *)0x69c214;
        disas_fp_1src(s,uVar11);
        puVar59 = auStack_f8;
        break;
      case 3:
        goto switchD_00698b3f_caseD_0;
      default:
        pcStack_100 = (code *)0x69c224;
        disas_fp_int_conv(s,uVar11);
        puVar59 = auStack_f8;
      }
      goto LAB_0069a72e;
    case 1:
      puVar37 = auStack_f8;
      if (0x1fffffff < uVar11) goto switchD_00698b3f_caseD_0;
      break;
    case 2:
      uVar41 = (uint)((ulong)local_e0 >> 0xc) & 0xf;
      pTVar57 = (TCGContext_conflict1 *)(ulong)uVar41;
      puVar37 = auStack_f8;
      if (0x1fffffff < uVar11 || 8 < uVar41) goto switchD_00698b3f_caseD_0;
      uVar42 = uVar11 & 0x1f;
      uVar35 = (ulong)uVar42;
      uVar10 = (uint)((ulong)local_e0 >> 5) & 0x1f;
      uVar50 = uVar50 & 0x1f;
      uVar11 = uVar11 >> 0x16 & 3;
      pTVar49 = (TCGContext_conflict1 *)(ulong)uVar11;
      puVar37 = auStack_f8;
      switch(uVar11) {
      case 0:
        *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
        uVar54 = (uint)((TCGContext_conflict1 *)s)->frame_start;
        args_00 = (TCGContext_conflict1 *)(ulong)uVar54;
        ppcVar39 = (code **)auStack_f8;
        if (uVar54 != 0) goto LAB_0069cdb5;
        pTVar19 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        pcStack_100 = (code *)0x69ab20;
        o_12 = (uintptr_t)tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I32,false);
        local_d8 = (TCGContext_conflict1 *)(o_12 - (long)pTVar19);
        pcStack_100 = (code *)0x69ab3c;
        local_e0 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false)
        ;
        pcStack_100 = (code *)0x69ab5b;
        tcg_gen_addi_i64_aarch64
                  (pTVar19,(TCGv_i64)((long)local_e0 - (long)pTVar19),(TCGv_i64)pTVar19->cpu_env,
                   0x2ec8);
        pcStack_100 = (code *)0x69ab71;
        pTVar15 = (TCGContext_conflict1 *)
                  read_fp_sreg(*(DisasContext_conflict1 **)
                                (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8),uVar10);
        tcg_ctx = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        pcVar45 = (code *)(ulong)uVar50;
        local_e8 = (TCGContext_conflict1 *)s;
code_r0x0069ab8a:
        pcStack_100 = (code *)0x69ab8f;
        TVar44 = (TCGOpcode)pcVar45;
        pTVar12 = read_fp_sreg((DisasContext_conflict1 *)tcg_ctx,TVar44);
        pTVar25 = (TCGContext_conflict1 *)o_12;
        pTVar15 = (TCGContext_conflict1 *)((long)&pTVar19->pool_cur + (long)&pTVar15->pool_cur);
        pTVar23 = (TCGContext_conflict1 *)(pTVar12 + (long)pTVar19);
        a2_01 = &switchD_0069aba8::switchdataD_00d7823c;
        pcVar45 = (code *)((long)&switchD_0069aba8::switchdataD_00d7823c +
                          (long)(int)(&switchD_0069aba8::switchdataD_00d7823c)[uVar41]);
        switch(uVar41) {
        case 0:
          args_00 = (TCGContext_conflict1 *)args;
          pcVar45 = helper_vfp_muls_aarch64;
          args[0] = (TCGTemp *)pTVar15;
          break;
        case 1:
          args_00 = (TCGContext_conflict1 *)args;
          pcVar45 = helper_vfp_divs_aarch64;
          args[0] = (TCGTemp *)pTVar15;
          break;
        case 2:
          args_00 = (TCGContext_conflict1 *)args;
code_r0x0069e5a6:
          args_00->pool_cur = (uint8_t *)pTVar15;
          args_00->pool_end = (uint8_t *)pTVar23;
          args_00->pool_first = (TCGPool *)local_e0;
          pcVar45 = helper_vfp_adds_aarch64;
          break;
        case 3:
          args_00 = (TCGContext_conflict1 *)args;
          pcVar45 = helper_vfp_subs_aarch64;
          args[0] = (TCGTemp *)pTVar15;
          break;
        case 4:
          args_00 = (TCGContext_conflict1 *)args;
code_r0x0069e522:
          args_00->pool_cur = (uint8_t *)pTVar15;
          args_00->pool_end = (uint8_t *)pTVar23;
          args_00->pool_first = (TCGPool *)local_e0;
          pcVar45 = helper_vfp_maxs_aarch64;
          break;
        case 5:
          args_00 = (TCGContext_conflict1 *)args;
          pcVar45 = helper_vfp_mins_aarch64;
          args[0] = (TCGTemp *)pTVar15;
          break;
        case 6:
          args_00 = (TCGContext_conflict1 *)args;
          pcVar45 = helper_vfp_maxnums_aarch64;
          args[0] = (TCGTemp *)pTVar15;
          break;
        case 7:
          args_00 = (TCGContext_conflict1 *)args;
code_r0x0069e609:
          args_00->pool_cur = (uint8_t *)pTVar15;
          args_00->pool_end = (uint8_t *)pTVar23;
          args_00->pool_first = (TCGPool *)local_e0;
          pcVar45 = helper_vfp_minnums_aarch64;
          break;
        case 8:
          pTVar56 = (TCGTemp *)o_12;
          pcStack_100 = (code *)0x69e798;
          args[0] = (TCGTemp *)pTVar15;
          tcg_gen_callN_aarch64(pTVar19,helper_vfp_muls_aarch64,(TCGTemp *)o_12,3,args);
          pcVar45 = helper_vfp_negs_aarch64;
          args_00 = (TCGContext_conflict1 *)args;
          iVar55 = 1;
          args[0] = pTVar56;
          goto LAB_0069e74b;
        case 9:
          ppcVar39 = &pcStack_100;
          *(int *)pcVar45 = *(int *)pcVar45 + (int)pcVar45;
          pcVar26 = (char *)((long)pTVar57[0x4b3].gen_insn_data[0x175] + 9);
          *pcVar26 = *pcVar26 + '<';
          pcStack_100 = pcVar45;
          lVar60 = func_0x4469ae20();
          goto code_r0x0069ae0f;
        case 10:
          halt_baddata();
        case 0xb:
          goto LAB_0069a6f4;
        case 0xc:
          pTVar19 = pTVar15;
          goto code_r0x0069cc44;
        case 0xd:
          out((short)extraout_RDX,(int)pcVar45);
          goto code_r0x0069a5a2;
        case 0xe:
          goto switchD_0069aba8_caseD_e;
        case 0xf:
          *pcVar45 = (code)((char)*pcVar45 + (char)pcVar45);
          cRam0000000004358aee = cRam0000000004358aee + '<';
          TVar28 = extraout_RDX;
          goto code_r0x0069a6e8;
        }
        iVar55 = 3;
        pTVar25 = (TCGContext_conflict1 *)o_12;
LAB_0069e74b:
        pcStack_100 = (code *)0x69e750;
        tcg_gen_callN_aarch64(pTVar19,pcVar45,(TCGTemp *)pTVar25,iVar55,(TCGTemp **)args_00);
        pTVar57 = local_d8;
        break;
      case 1:
        *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
        uVar54 = (uint)((TCGContext_conflict1 *)s)->frame_start;
        args_00 = (TCGContext_conflict1 *)(ulong)uVar54;
        ppcVar39 = (code **)auStack_f8;
        if (uVar54 != 0) goto LAB_0069cdb5;
        pTVar19 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        pcStack_100 = (code *)0x69ca6c;
        o_12 = (uintptr_t)tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false);
        local_d8 = (TCGContext_conflict1 *)(o_12 - (long)pTVar19);
        pcStack_100 = (code *)0x69ca88;
        local_e0 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false)
        ;
        pcStack_100 = (code *)0x69caa7;
        tcg_gen_addi_i64_aarch64
                  (pTVar19,(TCGv_i64)((long)local_e0 - (long)pTVar19),(TCGv_i64)pTVar19->cpu_env,
                   0x2ec8);
        pcStack_100 = (code *)0x69cabd;
        pTVar15 = (TCGContext_conflict1 *)
                  read_fp_dreg(*(DisasContext_conflict1 **)
                                (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8),uVar10);
        tcg_ctx = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        pcVar45 = (code *)(ulong)uVar50;
        local_e8 = (TCGContext_conflict1 *)s;
code_r0x0069cad6:
        pcStack_100 = (code *)0x69cadb;
        pTVar13 = read_fp_dreg((DisasContext_conflict1 *)tcg_ctx,(int)pcVar45);
        pTVar15 = (TCGContext_conflict1 *)((long)&pTVar19->pool_cur + (long)&pTVar15->pool_cur);
        pTVar23 = (TCGContext_conflict1 *)(pTVar13 + (long)pTVar19);
        iVar52 = 0xd78218;
        piVar24 = (int *)((long)&switchD_0069caf4::switchdataD_00d78218 +
                         (long)(int)(&switchD_0069caf4::switchdataD_00d78218)[uVar41]);
        iVar55 = (int)piVar24;
        pTVar25 = extraout_RDX_00;
        switch(uVar41) {
        case 0:
          args_00 = (TCGContext_conflict1 *)args;
          pcVar45 = helper_vfp_muld_aarch64;
          args[0] = (TCGTemp *)pTVar15;
          break;
        case 1:
          args_00 = (TCGContext_conflict1 *)args;
          goto code_r0x0069e5c7;
        case 2:
          args_00 = (TCGContext_conflict1 *)args;
code_r0x0069e543:
          args_00->pool_cur = (uint8_t *)pTVar15;
          args_00->pool_end = (uint8_t *)pTVar23;
          args_00->pool_first = (TCGPool *)local_e0;
          pcVar45 = helper_vfp_addd_aarch64;
          break;
        case 3:
          args_00 = (TCGContext_conflict1 *)args;
          pcVar45 = helper_vfp_subd_aarch64;
          args[0] = (TCGTemp *)pTVar15;
          break;
        case 4:
          args_00 = (TCGContext_conflict1 *)args;
          pcVar45 = helper_vfp_maxd_aarch64;
          args[0] = (TCGTemp *)pTVar15;
          break;
        case 5:
          args_00 = (TCGContext_conflict1 *)args;
          pcVar45 = helper_vfp_mind_aarch64;
          args[0] = (TCGTemp *)pTVar15;
          break;
        case 6:
          args_00 = (TCGContext_conflict1 *)args;
          pcVar45 = helper_vfp_maxnumd_aarch64;
          args[0] = (TCGTemp *)pTVar15;
          break;
        case 7:
          args_00 = (TCGContext_conflict1 *)args;
          goto code_r0x0069e585;
        case 8:
          pTVar57 = (TCGContext_conflict1 *)args;
          pcVar45 = helper_vfp_muld_aarch64;
          iVar52 = 3;
          pTVar25 = (TCGContext_conflict1 *)o_12;
          tcg_ctx = pTVar19;
          args_00 = pTVar57;
          s = (DisasContext_conflict1 *)o_12;
          args[0] = (TCGTemp *)pTVar15;
        case 0xe:
          pcStack_100 = (code *)0x69e6e2;
          tcg_gen_callN_aarch64(tcg_ctx,pcVar45,(TCGTemp *)pTVar25,iVar52,(TCGTemp **)args_00);
          pTVar57->pool_cur = (uint8_t *)s;
          pcVar45 = helper_vfp_negd_aarch64;
          args_00 = (TCGContext_conflict1 *)args;
          iVar52 = 1;
          pTVar25 = (TCGContext_conflict1 *)s;
          tcg_ctx = pTVar19;
          goto LAB_0069e690;
        case 9:
          cRam0000000004358a5e = cRam0000000004358a5e + (char)piVar24;
          goto code_r0x0069ab8a;
        case 10:
          halt_baddata();
        case 0xb:
          *piVar24 = *piVar24 + iVar55;
          *(char *)(uVar35 + 0x35e08a4) = *(char *)(uVar35 + 0x35e08a4) + '\x18';
code_r0x0069e585:
          args_00->pool_cur = (uint8_t *)pTVar15;
          args_00->pool_end = (uint8_t *)pTVar23;
          args_00->pool_first = (TCGPool *)local_e0;
          pcVar45 = helper_vfp_minnumd_aarch64;
          break;
        case 0xc:
          *piVar24 = *piVar24 + iVar55;
          *(char *)(uVar35 + 0x35e08a4) = *(char *)(uVar35 + 0x35e08a4) + '\x18';
code_r0x0069e5c7:
          args_00->pool_cur = (uint8_t *)pTVar15;
          args_00->pool_end = (uint8_t *)pTVar23;
          args_00->pool_first = (TCGPool *)local_e0;
          pcVar45 = helper_vfp_divd_aarch64;
          break;
        case 0xd:
          return;
        case 0xf:
          *piVar24 = *piVar24 + iVar55;
          *(char *)piVar24 = (char)*piVar24 + (char)piVar24;
          s = (DisasContext_conflict1 *)extraout_RDX_00;
          pTVar25 = pTVar57;
          goto LAB_0069e690;
        }
        iVar52 = 3;
        s = (DisasContext_conflict1 *)o_12;
        pTVar25 = (TCGContext_conflict1 *)o_12;
        tcg_ctx = pTVar19;
LAB_0069e690:
        pcStack_100 = (code *)0x69e695;
        tcg_gen_callN_aarch64(tcg_ctx,pcVar45,(TCGTemp *)s,iVar52,(TCGTemp **)args_00);
        s = (DisasContext_conflict1 *)local_e8;
        pcStack_100 = (code *)0x69e6a9;
        write_fp_dreg_aarch64((DisasContext_conflict1 *)local_e8,uVar42,(TCGv_i64)local_d8);
        goto LAB_0069e8b6;
      case 2:
        goto switchD_00698b3f_caseD_0;
      case 3:
        puVar37 = auStack_f8;
        if ((*(uint *)(lVar60 + 0x58) & 0xf0000) != 0x10000) goto switchD_00698b3f_caseD_0;
        *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
        uVar54 = (uint)((TCGContext_conflict1 *)s)->frame_start;
        args_00 = (TCGContext_conflict1 *)(ulong)uVar54;
        ppcVar39 = (code **)auStack_f8;
        if (uVar54 != 0) goto LAB_0069cdb5;
        pTVar19 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        pcStack_100 = (code *)0x69cb5a;
        local_d8 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I32,false)
        ;
        o_12 = (long)local_d8 - (long)pTVar19;
        pcStack_100 = (code *)0x69cb76;
        local_e0 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false)
        ;
        pcStack_100 = (code *)0x69cb95;
        tcg_gen_addi_i64_aarch64
                  (pTVar19,(TCGv_i64)((long)local_e0 - (long)pTVar19),(TCGv_i64)pTVar19->cpu_env,
                   0x2ed0);
        pcStack_100 = (code *)0x69cbab;
        pTVar12 = read_fp_hreg(*(DisasContext_conflict1 **)
                                (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8),uVar10);
        tcg_ctx = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        pcVar45 = (code *)(ulong)uVar50;
        pcStack_100 = (code *)0x69cbc9;
        local_e8 = (TCGContext_conflict1 *)s;
        pTVar20 = read_fp_hreg((DisasContext_conflict1 *)tcg_ctx,uVar50);
        pTVar25 = local_d8;
        pTVar15 = (TCGContext_conflict1 *)(pTVar12 + (long)pTVar19);
        pTVar23 = (TCGContext_conflict1 *)(pTVar20 + (long)pTVar19);
        piVar24 = (int *)((long)&switchD_0069cbe2::switchdataD_00d781f4 +
                         (long)(int)(&switchD_0069cbe2::switchdataD_00d781f4)[uVar41]);
        cVar8 = (char)piVar24;
        iVar55 = (int)piVar24;
        switch(uVar41) {
        case 0:
          pcVar45 = helper_advsimd_mulh_aarch64;
          break;
        case 1:
          pcVar45 = helper_advsimd_divh_aarch64;
          break;
        case 2:
          pcVar45 = helper_advsimd_addh_aarch64;
          break;
        case 3:
          pcVar45 = helper_advsimd_subh_aarch64;
          break;
        case 4:
          pcVar45 = helper_advsimd_maxh_aarch64;
          break;
        case 5:
          pcVar45 = helper_advsimd_minh_aarch64;
          break;
        case 6:
          pcVar45 = helper_advsimd_maxnumh_aarch64;
          break;
        case 7:
          pcVar45 = helper_advsimd_minnumh_aarch64;
          break;
        case 8:
          pcStack_100 = (code *)0x69e915;
          args[0] = (TCGTemp *)pTVar15;
          tcg_gen_callN_aarch64(pTVar19,helper_advsimd_mulh_aarch64,(TCGTemp *)local_d8,3,args);
          pcStack_100 = (code *)0x69e92a;
          tcg_gen_xori_i32_aarch64(pTVar19,(TCGv_i32)o_12,(TCGv_i32)o_12,0x8000);
          pTVar57 = (TCGContext_conflict1 *)o_12;
          goto LAB_0069e8b1;
        case 9:
          cRam00000000043589aa = cRam00000000043589aa + cVar8;
          goto code_r0x0069cad6;
        case 10:
          *(char *)piVar24 = (char)*piVar24 + cVar8;
          *(char *)(uVar35 + 0x35e0814) = *(char *)(uVar35 + 0x35e0814) + -0xc;
          goto code_r0x0069e5a6;
        case 0xb:
          *piVar24 = *piVar24 + iVar55;
          *(char *)(uVar35 + 0x35e0814) = *(char *)(uVar35 + 0x35e0814) + -0xc;
          goto code_r0x0069e522;
        case 0xc:
          *piVar24 = *piVar24 + iVar55;
          *(char *)(uVar35 + 0x35e0814) = *(char *)(uVar35 + 0x35e0814) + -0xc;
          goto code_r0x0069e543;
        case 0xd:
          cVar8 = cVar8 + (char)*piVar24;
          pcVar26 = (char *)CONCAT71((int7)((ulong)piVar24 >> 8),cVar8);
          *pcVar26 = *pcVar26 + cVar8;
          goto LAB_0069e4b1;
        case 0xe:
          *piVar24 = *piVar24 + iVar55;
          *(char *)(uVar35 + 0x35e0814) = *(char *)(uVar35 + 0x35e0814) + -0xc;
          goto code_r0x0069e609;
        case 0xf:
          halt_baddata();
        }
        pcStack_100 = (code *)0x69e8a2;
        args[0] = (TCGTemp *)pTVar15;
        tcg_gen_callN_aarch64(pTVar19,pcVar45,(TCGTemp *)local_d8,3,args);
        pTVar57 = (TCGContext_conflict1 *)o_12;
      }
LAB_0069e8b1:
      s = (DisasContext_conflict1 *)local_e8;
      pcStack_100 = (code *)0x69e8b6;
      write_fp_sreg((DisasContext_conflict1 *)local_e8,uVar42,(TCGv_i32)pTVar57);
LAB_0069e8b6:
      pcStack_100 = (code *)0x69e8c3;
      tcg_temp_free_internal_aarch64(pTVar19,(TCGTemp *)local_e0);
      pcStack_100 = (code *)0x69e8ce;
      tcg_temp_free_internal_aarch64(pTVar19,(TCGTemp *)pTVar15);
      pcStack_100 = (code *)0x69e8d9;
      tcg_temp_free_internal_aarch64(pTVar19,(TCGTemp *)pTVar23);
      goto LAB_0069c378;
    case 3:
      puVar37 = auStack_f8;
      if (0x1fffffff < uVar11) goto switchD_00698b3f_caseD_0;
      pTVar19 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      puVar37 = auStack_f8;
      switch((uint)((ulong)local_e0 >> 0x16) & 3) {
      case 0:
        pcVar45 = (code *)&DAT_00000002;
        goto LAB_0069cc2f;
      case 1:
        pcVar45 = (code *)0x3;
LAB_0069cc2f:
        *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
        uVar54 = (uint)((TCGContext_conflict1 *)s)->frame_start;
        ppcVar39 = (code **)auStack_f8;
        if (uVar54 == 0) {
code_r0x0069cc44:
          local_e0 = (TCGContext_conflict1 *)(ulong)((uint)pTVar49 & 0x1f);
          local_c8 = (TCGContext_conflict1 *)CONCAT44(local_c8._4_4_,(int)pcVar45);
          pcStack_100 = (code *)0x69cc82;
          o_12 = (uintptr_t)tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false);
          pTVar23 = (TCGContext_conflict1 *)(o_12 - (long)pTVar19);
          pcStack_100 = (code *)0x69cca1;
          local_d0 = pTVar23;
          local_d8 = (TCGContext_conflict1 *)
                     tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false);
          local_c0 = (TCGv_i64)((long)local_d8 - (long)pTVar19);
          memop = (MemOp)local_c8;
          pcStack_100 = (code *)0x69cccf;
          read_vec_element(*(DisasContext_conflict1 **)
                            (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8),
                           (TCGv_i64)pTVar23,(uint)((ulong)pTVar49 >> 5) & 0x1f,0,(MemOp)local_c8);
          pTVar13 = local_c0;
          pcStack_100 = (code *)0x69ccf2;
          read_vec_element(*(DisasContext_conflict1 **)
                            (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8),local_c0,
                           (uint)((ulong)pTVar49 >> 0x10) & 0x1f,0,memop);
          pcStack_100 = (code *)0x69cd05;
          a64_test_cc(pTVar19,(DisasCompare64 *)args,(uint)((ulong)pTVar49 >> 0xc) & 0xf);
          pcStack_100 = (code *)0x69cd0f;
          pTVar14 = tcg_const_i64_aarch64(pTVar19,0);
          pTVar23 = local_d0;
          tcg_gen_movcond_i64_aarch64
                    (pTVar19,(TCGCond)args[0],(TCGv_i64)local_d0,(TCGv_i64)local_b0,pTVar14,
                     (TCGv_i64)local_d0,pTVar13);
          pcStack_100 = (code *)0x69cd4f;
          tcg_temp_free_internal_aarch64(pTVar19,(TCGTemp *)(pTVar14 + (long)pTVar19));
          pcStack_100 = (code *)0x69cd5c;
          tcg_temp_free_internal_aarch64(pTVar19,(TCGTemp *)local_d8);
          pcStack_100 = (code *)0x69cd6a;
          tcg_temp_free_internal_aarch64
                    (pTVar19,(TCGTemp *)((long)&pTVar19->pool_cur + (long)&local_b0->field_0x0));
          pcStack_100 = (code *)0x69cd7a;
          write_fp_dreg_aarch64(s,(int)local_e0,(TCGv_i64)pTVar23);
          pTVar25 = (TCGContext_conflict1 *)o_12;
LAB_0069c378:
          pcStack_100 = (code *)0x69c37d;
          tcg_temp_free_internal_aarch64(pTVar19,(TCGTemp *)pTVar25);
          puVar59 = auStack_f8;
          goto LAB_0069a72e;
        }
        goto LAB_0069cdb5;
      case 3:
        pcVar45 = (code *)&DAT_00000001;
        puVar37 = auStack_f8;
        if ((*(uint *)(lVar60 + 0x58) & 0xf0000) == 0x10000) goto LAB_0069cc2f;
      }
      goto switchD_00698b3f_caseD_0;
    }
code_r0x0069ae0f:
    pTVar15 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
    puVar37 = (undefined1 *)ppcVar39;
    pTVar23 = (TCGContext_conflict1 *)o_12;
    switch((uint)((ulong)pTVar49 >> 0x16) & 3) {
    case 0:
      iVar55 = 2;
      goto LAB_0069cda0;
    case 1:
      iVar55 = 3;
LAB_0069cda0:
      *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
      uVar54 = (uint)((TCGContext_conflict1 *)s)->frame_start;
      if (uVar54 == 0) {
        *(DisasContext_conflict1 **)((long)ppcVar39 + 0x10) = s;
        uVar54 = (uint)((ulong)pTVar49 >> 0x10) & 0x1f;
        uVar50 = (uint)((ulong)pTVar49 >> 0xc) & 0xf;
        uVar11 = (uint)((ulong)pTVar49 >> 5) & 0x1f;
        bVar40 = (byte)((ulong)pTVar49 >> 4);
        puVar59 = (undefined1 *)ppcVar39;
        if (uVar50 < 0xe) {
          *(int *)((long)ppcVar39 + 0x20) = iVar55;
          *(undefined8 *)((long)ppcVar39 + -8) = 0x69cea1;
          pTVar17 = gen_new_label_aarch64(pTVar15);
          *(TCGLabel **)((long)ppcVar39 + 8) = pTVar17;
          *(undefined8 *)((long)ppcVar39 + -8) = 0x69ceae;
          pTVar17 = gen_new_label_aarch64(pTVar15);
          *(TCGLabel **)((long)ppcVar39 + 0x28) = pTVar17;
          *(undefined8 *)((long)ppcVar39 + -8) = 0x69cec2;
          arm_gen_test_cc_aarch64(pTVar15,uVar50,*(TCGLabel **)((long)ppcVar39 + 8));
          *(undefined8 *)((long)ppcVar39 + -8) = 0x69ced1;
          pTVar13 = tcg_const_i64_aarch64(pTVar15,(ulong)(uint)((int)pTVar49 << 0x1c));
          *(undefined8 *)((long)ppcVar39 + -8) = 0x69cedf;
          gen_set_nzcv(pTVar15,pTVar13);
          *(undefined8 *)((long)ppcVar39 + -8) = 0x69ceed;
          tcg_temp_free_internal_aarch64(pTVar15,(TCGTemp *)(pTVar13 + (long)pTVar15));
          a1 = *(byte **)((long)ppcVar39 + 0x28);
          *(short *)(a1 + 2) = (short)((uint)*(ushort *)(a1 + 2) * 0x10000 + 0x10000 >> 0x10);
          *(undefined8 *)((long)ppcVar39 + -8) = 0x69cf17;
          tcg_gen_op1_aarch64(pTVar15,INDEX_op_br,(TCGArg)a1);
          a1_00 = *(byte **)((long)ppcVar39 + 8);
          *a1_00 = *a1_00 | 1;
          *(undefined8 *)((long)ppcVar39 + -8) = 0x69cf2c;
          tcg_gen_op1_aarch64(pTVar15,INDEX_op_set_label,(TCGArg)a1_00);
          s = *(DisasContext_conflict1 **)((long)ppcVar39 + 0x10);
          *(undefined8 *)((long)ppcVar39 + -8) = 0x69cf4c;
          handle_fp_compare(s,*(int *)((long)ppcVar39 + 0x20),uVar11,uVar54,false,
                            (_Bool)(bVar40 & 1));
          *a1 = *a1 | 1;
          *(undefined8 *)((long)ppcVar39 + -8) = 0x69cf60;
          tcg_gen_op1_aarch64(pTVar15,INDEX_op_set_label,(TCGArg)a1);
        }
        else {
          s = *(DisasContext_conflict1 **)((long)ppcVar39 + 0x10);
          *(undefined8 *)((long)ppcVar39 + -8) = 0x69d504;
          handle_fp_compare(s,iVar55,uVar11,uVar54,false,(_Bool)(bVar40 & 1));
        }
        goto LAB_0069a72e;
      }
      goto LAB_0069cdb5;
    case 3:
      iVar55 = 1;
      if ((*(uint *)(lVar60 + 0x58) & 0xf0000) == 0x10000) goto LAB_0069cda0;
    }
    goto switchD_00698b3f_caseD_0;
  case 8:
  case 9:
switchD_00698b3f_caseD_8:
    puVar37 = auStack_f8;
    switch((uint)((ulong)local_e0 >> 0x17) & 0x3f) {
    case 0x20:
    case 0x21:
      uVar35._0_4_ = ((TCGContext_conflict1 *)s)->nb_temps;
      uVar35._4_4_ = ((TCGContext_conflict1 *)s)->nb_indirects;
      pTVar15 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      uVar31 = (ulong)((uint)((ulong)local_e0 >> 0x1d) & 3) |
               ((long)local_e0 << 0x28) >> 0x2b & 0xfffffffffffffffcU;
      uVar47 = uVar31 << 0xc;
      uVar46 = uVar35 & 0xfffffffffffff000;
      if (-1 < (int)uVar11) {
        uVar47 = uVar31;
        uVar46 = uVar35;
      }
      pcStack_100 = (code *)0x698e60;
      pTVar13 = cpu_reg_aarch64(s,uVar11 & 0x1f);
      puVar59 = (undefined1 *)(uVar47 + uVar46);
      pTVar13 = pTVar13 + (long)pTVar15;
      TVar44 = INDEX_op_movi_i64;
      goto LAB_00698e72;
    case 0x22:
    case 0x23:
      pTVar19 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      uVar50 = (uint)((ulong)local_e0 >> 10) & 0xfff;
      uVar35 = (ulong)local_e0 >> 0x16;
      pTVar13 = *(TCGv_i64 *)((long)pTVar19->cpu_X + (ulong)((uint)((ulong)local_e0 >> 2) & 0xf8));
      if ((uVar11 >> 0x1d & 1) == 0) {
        pTVar15 = (TCGContext_conflict1 *)pTVar19->cpu_X[uVar11 & 0x1f];
      }
      else {
        pcStack_100 = (code *)0x699ae2;
        pTVar15 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar11 & 0x1f);
      }
      if ((uVar35 & 3) != 0) {
        puVar37 = auStack_f8;
        pTVar23 = (TCGContext_conflict1 *)o_12;
        if (((uint)uVar35 & 3) != 1) break;
        uVar50 = uVar50 << 0xc;
      }
      uVar35 = (ulong)uVar50;
      pcStack_100 = (code *)0x69a19b;
      local_e8 = (TCGContext_conflict1 *)s;
      pTVar56 = tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false);
      pTVar23 = local_e0;
      pTVar57 = (TCGContext_conflict1 *)((long)pTVar56 - (long)pTVar19);
      uVar11 = (uint)local_e0;
      if ((uVar11 >> 0x1d & 1) == 0) {
        if ((uVar11 >> 0x1e & 1) == 0) {
          pcStack_100 = (code *)0x69a1ca;
          tcg_gen_addi_i64_aarch64(pTVar19,(TCGv_i64)pTVar57,pTVar13,uVar35);
        }
        else {
          pcStack_100 = (code *)0x69a7e4;
          tcg_gen_subi_i64_aarch64(pTVar19,(TCGv_i64)pTVar57,pTVar13,uVar35);
        }
      }
      else {
        pcStack_100 = (code *)0x69a1e2;
        o_12 = (uintptr_t)pTVar56;
        pTVar14 = tcg_const_i64_aarch64(pTVar19,uVar35);
        uVar50 = (uint)((ulong)pTVar23 >> 0x1f) & 1;
        if ((uVar11 >> 0x1e & 1) == 0) {
          pcStack_100 = (code *)0x69a207;
          gen_add_CC(pTVar19,uVar50,(TCGv_i64)pTVar57,pTVar13,pTVar14);
        }
        else {
          pcStack_100 = (code *)0x69a7eb;
          gen_sub_CC(pTVar19,uVar50,(TCGv_i64)pTVar57,pTVar13,pTVar14);
        }
        pcStack_100 = (code *)0x69a7f9;
        tcg_temp_free_internal_aarch64(pTVar19,(TCGTemp *)(pTVar14 + (long)pTVar19));
        pTVar56 = (TCGTemp *)o_12;
      }
      if ((int)(uint)local_e0 < 0) {
        if (pTVar15 != pTVar57) {
          puVar59 = (undefined1 *)((long)&pTVar19->pool_cur + (long)&pTVar15->pool_cur);
LAB_0069b7fb:
          pcStack_100 = (code *)0x69b800;
          tcg_gen_op2_aarch64(pTVar19,INDEX_op_mov_i64,(TCGArg)puVar59,(TCGArg)pTVar56);
        }
      }
      else {
LAB_0069b7de:
        pcStack_100 = (code *)0x69b7e6;
        tcg_gen_ext32u_i64_aarch64(pTVar19,(TCGv_i64)pTVar15,(TCGv_i64)pTVar57);
      }
LAB_0069b800:
      pTVar56 = (TCGTemp *)((long)&pTVar19->pool_cur + (long)&pTVar57->pool_cur);
      goto LAB_0069b809;
    case 0x24:
      uVar35 = (ulong)local_e0 >> 0x16;
      puVar37 = auStack_f8;
      if ((uVar35 & 1) != 0 && -1 < (int)uVar11) break;
      o_12 = *(uintptr_t *)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      uVar54 = (uint)((ulong)local_e0 >> 0x1d) & 3;
      uVar46 = (ulong)local_e0 >> 10;
      uVar47 = (ulong)local_e0 >> 5;
      if (uVar54 == 3) {
        pcStack_100 = (code *)0x699ad5;
        local_d8 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar11 & 0x1f);
      }
      else {
        local_d8 = *(TCGContext_conflict1 **)(o_12 + 0xaeb0 + (ulong)(uVar11 & 0x1f) * 8);
      }
      pcStack_100 = (code *)0x69ae5a;
      pTVar13 = cpu_reg_aarch64(s,(uint)uVar47 & 0x1f);
      pcStack_100 = (code *)0x69ae6e;
      _Var33 = logic_imm_decode_wmask_aarch64
                         ((uint64_t *)args,(uint)uVar35 & 1,(uint)uVar46 & 0x3f,uVar50 & 0x3f);
      pTVar23 = local_d8;
      pTVar15 = (TCGContext_conflict1 *)o_12;
      if (!_Var33) {
        pcStack_100 = (code *)0x69aedd;
        unallocated_encoding_aarch64(s);
        puVar59 = auStack_f8;
        goto LAB_0069a72e;
      }
      if (-1 < (int)(uint)local_e0) {
        args[0] = args[0] & 0xffffffff;
      }
      switch(uVar54) {
      default:
        pcStack_100 = (code *)0x69aeb4;
        tcg_gen_andi_i64_aarch64
                  ((TCGContext_conflict1 *)o_12,(TCGv_i64)local_d8,pTVar13,(int64_t)args[0]);
        puVar59 = auStack_f8;
        if (uVar54 != 3) goto LAB_0069a72e;
        pTVar12 = *(TCGv_i32 *)((long)pTVar15 + 0xae98);
        if (-1 < (int)(uint)local_e0) goto LAB_0069c1bf;
        goto LAB_0069c393;
      case 1:
        pcStack_100 = (code *)0x69c180;
        tcg_gen_ori_i64_aarch64
                  ((TCGContext_conflict1 *)o_12,(TCGv_i64)local_d8,pTVar13,(int64_t)args[0]);
        break;
      case 2:
        pcStack_100 = (code *)0x69c195;
        tcg_gen_xori_i64_aarch64
                  ((TCGContext_conflict1 *)o_12,(TCGv_i64)local_d8,pTVar13,(int64_t)args[0]);
      }
      if ((int)(uint)local_e0 < 0) {
        puVar59 = auStack_f8;
        if (uVar54 != 3) goto LAB_0069a72e;
        pTVar12 = *(TCGv_i32 *)((long)pTVar15 + 0xae98);
LAB_0069c393:
        pcStack_100 = (code *)0x69c3a5;
        tcg_gen_extr_i64_i32_aarch64
                  (pTVar15,pTVar12,*(TCGv_i32 *)((long)pTVar15 + 0xae88),(TCGv_i64)pTVar23);
        TVar28 = *(long *)((long)pTVar15 + 0xae98) + (long)pTVar15;
        pcStack_100 = (code *)0x69c3c9;
        tcg_gen_op3_aarch64(pTVar15,INDEX_op_or_i32,TVar28,TVar28,
                            *(long *)((long)pTVar15 + 0xae88) + (long)pTVar15);
      }
      else {
        pcStack_100 = (code *)0x69c1ae;
        tcg_gen_ext32u_i64_aarch64(pTVar15,(TCGv_i64)pTVar23,(TCGv_i64)pTVar23);
        puVar59 = auStack_f8;
        if (uVar54 != 3) goto LAB_0069a72e;
        pTVar12 = *(TCGv_i32 *)((long)pTVar15 + 0xae98);
LAB_0069c1bf:
        pcStack_100 = (code *)0x69c1ca;
        tcg_gen_extrl_i64_i32_aarch64(pTVar15,pTVar12,(TCGv_i64)pTVar23);
        if (*(long *)((long)pTVar15 + 0xae88) != *(long *)((long)pTVar15 + 0xae98)) {
          pcStack_100 = (code *)0x69c1f4;
          tcg_gen_op2_aarch64(pTVar15,INDEX_op_mov_i32,
                              *(long *)((long)pTVar15 + 0xae88) + (long)pTVar15,
                              *(long *)((long)pTVar15 + 0xae98) + (long)pTVar15);
        }
      }
      pcStack_100 = (code *)0x69c3e2;
      tcg_gen_op2_aarch64(pTVar15,INDEX_op_movi_i32,
                          *(long *)((long)pTVar15 + 0xae80) + (long)pTVar15,0);
      pTVar13 = (TCGv_i64)(*(long *)((long)pTVar15 + 0xae90) + (long)pTVar15);
      TVar44 = INDEX_op_movi_i32;
      puVar59 = (undefined1 *)0x0;
LAB_00698e72:
      pcStack_100 = (code *)0x698e77;
      tcg_gen_op2_aarch64(pTVar15,TVar44,(TCGArg)pTVar13,(TCGArg)puVar59);
      puVar59 = auStack_f8;
      goto LAB_0069a72e;
    case 0x25:
      pTVar15 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      uVar50 = (uint)((ulong)local_e0 >> 0x15) & 3;
      pcStack_100 = (code *)0x699c29;
      pTVar19 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar11 & 0x1f);
      iVar55 = (int)local_e0;
      puVar37 = auStack_f8;
      pTVar23 = (TCGContext_conflict1 *)o_12;
      if (uVar50 < 2 || iVar55 < 0) {
        uVar35 = (ulong)local_e0 >> 5 & 0xffff;
        uVar50 = uVar50 << 4;
        puVar37 = auStack_f8;
        switch((uint)((ulong)local_e0 >> 0x1d) & 3) {
        default:
          puVar32 = (undefined1 *)
                    (-(ulong)(((ulong)local_e0 >> 0x1d & 3) == 0) ^ uVar35 << (sbyte)uVar50);
          puVar59 = (undefined1 *)((ulong)puVar32 & 0xffffffff);
          if (iVar55 < 0) {
            puVar59 = puVar32;
          }
          pTVar13 = (TCGv_i64)((long)&pTVar15->pool_cur + (long)&pTVar19->pool_cur);
          TVar44 = INDEX_op_movi_i64;
          goto LAB_00698e72;
        case 1:
          break;
        case 3:
          pcStack_100 = (code *)0x69b908;
          pTVar13 = tcg_const_i64_aarch64(pTVar15,uVar35);
          pcStack_100 = (code *)0x69b925;
          tcg_gen_deposit_i64_aarch64
                    (pTVar15,(TCGv_i64)pTVar19,(TCGv_i64)pTVar19,pTVar13,uVar50,0x10);
          pcStack_100 = (code *)0x69b933;
          tcg_temp_free_internal_aarch64(pTVar15,(TCGTemp *)(pTVar13 + (long)pTVar15));
joined_r0x0069b936:
          puVar59 = auStack_f8;
          if (-1 < iVar55) {
            pcStack_100 = (code *)0x69c7a4;
            tcg_gen_ext32u_i64_aarch64(pTVar15,(TCGv_i64)pTVar19,(TCGv_i64)pTVar19);
            puVar59 = auStack_f8;
          }
          goto LAB_0069a72e;
        }
      }
      break;
    case 0x26:
      uVar54 = (uint)((ulong)local_e0 >> 0x1f) & 1;
      uVar50 = uVar50 & 0x3f;
      iVar55 = uVar54 * 0x20;
      uVar41 = iVar55 + 0x20;
      local_e8 = (TCGContext_conflict1 *)s;
      if ((uVar50 <= uVar41 && uVar41 - uVar50 != 0) && uVar54 == ((uVar11 >> 0x16 & 1) != 0)) {
        uVar35 = (ulong)local_e0 >> 0x1d;
        uVar42 = (uint)uVar35 & 3;
        uVar54 = (uint)((ulong)local_e0 >> 10) & 0x3f;
        if (uVar54 < uVar41 && uVar42 != 3) {
          o_12 = *(uintptr_t *)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
          uVar46 = (ulong)local_e0 >> 5;
          pcStack_100 = (code *)0x699d2d;
          local_d8 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar11 & 0x1f);
          pcStack_100 = (code *)0x699d44;
          pTVar13 = read_cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,(uint)uVar46 & 0x1f,1);
          uVar53 = o_12;
          if (uVar54 < uVar50) {
            uVar54 = uVar54 + 1;
            uVar11 = uVar41 - uVar50 & iVar55 + 0x1fU;
LAB_0069c73e:
            if (((uVar35 & 3) == 0) && (uVar54 < uVar50)) {
              pcStack_100 = (code *)0x69c75e;
              tcg_gen_sextract_i64_aarch64((TCGContext_conflict1 *)uVar53,pTVar13,pTVar13,0,uVar54);
              uVar54 = uVar50;
            }
            else if (uVar42 == 1) {
              pcStack_100 = (code *)0x69c782;
              tcg_gen_deposit_i64_aarch64
                        ((TCGContext_conflict1 *)uVar53,(TCGv_i64)local_d8,(TCGv_i64)local_d8,
                         pTVar13,uVar11,uVar54);
              goto LAB_0069c782;
            }
            pcStack_100 = (code *)0x69c7c2;
            tcg_gen_deposit_z_i64_aarch64
                      ((TCGContext_conflict1 *)uVar53,(TCGv_i64)local_d8,pTVar13,uVar11,uVar54);
            puVar59 = auStack_f8;
            s = (DisasContext_conflict1 *)local_e8;
            goto LAB_0069a72e;
          }
          uVar54 = (uVar54 - uVar50) + 1;
          if (uVar42 == 2) {
            pcStack_100 = (code *)0x69c720;
            tcg_gen_extract_i64_aarch64
                      ((TCGContext_conflict1 *)o_12,(TCGv_i64)local_d8,pTVar13,uVar50,uVar54);
            puVar59 = auStack_f8;
            s = (DisasContext_conflict1 *)local_e8;
            goto LAB_0069a72e;
          }
          if ((uVar35 & 3) != 0) {
            pcStack_100 = (code *)0x69c738;
            tcg_gen_shri_i64_aarch64((TCGContext_conflict1 *)o_12,pTVar13,pTVar13,(ulong)uVar50);
            uVar11 = 0;
            goto LAB_0069c73e;
          }
          pcStack_100 = (code *)0x69b97a;
          tcg_gen_sextract_i64_aarch64
                    ((TCGContext_conflict1 *)o_12,(TCGv_i64)local_d8,pTVar13,uVar50,uVar54);
LAB_0069c782:
          pTVar15 = (TCGContext_conflict1 *)o_12;
          pTVar19 = local_d8;
          s = (DisasContext_conflict1 *)local_e8;
          iVar55 = (uint)local_e0;
          goto joined_r0x0069b936;
        }
      }
      goto switchD_00699076_caseD_1;
    case 0x27:
      uVar35 = (ulong)local_e0 >> 10;
      uVar54 = (uint)uVar35 & 0x3f;
      puVar37 = auStack_f8;
      if (((((ulong)local_e0 & 0x60200000) == 0) &&
          (puVar37 = auStack_f8,
          ((uint)((ulong)local_e0 >> 0x1f) & 1) == ((uint)((ulong)local_e0 >> 0x16) & 1))) &&
         (puVar37 = auStack_f8, (int)uVar11 < 0 || uVar54 < 0x20)) {
        local_d8 = *(TCGContext_conflict1 **)
                    (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        pcStack_100 = (code *)0x699b76;
        o_12 = (uintptr_t)cpu_reg_aarch64(s,uVar11 & 0x1f);
        pcStack_100 = (code *)0x699b86;
        local_d0 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar50 & 0x1f);
        if ((uVar35 & 0x3f) == 0) {
          pcStack_100 = (code *)0x69e945;
          disas_a64_insn_cold_1();
          puVar59 = auStack_f8;
          goto LAB_0069a72e;
        }
        uVar41 = (uint)((ulong)pTVar15 >> 5) & 0x1f;
        pcStack_100 = (code *)0x699bb1;
        local_e8 = (TCGContext_conflict1 *)s;
        pTVar23 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar41);
        pTVar19 = local_d8;
        if ((int)uVar11 < 0) {
          pcStack_100 = (code *)0x69b2fa;
          tcg_gen_extract2_i64_aarch64
                    (local_d8,(TCGv_i64)o_12,(TCGv_i64)local_d0,(TCGv_i64)pTVar23,uVar54);
          puVar59 = auStack_f8;
          s = (DisasContext_conflict1 *)local_e8;
          goto LAB_0069a72e;
        }
        pcStack_100 = (code *)0x699bd0;
        local_e0 = pTVar23;
        pTVar56 = tcg_temp_new_internal_aarch64(local_d8,TCG_TYPE_I32,false);
        pTVar57 = (TCGContext_conflict1 *)((long)pTVar56 - (long)pTVar19);
        pcStack_100 = (code *)0x699be6;
        tcg_gen_extrl_i64_i32_aarch64(pTVar19,(TCGv_i32)pTVar57,(TCGv_i64)local_d0);
        if ((uVar50 & 0x1f) == uVar41) {
          pcStack_100 = (code *)0x699bff;
          tcg_gen_rotri_i32_aarch64(pTVar19,(TCGv_i32)pTVar57,(TCGv_i32)pTVar57,uVar54);
        }
        else {
          pcStack_100 = (code *)0x69b45c;
          pTVar56 = tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I32,false);
          pcStack_100 = (code *)0x69b475;
          tcg_gen_extrl_i64_i32_aarch64
                    (pTVar19,(TCGv_i32)((long)pTVar56 - (long)pTVar19),(TCGv_i64)local_e0);
          pcStack_100 = (code *)0x69b489;
          tcg_gen_extract2_i32_aarch64
                    (pTVar19,(TCGv_i32)pTVar57,(TCGv_i32)pTVar57,
                     (TCGv_i32)((long)pTVar56 - (long)pTVar19),uVar54);
          pcStack_100 = (code *)0x69b494;
          tcg_temp_free_internal_aarch64(pTVar19,pTVar56);
        }
        pcStack_100 = (code *)0x69b4a4;
        tcg_gen_extu_i32_i64_aarch64(pTVar19,(TCGv_i64)o_12,(TCGv_i32)pTVar57);
LAB_0069b4a4:
        pTVar56 = (TCGTemp *)((long)&pTVar19->pool_cur + (long)&pTVar57->pool_cur);
        goto LAB_0069b809;
      }
    }
    goto switchD_00698b3f_caseD_0;
  case 10:
  case 0xb:
switchD_00698b3f_caseD_a:
    if (uVar41 < 0x4a) {
      if (uVar41 < 0x1b) {
        if (uVar41 - 10 < 2) goto LAB_0069913a;
        puVar37 = auStack_f8;
        if (uVar41 == 0x1a) goto LAB_00699e5a;
      }
      else {
        if (uVar41 == 0x1b) goto LAB_006997ce;
        puVar37 = auStack_f8;
        if ((uVar41 == 0x2a) && (puVar37 = auStack_f8, ((ulong)local_e0 & 0x1000010) == 0)) {
          pTVar23 = *(TCGContext_conflict1 **)
                     (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
          uVar34 = (long)(int)((int)(uVar11 << 8) >> 0xb & 0xfffffffc) +
                   *(long *)&((TCGContext_conflict1 *)s)->nb_temps;
          pcStack_100 = (code *)0x69977c;
          reset_btype(s);
          if ((uVar11 & 0xf) < 0xe) {
            pcStack_100 = (code *)0x69978e;
            pTVar17 = gen_new_label_aarch64(pTVar23);
            pcStack_100 = (code *)0x69979f;
            arm_gen_test_cc_aarch64(pTVar23,uVar11 & 0xf,pTVar17);
            pcStack_100 = (code *)0x6997ad;
            gen_goto_tb(s,0,(uint64_t)((TCGContext_conflict1 *)s)->pool_first);
            *(byte *)pTVar17 = *(byte *)pTVar17 | 1;
            pcStack_100 = (code *)0x6997c1;
            tcg_gen_op1_aarch64(pTVar23,INDEX_op_set_label,(TCGArg)pTVar17);
            iVar55 = 1;
            goto LAB_00699eef;
          }
          goto LAB_00699184;
        }
      }
      goto switchD_00698b3f_caseD_0;
    }
    if (uVar41 < 0x5b) {
      if (uVar41 - 0x4a < 2) {
LAB_0069913a:
        lVar60 = *(long *)&((TCGContext_conflict1 *)s)->nb_temps;
        if ((int)uVar11 < 0) {
          pTVar23 = *(TCGContext_conflict1 **)
                     (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
          pcStack_100 = (code *)0x699169;
          tcg_gen_op2_aarch64(pTVar23,INDEX_op_movi_i64,
                              (TCGArg)(pTVar23->cpu_X[0x1e] + (long)pTVar23),
                              (TCGArg)((TCGContext_conflict1 *)s)->pool_first);
          uVar11 = (uint)local_e0;
        }
        uVar34 = lVar60 + ((int)(uVar11 << 6) >> 4);
        pcStack_100 = (code *)0x699184;
        reset_btype(s);
LAB_00699184:
        iVar55 = 0;
      }
      else {
        puVar37 = auStack_f8;
        if (uVar41 != 0x5a) goto switchD_00698b3f_caseD_0;
LAB_00699e5a:
        pTVar23 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        lVar60 = *(long *)&((TCGContext_conflict1 *)s)->nb_temps;
        pcStack_100 = (code *)0x699e92;
        pTVar13 = read_cpu_reg_aarch64(s,uVar11 & 0x1f,(uint)((ulong)local_e0 >> 0x1f) & 1);
        pcStack_100 = (code *)0x699e9d;
        pTVar17 = gen_new_label_aarch64(pTVar23);
        pcStack_100 = (code *)0x699ea8;
        reset_btype(s);
        pcStack_100 = (code *)0x699ec1;
        tcg_gen_brcondi_i64_aarch64
                  (pTVar23,((uVar11 >> 0x18 & 1) != 0) + TCG_COND_EQ,pTVar13,0,pTVar17);
        pcStack_100 = (code *)0x699ecf;
        gen_goto_tb(s,0,(uint64_t)((TCGContext_conflict1 *)s)->pool_first);
        *(byte *)pTVar17 = *(byte *)pTVar17 | 1;
        pcStack_100 = (code *)0x699ee4;
        tcg_gen_op1_aarch64(pTVar23,INDEX_op_set_label,(TCGArg)pTVar17);
        iVar55 = 1;
        uVar34 = (int)((int)(uVar11 << 8) >> 0xb & 0xfffffffc) + lVar60;
      }
LAB_00699eef:
      pcStack_100 = (code *)0x699ef4;
      gen_goto_tb(s,iVar55,uVar34);
      puVar59 = auStack_f8;
      goto LAB_0069a72e;
    }
    if (uVar41 == 0x5b) {
LAB_006997ce:
      pTVar23 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      uVar35 = (ulong)local_e0 >> 0x1a;
      uVar46 = (ulong)local_e0 >> 0x13;
      o_12 = (long)(int)((int)(short)((ulong)local_e0 >> 3) & 0xfffffffc) +
             *(long *)&((TCGContext_conflict1 *)s)->nb_temps;
      pcStack_100 = (code *)0x69981d;
      local_d8 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar23,TCG_TYPE_I64,false);
      pTVar14 = (TCGv_i64)((long)local_d8 - (long)pTVar23);
      pcStack_100 = (code *)0x699835;
      pTVar13 = cpu_reg_aarch64(s,uVar11 & 0x1f);
      pcStack_100 = (code *)0x699851;
      tcg_gen_andi_i64_aarch64
                (pTVar23,pTVar14,pTVar13,1L << ((byte)uVar46 & 0x1f | (byte)uVar35 & 0x20));
      pcStack_100 = (code *)0x699859;
      pTVar17 = gen_new_label_aarch64(pTVar23);
      pcStack_100 = (code *)0x699864;
      reset_btype(s);
      pcStack_100 = (code *)0x699884;
      tcg_gen_brcondi_i64_aarch64
                (pTVar23,(((uint)local_e0 >> 0x18 & 1) != 0) + TCG_COND_EQ,pTVar14,0,pTVar17);
      pcStack_100 = (code *)0x699891;
      tcg_temp_free_internal_aarch64(pTVar23,(TCGTemp *)local_d8);
      pcStack_100 = (code *)0x69989f;
      gen_goto_tb(s,0,(uint64_t)((TCGContext_conflict1 *)s)->pool_first);
      *(byte *)pTVar17 = *(byte *)pTVar17 | 1;
      pcStack_100 = (code *)0x6998b3;
      tcg_gen_op1_aarch64(pTVar23,INDEX_op_set_label,(TCGArg)pTVar17);
      iVar55 = 1;
      uVar34 = o_12;
      goto LAB_00699eef;
    }
    if (uVar41 != 0x6a) {
      puVar37 = auStack_f8;
      if (uVar41 != 0x6b) goto switchD_00698b3f_caseD_0;
      if ((~uVar11 & 0x1f0000) == 0) {
        uVar50 = (uint)((ulong)local_e0 >> 0x15);
        uVar54 = uVar50 & 0xf;
        if (uVar54 < 10) {
          pTVar23 = *(TCGContext_conflict1 **)
                     (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
          uVar35 = (ulong)local_e0 >> 10;
          uVar58 = (uint)uVar35 & 0x3f;
          uVar41 = (uint)((ulong)local_e0 >> 5);
          uVar42 = uVar41 & 0x7ffffff;
          uVar41 = uVar41 & 0x1f;
          uVar10 = uVar11 & 0x1f;
          switch(uVar54) {
          default:
            if (uVar58 - 2 < 2) {
              if ((*(uint *)(lVar60 + 0x50) & 0xff000ff0) != 0) {
                if (uVar54 == 2) {
                  if ((uVar10 & uVar42) == 0x1f) {
                    pTVar13 = pTVar23->cpu_X[0x1f];
                    uVar41 = 0x1e;
                    local_e0 = pTVar23;
LAB_0069d144:
                    if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) ==
                        '\x01') {
                      pcStack_100 = (code *)0x69d15f;
                      o_12 = (uintptr_t)pTVar13;
                      local_d0 = (TCGContext_conflict1 *)new_tmp_a64_aarch64(s);
                      pTVar15 = local_e0;
                      local_d8 = (TCGContext_conflict1 *)(local_e0->cpu_env + (long)local_e0);
                      pcStack_100 = (code *)0x69d182;
                      cpu_reg_aarch64(s,uVar41);
                      pTVar23 = local_d0;
                      if (uVar58 == 2) {
                        pcVar45 = helper_autia_aarch64;
                      }
                      else {
                        pcVar45 = helper_autib_aarch64;
                      }
                      args[0] = (TCGTemp *)local_d8;
                      pcStack_100 = (code *)0x69dc43;
                      tcg_gen_callN_aarch64
                                (pTVar15,pcVar45,
                                 (TCGTemp *)((long)&pTVar15->pool_cur + (long)&local_d0->pool_cur),3
                                 ,args);
                    }
                    else {
                      pcStack_100 = (code *)0x69d76b;
                      pTVar23 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar41);
                    }
                    goto LAB_0069dc46;
                  }
                }
                else if (uVar10 == 0x1f) {
                  pcStack_100 = (code *)0x69d144;
                  local_e0 = pTVar23;
                  pTVar13 = new_tmp_a64_zero_aarch64(s);
                  goto LAB_0069d144;
                }
              }
            }
            else if (((uVar35 & 0x3f) == 0) && (((ulong)local_e0 & 0x1f) == 0)) {
              pcStack_100 = (code *)0x69bf06;
              local_e0 = pTVar23;
              pTVar23 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar41);
LAB_0069dc46:
              pcStack_100 = (code *)0x69dc51;
              gen_a64_set_pc(s,(TCGv_i64)pTVar23);
              if (uVar54 != 1) goto LAB_0069dc84;
LAB_0069dc57:
              pcStack_100 = (code *)0x69dc82;
              tcg_gen_op2_aarch64(local_e0,INDEX_op_movi_i64,
                                  (long)&local_e0->pool_cur +
                                  *(long *)(*(long *)(((TCGContext_conflict1 *)s)->free_temps[1].l
                                                      [1] + 0x2e8) + 0xafa0),
                                  (TCGArg)((TCGContext_conflict1 *)s)->pool_first);
LAB_0069dcb7:
              iVar55 = 2;
              if ((*(byte *)(*(long *)&((TCGContext_conflict1 *)s)->nb_labels + 0x60) & 0xf) != 0) {
LAB_0069dcc6:
                pcStack_100 = (code *)0x69dcce;
                set_btype(s,iVar55);
              }
              goto LAB_0069dcce;
            }
            break;
          case 3:
          case 6:
          case 7:
            break;
          case 4:
            if (*(int *)&((TCGContext_conflict1 *)s)->code_gen_epilogue != 0) {
              pTVar15 = (TCGContext_conflict1 *)s;
              if (uVar58 - 2 < 2) {
                if (((uVar10 & uVar42) != 0x1f) || ((*(ulong *)(lVar60 + 0x50) & 0xff000ff0) == 0))
                break;
                pcStack_100 = (code *)0x69c43f;
                pTVar56 = tcg_temp_new_internal_aarch64(pTVar23,TCG_TYPE_I64,false);
                pTVar19 = (TCGContext_conflict1 *)((long)pTVar56 - (long)pTVar23);
                pcStack_100 = (code *)0x69c471;
                tcg_gen_op3_aarch64(pTVar23,INDEX_op_ld_i64,(TCGArg)pTVar56,
                                    (TCGArg)(pTVar23->cpu_env + (long)pTVar23),
                                    (long)*(int *)&((TCGContext_conflict1 *)s)->code_gen_epilogue *
                                    8 + 0x238);
                if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01'
                   ) {
                  args[0] = (TCGTemp *)(pTVar23->cpu_env + (long)pTVar23);
                  if (uVar58 == 2) {
                    pcVar45 = helper_autia_aarch64;
                  }
                  else {
                    pcVar45 = helper_autib_aarch64;
                  }
                  pcStack_100 = (code *)0x69e4b1;
                  tcg_gen_callN_aarch64
                            (pTVar23,pcVar45,(TCGTemp *)((long)pTVar23 + (long)pTVar19),3,args);
                }
              }
              else {
                if (((uVar35 & 0x3f) != 0) || (((ulong)local_e0 & 0x1f) != 0)) break;
                pcStack_100 = (code *)0x69d6e0;
                pTVar56 = tcg_temp_new_internal_aarch64(pTVar23,TCG_TYPE_I64,false);
                pTVar19 = (TCGContext_conflict1 *)((long)pTVar56 - (long)pTVar23);
                pcStack_100 = (code *)0x69d712;
                tcg_gen_op3_aarch64(pTVar23,INDEX_op_ld_i64,(TCGArg)pTVar56,
                                    (TCGArg)(pTVar23->cpu_env + (long)pTVar23),
                                    (long)*(int *)&((TCGContext_conflict1 *)s)->code_gen_epilogue *
                                    8 + 0x238);
              }
LAB_0069e4b1:
              args[0] = (TCGTemp *)(pTVar23->cpu_env + (long)pTVar23);
              pcStack_100 = (code *)0x69e4e1;
              tcg_gen_callN_aarch64(pTVar23,helper_exception_return_aarch64,(TCGTemp *)0x0,2,args);
              pcStack_100 = (code *)0x69e4ec;
              tcg_temp_free_internal_aarch64
                        (pTVar23,(TCGTemp *)((long)&pTVar23->pool_cur + (long)&pTVar19->pool_cur));
              *(undefined4 *)&pTVar15->pool_current = 0xc;
              puVar59 = auStack_f8;
              s = (DisasContext_conflict1 *)pTVar15;
              goto LAB_0069a72e;
            }
            break;
          case 5:
            break;
          case 8:
          case 9:
            if (((uVar11 & 0xf800) == 0x800) && ((*(ulong *)(lVar60 + 0x50) & 0xff000ff0) != 0)) {
              if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01')
              {
                pcStack_100 = (code *)0x69bc6f;
                local_e8 = (TCGContext_conflict1 *)s;
                local_e0 = pTVar23;
                local_d0 = (TCGContext_conflict1 *)new_tmp_a64_aarch64(s);
                pTVar15 = local_e0;
                local_d8 = (TCGContext_conflict1 *)(local_e0->cpu_env + (long)local_e0);
                o_12 = (long)&local_e0->pool_cur +
                       *(long *)(*(long *)(local_e8->free_temps[1].l[1] + 0x2e8) + 0xaeb0 +
                                (ulong)uVar10 * 8);
                pcStack_100 = (code *)0x69bcb4;
                cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,uVar41);
                pTVar23 = local_d0;
                if (uVar58 == 2) {
                  pcVar45 = helper_autia_aarch64;
                }
                else {
                  pcVar45 = helper_autib_aarch64;
                }
                args[0] = (TCGTemp *)local_d8;
                pcStack_100 = (code *)0x69d73d;
                tcg_gen_callN_aarch64
                          (pTVar15,pcVar45,
                           (TCGTemp *)((long)&pTVar15->pool_cur + (long)&local_d0->pool_cur),3,args)
                ;
              }
              else {
                pcStack_100 = (code *)0x69d0f0;
                local_e0 = pTVar23;
                pTVar23 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar41);
              }
              pcStack_100 = (code *)0x69d74b;
              gen_a64_set_pc(s,(TCGv_i64)pTVar23);
              if (uVar54 == 9) goto LAB_0069dc57;
              uVar54 = uVar50 & 1;
LAB_0069dc84:
              if (uVar54 == 1) goto LAB_0069dcb7;
              if ((uVar54 == 0) &&
                 ((*(byte *)(*(long *)&((TCGContext_conflict1 *)s)->nb_labels + 0x60) & 0xf) != 0))
              {
                iVar55 = 1;
                if ((uVar41 & 0xfffffffe) != 0x10) {
                  iVar55 = (uint)*(byte *)((long)&((TCGContext_conflict1 *)s)->code_gen_buffer_size
                                          + 1) * 2 + 1;
                }
                goto LAB_0069dcc6;
              }
LAB_0069dcce:
              *(undefined4 *)&((TCGContext_conflict1 *)s)->pool_current = 3;
              puVar59 = auStack_f8;
              goto LAB_0069a72e;
            }
          }
        }
      }
      puVar38 = auStack_f8;
      goto LAB_0069a729;
    }
    if ((uVar11 >> 0x18 & 1) != 0) {
      puVar38 = auStack_f8;
      if (((ulong)local_e0 & 0xc00000) == 0) {
        pcStack_100 = (code *)0x69a413;
        disas_system(s,uVar11);
        puVar59 = auStack_f8;
        goto LAB_0069a72e;
      }
      goto LAB_0069a729;
    }
    uVar50 = (uint)((ulong)local_e0 >> 0x15) & 7;
    puVar37 = auStack_f8;
    if (5 < (ushort)uVar50) goto switchD_00698b3f_caseD_0;
    pTVar15 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
    uVar54 = uVar11 & 0x1f;
    uVar11 = uVar11 >> 5 & 0xffff;
    puVar37 = auStack_f8;
    switch(uVar50) {
    case 0:
      if (uVar54 == 3) {
        puVar37 = auStack_f8;
        if (*(int *)&((TCGContext_conflict1 *)s)->code_gen_epilogue != 0) {
          a2_00._0_4_ = ((TCGContext_conflict1 *)s)->nb_temps;
          a2_00._4_4_ = ((TCGContext_conflict1 *)s)->nb_indirects;
          pcStack_100 = (code *)0x69d2f6;
          tcg_gen_op2_aarch64(pTVar15,INDEX_op_movi_i64,
                              (TCGArg)(pTVar15->cpu_pc_arm64 + (long)pTVar15),a2_00);
          uVar9 = uVar11 | 0x5e000000;
          pcStack_100 = (code *)0x69d306;
          pTVar12 = tcg_const_i32_aarch64(pTVar15,uVar9);
          args[0] = (TCGTemp *)(pTVar15->cpu_env + (long)pTVar15);
          pcStack_100 = (code *)0x69d336;
          tcg_gen_callN_aarch64(pTVar15,helper_pre_smc_aarch64,(TCGTemp *)0x0,2,args);
          pcStack_100 = (code *)0x69d341;
          tcg_temp_free_internal_aarch64(pTVar15,(TCGTemp *)(pTVar12 + (long)pTVar15));
          if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 1) == '\x01') {
            pTVar23 = *(TCGContext_conflict1 **)
                       (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
            *(undefined1 *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 2) = 0;
            pcStack_100 = (code *)0x69d371;
            pTVar56 = tcg_temp_new_internal_aarch64(pTVar23,TCG_TYPE_I32,false);
            pcStack_100 = (code *)0x69d39a;
            tcg_gen_op3_aarch64(pTVar23,INDEX_op_ld_i32,(TCGArg)pTVar56,
                                (TCGArg)(pTVar23->cpu_env + (long)pTVar23),0x148);
            pcStack_100 = (code *)0x69d3ad;
            tcg_gen_andi_i32_aarch64
                      (pTVar23,(TCGv_i32)((long)pTVar56 - (long)pTVar23),
                       (TCGv_i32)((long)pTVar56 - (long)pTVar23),-0x200001);
            pcStack_100 = (code *)0x69d3cd;
            tcg_gen_op3_aarch64(pTVar23,INDEX_op_st_i32,(TCGArg)pTVar56,
                                (TCGArg)(pTVar23->cpu_env + (long)pTVar23),0x148);
            pcStack_100 = (code *)0x69d3d8;
            tcg_temp_free_internal_aarch64(pTVar23,pTVar56);
          }
          pc_00 = ((TCGContext_conflict1 *)s)->pool_first;
          iVar55 = 0xd;
          uVar54 = 3;
          goto LAB_0069cdc6;
        }
        break;
      }
      if (uVar54 == 2) {
        puVar37 = auStack_f8;
        if (*(int *)&((TCGContext_conflict1 *)s)->code_gen_epilogue != 0) {
          a2._0_4_ = ((TCGContext_conflict1 *)s)->nb_temps;
          a2._4_4_ = ((TCGContext_conflict1 *)s)->nb_indirects;
          pcStack_100 = (code *)0x69d1ef;
          tcg_gen_op2_aarch64(pTVar15,INDEX_op_movi_i64,
                              (TCGArg)(pTVar15->cpu_pc_arm64 + (long)pTVar15),a2);
          args[0] = (TCGTemp *)(pTVar15->cpu_env + (long)pTVar15);
          pcStack_100 = (code *)0x69d217;
          tcg_gen_callN_aarch64(pTVar15,helper_pre_hvc_aarch64,(TCGTemp *)0x0,1,args);
          if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 1) == '\x01') {
            pTVar23 = *(TCGContext_conflict1 **)
                       (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
            *(undefined1 *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 2) = 0;
            pcStack_100 = (code *)0x69d247;
            pTVar56 = tcg_temp_new_internal_aarch64(pTVar23,TCG_TYPE_I32,false);
            pcStack_100 = (code *)0x69d270;
            tcg_gen_op3_aarch64(pTVar23,INDEX_op_ld_i32,(TCGArg)pTVar56,
                                (TCGArg)(pTVar23->cpu_env + (long)pTVar23),0x148);
            pcStack_100 = (code *)0x69d283;
            tcg_gen_andi_i32_aarch64
                      (pTVar23,(TCGv_i32)((long)pTVar56 - (long)pTVar23),
                       (TCGv_i32)((long)pTVar56 - (long)pTVar23),-0x200001);
            pcStack_100 = (code *)0x69d2a3;
            tcg_gen_op3_aarch64(pTVar23,INDEX_op_st_i32,(TCGArg)pTVar56,
                                (TCGArg)(pTVar23->cpu_env + (long)pTVar23),0x148);
            pcStack_100 = (code *)0x69d2ae;
            tcg_temp_free_internal_aarch64(pTVar23,pTVar56);
          }
          pc_00 = ((TCGContext_conflict1 *)s)->pool_first;
          uVar9 = uVar11 | 0x5a000000;
          iVar55 = 0xb;
          uVar54 = 2;
          puVar32 = auStack_f8;
          goto LAB_0069cdc6;
        }
        break;
      }
      puVar37 = auStack_f8;
      if (uVar54 != 1) break;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 1) == '\x01') {
        *(undefined1 *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 2) = 0;
        pcStack_100 = (code *)0x69a0df;
        pTVar56 = tcg_temp_new_internal_aarch64(pTVar15,TCG_TYPE_I32,false);
        pcStack_100 = (code *)0x69a108;
        tcg_gen_op3_aarch64(pTVar15,INDEX_op_ld_i32,(TCGArg)pTVar56,
                            (TCGArg)(pTVar15->cpu_env + (long)pTVar15),0x148);
        pcStack_100 = (code *)0x69a11b;
        tcg_gen_andi_i32_aarch64
                  (pTVar15,(TCGv_i32)((long)pTVar56 - (long)pTVar15),
                   (TCGv_i32)((long)pTVar56 - (long)pTVar15),-0x200001);
        pcStack_100 = (code *)0x69a13b;
        tcg_gen_op3_aarch64(pTVar15,INDEX_op_st_i32,(TCGArg)pTVar56,
                            (TCGArg)(pTVar15->cpu_env + (long)pTVar15),0x148);
        pcStack_100 = (code *)0x69a146;
        tcg_temp_free_internal_aarch64(pTVar15,pTVar56);
      }
      pc_00 = ((TCGContext_conflict1 *)s)->pool_first;
      uVar9 = uVar11 | 0x56000000;
      if (((int)((TCGContext_conflict1 *)s)->current_frame_offset != 0x17) ||
         (uVar54 = 3, *(char *)((long)&((TCGContext_conflict1 *)s)->frame_end + 4) == '\0')) {
        uVar54 = 1;
        if (1 < (int)*(uint32_t *)&((TCGContext_conflict1 *)s)->code_gen_epilogue) {
          uVar54 = *(uint32_t *)&((TCGContext_conflict1 *)s)->code_gen_epilogue;
        }
      }
      iVar55 = 2;
      puVar32 = auStack_f8;
      goto LAB_0069cdc6;
    case 1:
      puVar37 = auStack_f8;
      if (((ulong)local_e0 & 0x1f) == 0) {
        TVar28._0_4_ = ((TCGContext_conflict1 *)s)->nb_temps;
        TVar28._4_4_ = ((TCGContext_conflict1 *)s)->nb_indirects;
        pcStack_100 = (code *)0x69be74;
        tcg_gen_op2_aarch64(pTVar15,INDEX_op_movi_i64,
                            (TCGArg)(pTVar15->cpu_pc_arm64 + (long)pTVar15),TVar28);
        pcStack_100 = (code *)0x69be7e;
        pTVar12 = tcg_const_i32_aarch64(pTVar15,uVar11 | 0xf2000000);
        args[0] = (TCGTemp *)(pTVar15->cpu_env + (long)pTVar15);
        pcStack_100 = (code *)0x69beae;
        tcg_gen_callN_aarch64(pTVar15,helper_exception_bkpt_insn_aarch64,(TCGTemp *)0x0,2,args);
        pcStack_100 = (code *)0x69beb9;
        tcg_temp_free_internal_aarch64(pTVar15,(TCGTemp *)(pTVar12 + (long)pTVar15));
        *(undefined4 *)&((TCGContext_conflict1 *)s)->pool_current = 2;
        puVar59 = auStack_f8;
        goto LAB_0069a72e;
      }
    }
    goto switchD_00698b3f_caseD_0;
  }
  pTVar19 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
  uVar50 = (uint)((ulong)local_e0 >> 0x1f) & 1;
  uVar42 = (uint)((ulong)local_e0 >> 5) & 0x1f;
  uVar54 = uVar11 & 0x1f;
  uVar41 = (uint)((ulong)local_e0 >> 9) & 0xffe;
  puVar37 = auStack_f8;
  switch(uVar41 + uVar50) {
  case 0x81:
    if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
      pcStack_100 = (code *)0x69b3a6;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      args[0] = (TCGTemp *)(pTVar19->cpu_env + (long)pTVar19);
      pTVar56 = (TCGTemp *)(pTVar13 + (long)pTVar19);
      pcVar45 = helper_pacia_aarch64;
LAB_0069e32b:
      iVar55 = 3;
LAB_0069e330:
      pcStack_100 = (code *)0x69e335;
      tcg_gen_callN_aarch64(pTVar19,pcVar45,pTVar56,iVar55,args);
      puVar59 = auStack_f8;
      goto LAB_0069a72e;
    }
    goto LAB_0069e188;
  case 0x82:
  case 0x84:
  case 0x86:
  case 0x88:
  case 0x8a:
  case 0x8c:
  case 0x8e:
  case 0x90:
  case 0x92:
  case 0x94:
  case 0x96:
  case 0x98:
  case 0x9a:
  case 0x9c:
  case 0x9e:
  case 0xa0:
  case 0xa2:
    break;
  case 0x83:
    if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
      pcStack_100 = (code *)0x69e0e5;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      args[0] = (TCGTemp *)(pTVar19->cpu_env + (long)pTVar19);
      pTVar56 = (TCGTemp *)(pTVar13 + (long)pTVar19);
      pcVar45 = helper_pacib_aarch64;
      goto LAB_0069e32b;
    }
    goto LAB_0069e188;
  case 0x85:
    if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
      pcStack_100 = (code *)0x69e021;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      args[0] = (TCGTemp *)(pTVar19->cpu_env + (long)pTVar19);
      pTVar56 = (TCGTemp *)(pTVar13 + (long)pTVar19);
      pcVar45 = helper_pacda_aarch64;
      goto LAB_0069e32b;
    }
    goto LAB_0069e188;
  case 0x87:
    if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
      pcStack_100 = (code *)0x69e140;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      args[0] = (TCGTemp *)(pTVar19->cpu_env + (long)pTVar19);
      pTVar56 = (TCGTemp *)(pTVar13 + (long)pTVar19);
      pcVar45 = helper_pacdb_aarch64;
      goto LAB_0069e32b;
    }
    goto LAB_0069e188;
  case 0x89:
    if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
      pcStack_100 = (code *)0x69def1;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      args[0] = (TCGTemp *)(pTVar19->cpu_env + (long)pTVar19);
      pTVar56 = (TCGTemp *)(pTVar13 + (long)pTVar19);
      pcVar45 = helper_autia_aarch64;
      goto LAB_0069e32b;
    }
    goto LAB_0069e188;
  case 0x8b:
    if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
      pcStack_100 = (code *)0x69e083;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      args[0] = (TCGTemp *)(pTVar19->cpu_env + (long)pTVar19);
      pTVar56 = (TCGTemp *)(pTVar13 + (long)pTVar19);
      pcVar45 = helper_autib_aarch64;
      goto LAB_0069e32b;
    }
    goto LAB_0069e188;
  case 0x8d:
    if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
      pcStack_100 = (code *)0x69de8f;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      args[0] = (TCGTemp *)(pTVar19->cpu_env + (long)pTVar19);
      pTVar56 = (TCGTemp *)(pTVar13 + (long)pTVar19);
      pcVar45 = helper_autda_aarch64;
      goto LAB_0069e32b;
    }
    goto LAB_0069e188;
  case 0x8f:
    if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
      pcStack_100 = (code *)0x69dd5f;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      args[0] = (TCGTemp *)(pTVar19->cpu_env + (long)pTVar19);
      pTVar56 = (TCGTemp *)(pTVar13 + (long)pTVar19);
      pcVar45 = helper_autdb_aarch64;
      goto LAB_0069e32b;
    }
LAB_0069e188:
    puVar59 = auStack_f8;
    puVar37 = auStack_f8;
    if ((*(uint *)(lVar60 + 0x50) & 0xff000ff0) != 0) goto LAB_0069a72e;
    break;
  case 0x91:
    puVar37 = auStack_f8;
    if ((uVar42 == 0x1f) && (puVar37 = auStack_f8, (*(ulong *)(lVar60 + 0x50) & 0xff000ff0) != 0)) {
      puVar59 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_0069a72e;
      pcStack_100 = (code *)0x69e236;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      pTVar5 = pTVar19->cpu_env;
      pcStack_100 = (code *)0x69e24b;
      new_tmp_a64_zero_aarch64(s);
      pTVar56 = (TCGTemp *)(pTVar13 + (long)pTVar19);
      pcVar45 = helper_pacia_aarch64;
      args[0] = (TCGTemp *)(pTVar5 + (long)pTVar19);
      goto LAB_0069e32b;
    }
    break;
  case 0x93:
    puVar37 = auStack_f8;
    if ((uVar42 == 0x1f) && (puVar37 = auStack_f8, (*(ulong *)(lVar60 + 0x50) & 0xff000ff0) != 0)) {
      puVar59 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_0069a72e;
      pcStack_100 = (code *)0x69df66;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      pTVar5 = pTVar19->cpu_env;
      pcStack_100 = (code *)0x69df7b;
      new_tmp_a64_zero_aarch64(s);
      pTVar56 = (TCGTemp *)(pTVar13 + (long)pTVar19);
      pcVar45 = helper_pacib_aarch64;
      args[0] = (TCGTemp *)(pTVar5 + (long)pTVar19);
      goto LAB_0069e32b;
    }
    break;
  case 0x95:
    puVar37 = auStack_f8;
    if ((uVar42 == 0x1f) && (puVar37 = auStack_f8, (*(ulong *)(lVar60 + 0x50) & 0xff000ff0) != 0)) {
      puVar59 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_0069a72e;
      pcStack_100 = (code *)0x69e2f3;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      pTVar5 = pTVar19->cpu_env;
      pcStack_100 = (code *)0x69e308;
      new_tmp_a64_zero_aarch64(s);
      pTVar56 = (TCGTemp *)(pTVar13 + (long)pTVar19);
      pcVar45 = helper_pacda_aarch64;
      args[0] = (TCGTemp *)(pTVar5 + (long)pTVar19);
      goto LAB_0069e32b;
    }
    break;
  case 0x97:
    puVar37 = auStack_f8;
    if ((uVar42 == 0x1f) && (puVar37 = auStack_f8, (*(ulong *)(lVar60 + 0x50) & 0xff000ff0) != 0)) {
      puVar59 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_0069a72e;
      pcStack_100 = (code *)0x69dfcd;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      pTVar5 = pTVar19->cpu_env;
      pcStack_100 = (code *)0x69dfe2;
      new_tmp_a64_zero_aarch64(s);
      pTVar56 = (TCGTemp *)(pTVar13 + (long)pTVar19);
      pcVar45 = helper_pacdb_aarch64;
      args[0] = (TCGTemp *)(pTVar5 + (long)pTVar19);
      goto LAB_0069e32b;
    }
    break;
  case 0x99:
    puVar37 = auStack_f8;
    if ((uVar42 == 0x1f) && (puVar37 = auStack_f8, (*(ulong *)(lVar60 + 0x50) & 0xff000ff0) != 0)) {
      puVar59 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_0069a72e;
      pcStack_100 = (code *)0x69e1cf;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      pTVar5 = pTVar19->cpu_env;
      pcStack_100 = (code *)0x69e1e4;
      new_tmp_a64_zero_aarch64(s);
      pTVar56 = (TCGTemp *)(pTVar13 + (long)pTVar19);
      pcVar45 = helper_autia_aarch64;
      args[0] = (TCGTemp *)(pTVar5 + (long)pTVar19);
      goto LAB_0069e32b;
    }
    break;
  case 0x9b:
    puVar37 = auStack_f8;
    if ((uVar42 == 0x1f) && (puVar37 = auStack_f8, (*(ulong *)(lVar60 + 0x50) & 0xff000ff0) != 0)) {
      puVar59 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_0069a72e;
      pcStack_100 = (code *)0x69ddd4;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      pTVar5 = pTVar19->cpu_env;
      pcStack_100 = (code *)0x69dde9;
      new_tmp_a64_zero_aarch64(s);
      pTVar56 = (TCGTemp *)(pTVar13 + (long)pTVar19);
      pcVar45 = helper_autib_aarch64;
      args[0] = (TCGTemp *)(pTVar5 + (long)pTVar19);
      goto LAB_0069e32b;
    }
    break;
  case 0x9d:
    puVar37 = auStack_f8;
    if ((uVar42 == 0x1f) && (puVar37 = auStack_f8, (*(ulong *)(lVar60 + 0x50) & 0xff000ff0) != 0)) {
      puVar59 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_0069a72e;
      pcStack_100 = (code *)0x69de3b;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      pTVar5 = pTVar19->cpu_env;
      pcStack_100 = (code *)0x69de50;
      new_tmp_a64_zero_aarch64(s);
      pTVar56 = (TCGTemp *)(pTVar13 + (long)pTVar19);
      pcVar45 = helper_autda_aarch64;
      args[0] = (TCGTemp *)(pTVar5 + (long)pTVar19);
      goto LAB_0069e32b;
    }
    break;
  case 0x9f:
    puVar37 = auStack_f8;
    if ((uVar42 == 0x1f) && (puVar37 = auStack_f8, (*(ulong *)(lVar60 + 0x50) & 0xff000ff0) != 0)) {
      puVar59 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_0069a72e;
      pcStack_100 = (code *)0x69dd0b;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      pTVar5 = pTVar19->cpu_env;
      pcStack_100 = (code *)0x69dd20;
      new_tmp_a64_zero_aarch64(s);
      pTVar56 = (TCGTemp *)(pTVar13 + (long)pTVar19);
      pcVar45 = helper_autdb_aarch64;
      args[0] = (TCGTemp *)(pTVar5 + (long)pTVar19);
      goto LAB_0069e32b;
    }
    break;
  case 0xa1:
    puVar37 = auStack_f8;
    if ((uVar42 == 0x1f) && (puVar37 = auStack_f8, (*(ulong *)(lVar60 + 0x50) & 0xff000ff0) != 0)) {
      puVar59 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_0069a72e;
      pcStack_100 = (code *)0x69e29d;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      pTVar5 = pTVar19->cpu_env;
      pcVar45 = helper_xpaci_aarch64;
LAB_0069e38b:
      args[0] = (TCGTemp *)(pTVar5 + (long)pTVar19);
      pTVar56 = (TCGTemp *)(pTVar13 + (long)pTVar19);
      iVar55 = 2;
      goto LAB_0069e330;
    }
    break;
  case 0xa3:
    puVar37 = auStack_f8;
    if ((uVar42 == 0x1f) && (puVar37 = auStack_f8, (*(ulong *)(lVar60 + 0x50) & 0xff000ff0) != 0)) {
      puVar59 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_0069a72e;
      pcStack_100 = (code *)0x69e36a;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      pTVar5 = pTVar19->cpu_env;
      pcVar45 = helper_xpacd_aarch64;
      goto LAB_0069e38b;
    }
    break;
  default:
    puVar37 = auStack_f8;
    switch(uVar41 | uVar50) {
    case 0:
    case 1:
      pcStack_100 = (code *)0x69ce00;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      pcStack_100 = (code *)0x69ce0d;
      pTVar14 = cpu_reg_aarch64(s,uVar42);
      if ((int)uVar11 < 0) {
        args[0] = (TCGTemp *)(pTVar14 + (long)pTVar19);
        pcStack_100 = (code *)0x69e475;
        tcg_gen_callN_aarch64
                  (pTVar19,helper_rbit64_aarch64,(TCGTemp *)(pTVar13 + (long)pTVar19),1,args);
        puVar59 = auStack_f8;
        s = (DisasContext_conflict1 *)local_e8;
        goto LAB_0069a72e;
      }
      pcStack_100 = (code *)0x69ce25;
      pTVar56 = tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I32,false);
      pTVar12 = (TCGv_i32)((long)pTVar56 - (long)pTVar19);
      pcStack_100 = (code *)0x69ce3c;
      tcg_gen_extrl_i64_i32_aarch64(pTVar19,pTVar12,pTVar14);
      pcStack_100 = (code *)0x69ce5b;
      args[0] = pTVar56;
      tcg_gen_callN_aarch64(pTVar19,helper_rbit_aarch64,pTVar56,1,args);
      break;
    case 2:
    case 3:
      pcStack_100 = (code *)0x69db43;
      o_12 = (uintptr_t)cpu_reg_aarch64(s,uVar54);
      pcStack_100 = (code *)0x69db57;
      pTVar25 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false);
      pcStack_100 = (code *)0x69db6f;
      pTVar13 = read_cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,uVar42,uVar50);
      val_01 = 0xff00ff00ff00ff;
      if (-1 < (int)uVar11) {
        val_01 = 0xff00ff;
      }
      pcStack_100 = (code *)0x69db90;
      pTVar14 = tcg_const_i64_aarch64(pTVar19,val_01);
      pcStack_100 = (code *)0x69dba6;
      tcg_gen_shri_i64_aarch64(pTVar19,(TCGv_i64)((long)pTVar25 - (long)pTVar19),pTVar13,8);
      uVar53 = o_12;
      TVar28 = (long)&pTVar19->pool_cur + o_12;
      pTVar56 = (TCGTemp *)(pTVar14 + (long)pTVar19);
      pcStack_100 = (code *)0x69dbcb;
      tcg_gen_op3_aarch64(pTVar19,INDEX_op_and_i64,TVar28,(TCGArg)(pTVar13 + (long)pTVar19),
                          (TCGArg)pTVar56);
      pcStack_100 = (code *)0x69dbe1;
      tcg_gen_op3_aarch64(pTVar19,INDEX_op_and_i64,(TCGArg)pTVar25,(TCGArg)pTVar25,(TCGArg)pTVar56);
      pcStack_100 = (code *)0x69dbf4;
      tcg_gen_shli_i64_aarch64(pTVar19,(TCGv_i64)uVar53,(TCGv_i64)uVar53,8);
      s = (DisasContext_conflict1 *)local_e8;
      pcStack_100 = (code *)0x69dc0f;
      tcg_gen_op3_aarch64(pTVar19,INDEX_op_or_i64,TVar28,TVar28,(TCGArg)pTVar25);
      pcStack_100 = (code *)0x69dc1a;
      tcg_temp_free_internal_aarch64(pTVar19,pTVar56);
      goto LAB_0069c378;
    case 4:
    case 5:
      pcStack_100 = (code *)0x69da8d;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      if ((int)uVar11 < 0) {
        pcStack_100 = (code *)0x69e3c9;
        local_e0 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false)
        ;
        pTVar36 = (TCGv_i64)((long)local_e0 - (long)pTVar19);
        pcStack_100 = (code *)0x69e3e1;
        pTVar14 = read_cpu_reg_aarch64(s,uVar42,uVar50);
        pcStack_100 = (code *)0x69e3f2;
        tcg_gen_ext32u_i64_aarch64(pTVar19,pTVar36,pTVar14);
        pcStack_100 = (code *)0x69e400;
        tcg_gen_bswap32_i64_aarch64(pTVar19,pTVar13,pTVar36);
        pcStack_100 = (code *)0x69e413;
        tcg_gen_shri_i64_aarch64(pTVar19,pTVar36,pTVar14,0x20);
        pcStack_100 = (code *)0x69e421;
        tcg_gen_bswap32_i64_aarch64(pTVar19,pTVar36,pTVar36);
        pcStack_100 = (code *)0x69e43e;
        tcg_gen_deposit_i64_aarch64(pTVar19,pTVar13,pTVar13,pTVar36,0x20,0x20);
        pcStack_100 = (code *)0x69e44b;
        tcg_temp_free_internal_aarch64(pTVar19,(TCGTemp *)local_e0);
        puVar59 = auStack_f8;
      }
      else {
        pcStack_100 = (code *)0x69daa6;
        pTVar14 = cpu_reg_aarch64(s,uVar42);
        pcStack_100 = (code *)0x69dab4;
        tcg_gen_ext32u_i64_aarch64(pTVar19,pTVar13,pTVar14);
        pcStack_100 = (code *)0x69dac2;
        tcg_gen_bswap32_i64_aarch64(pTVar19,pTVar13,pTVar13);
        puVar59 = auStack_f8;
      }
      goto LAB_0069a72e;
    default:
      goto switchD_00698b3f_caseD_0;
    case 7:
      pcStack_100 = (code *)0x69e3a2;
      handle_rev64(s,uVar50,uVar42,uVar54);
      puVar59 = auStack_f8;
      goto LAB_0069a72e;
    case 8:
    case 9:
      pcStack_100 = (code *)0x69dad4;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      pcStack_100 = (code *)0x69dae1;
      pTVar14 = cpu_reg_aarch64(s,uVar42);
      if ((int)uVar11 < 0) {
        pcStack_100 = (code *)0x69e48d;
        tcg_gen_clzi_i64_aarch64(pTVar19,pTVar13,pTVar14,0x40);
        puVar59 = auStack_f8;
        s = (DisasContext_conflict1 *)local_e8;
        goto LAB_0069a72e;
      }
      pcStack_100 = (code *)0x69daf9;
      pTVar56 = tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I32,false);
      pTVar12 = (TCGv_i32)((long)pTVar56 - (long)pTVar19);
      pcStack_100 = (code *)0x69db10;
      tcg_gen_extrl_i64_i32_aarch64(pTVar19,pTVar12,pTVar14);
      pcStack_100 = (code *)0x69db23;
      tcg_gen_clzi_i32_aarch64(pTVar19,pTVar12,pTVar12,0x20);
      break;
    case 10:
    case 0xb:
      pcStack_100 = (code *)0x69da31;
      pTVar13 = cpu_reg_aarch64(s,uVar54);
      pcStack_100 = (code *)0x69da3e;
      pTVar14 = cpu_reg_aarch64(s,uVar42);
      if ((int)uVar11 < 0) {
        pcStack_100 = (code *)0x69e3b5;
        tcg_gen_clrsb_i64_aarch64(pTVar19,pTVar13,pTVar14);
        puVar59 = auStack_f8;
        s = (DisasContext_conflict1 *)local_e8;
        goto LAB_0069a72e;
      }
      pcStack_100 = (code *)0x69da56;
      pTVar56 = tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I32,false);
      pTVar12 = (TCGv_i32)((long)pTVar56 - (long)pTVar19);
      pcStack_100 = (code *)0x69da6d;
      tcg_gen_extrl_i64_i32_aarch64(pTVar19,pTVar12,pTVar14);
      pcStack_100 = (code *)0x69da7b;
      tcg_gen_clrsb_i32_aarch64(pTVar19,pTVar12,pTVar12);
    }
    pcStack_100 = (code *)0x69db31;
    tcg_gen_extu_i32_i64_aarch64(pTVar19,pTVar13,pTVar12);
LAB_0069b809:
    pcStack_100 = (code *)0x69b80e;
    tcg_temp_free_internal_aarch64(pTVar19,pTVar56);
    puVar59 = auStack_f8;
    s = (DisasContext_conflict1 *)local_e8;
    goto LAB_0069a72e;
  }
switchD_00698b3f_caseD_0:
  o_12 = (uintptr_t)pTVar23;
  puVar38 = puVar37;
LAB_0069a729:
  *(undefined8 *)(puVar38 + -8) = 0x69a72e;
  unallocated_encoding_aarch64(s);
  puVar59 = puVar38;
LAB_0069a72e:
  if (0 < *(int *)&((TCGContext_conflict1 *)s)->data_gen_ptr) {
    pTVar23 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
    lVar60 = 0;
    do {
      uVar4 = ((TCGContext_conflict1 *)s)->free_temps[0].l[lVar60 + -7];
      *(undefined8 *)(puVar59 + -8) = 0x69a75c;
      tcg_temp_free_internal_aarch64(pTVar23,(TCGTemp *)((long)&pTVar23->pool_cur + uVar4));
      lVar60 = lVar60 + 1;
    } while (lVar60 < *(int *)&((TCGContext_conflict1 *)s)->data_gen_ptr);
  }
  *(undefined4 *)&((TCGContext_conflict1 *)s)->data_gen_ptr = 0;
  if (('\0' < (char)((TCGContext_conflict1 *)s)->code_gen_buffer_size) &&
     (*(int *)&((TCGContext_conflict1 *)s)->pool_current != 2)) {
    *(undefined8 *)(puVar59 + -8) = 0x69a78f;
    reset_btype(s);
  }
  return;
LAB_0069884e:
  plVar30 = plVar30->next;
  if (plVar30 == (list_item *)0x0) goto LAB_006989da;
  goto LAB_0069881b;
switchD_00699076_caseD_1:
  puVar37 = auStack_f8;
  s = (DisasContext_conflict1 *)local_e8;
  pTVar23 = (TCGContext_conflict1 *)o_12;
  goto switchD_00698b3f_caseD_0;
LAB_00698e7c:
  pTVar23 = *(TCGContext_conflict1 **)(uVar4 + 0x2e8);
  pcStack_100 = (code *)0x698e97;
  tcg_gen_op2_aarch64(pTVar23,INDEX_op_movi_i64,(TCGArg)(pTVar23->cpu_pc_arm64 + (long)pTVar23),
                      uVar46);
LAB_00698e9c:
  pTVar15 = local_e0;
  uVar50 = (uint)local_e0;
  uVar11 = (uint)((ulong)local_e0 >> 0x18) & 0x3f;
  local_78 = (uint)((ulong)local_e0 >> 0x10);
  pTVar23 = (TCGContext_conflict1 *)o_12;
  if (0x17 < uVar11) {
    if (0x3d < uVar11) {
LAB_0069993d:
      if (uVar11 != 0x18) {
        puVar37 = auStack_f8;
        if ((uVar11 == 0x19) && (puVar37 = auStack_f8, ((ulong)local_e0 & 0x200c00) == 0)) {
          pcStack_100 = (code *)0x699963;
          disas_ldst_ldapr_stlr(s,uVar50);
          puVar59 = auStack_f8;
          goto LAB_0069a72e;
        }
        goto switchD_00698b3f_caseD_0;
      }
LAB_00699968:
      pTVar19 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      uVar11 = (uint)((ulong)local_e0 >> 0x1e);
      uVar41 = uVar11 & 3;
      if ((uVar50 >> 0x1a & 1) == 0) {
        puVar59 = auStack_f8;
        if (uVar41 == 3) goto LAB_0069a72e;
        uVar41 = uVar11 & 1;
        _Var33 = (_Bool)((byte)((ulong)local_e0 >> 0x1f) & 1);
      }
      else {
        puVar37 = auStack_f8;
        if (uVar41 == 3) goto switchD_00698b3f_caseD_0;
        if ((char)((TCGContext_conflict1 *)s)->initial_buffer_size == '\x01') goto LAB_0069e94a;
        *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
        uVar54 = (uint)((TCGContext_conflict1 *)s)->frame_start;
        ppcVar39 = (code **)auStack_f8;
        if (uVar54 != 0) goto LAB_0069cdb5;
        _Var33 = false;
      }
      uVar11 = uVar50 & 0x1f;
      pcStack_100 = (code *)0x699de5;
      o_12 = (uintptr_t)cpu_reg_aarch64(s,uVar11);
      pcStack_100 = (code *)0x699dfa;
      pTVar13 = tcg_const_i64_aarch64
                          (pTVar19,(long)(int)((int)(uVar50 << 8) >> 0xb & 0xfffffffc) +
                                   *(long *)&((TCGContext_conflict1 *)s)->nb_temps);
      if (((uint)local_e0 >> 0x1a & 1) == 0) {
        do_gpr_ld_memidx(s,(TCGv_i64)o_12,pTVar13,uVar41 + 2,_Var33,false,
                         (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf,true,uVar11,
                         0x3fffffff < (uint)local_e0,false);
      }
      else {
        pcStack_100 = (code *)0x69a7d1;
        do_fp_ld(s,uVar11,pTVar13,uVar41 + 2);
      }
      pTVar25 = (TCGContext_conflict1 *)(pTVar13 + (long)pTVar19);
      goto LAB_0069c378;
    }
    if ((0x330000000000U >> uVar11 & 1) != 0) {
      uVar11 = (uint)((ulong)local_e0 >> 0x1e) & 3;
      puVar37 = auStack_f8;
      if (uVar11 == 3) goto switchD_00698b3f_caseD_0;
      pTVar15 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      if ((uVar50 >> 0x1a & 1) == 0) {
        puVar37 = auStack_f8;
        if ((uVar50 & 0x40400000) == 0x40000000) goto switchD_00698b3f_caseD_0;
        uVar11 = (uint)((ulong)local_e0 >> 0x1f) & 1;
        _Var33 = (_Bool)((byte)((ulong)local_e0 >> 0x1e) & 1);
      }
      else {
        _Var33 = false;
      }
      uVar54 = (uint)((ulong)local_e0 >> 0x17) & 3;
      uVar27 = (undefined7)
               ((ulong)((long)&switchD_00699d7f::switchdataD_00d7840c +
                       (long)(int)(&switchD_00699d7f::switchdataD_00d7840c)[uVar54]) >> 8);
      switch(uVar54) {
      case 0:
        puVar37 = auStack_f8;
        if (_Var33 != false) goto switchD_00698b3f_caseD_0;
      case 2:
        uVar43 = 0;
LAB_0069a421:
        local_80 = '\0';
        break;
      case 1:
        uVar43 = (undefined4)CONCAT71(uVar27,1);
        local_80 = '\x01';
        break;
      case 3:
        uVar43 = (undefined4)CONCAT71(uVar27,1);
        goto LAB_0069a421;
      }
      if ((uVar50 >> 0x1a & 1) == 0) {
LAB_0069a44e:
        local_d0 = (TCGContext_conflict1 *)CONCAT44(local_d0._4_4_,uVar43);
        uVar35 = (ulong)local_e0 >> 10;
        uVar11 = uVar11 + 2;
        pTVar23 = (TCGContext_conflict1 *)(ulong)uVar11;
        local_c0 = (TCGv_i64)((((long)local_e0 << 0x2a) >> 0x39) << (sbyte)uVar11);
        local_90 = (ulong)local_e0 >> 5 & 0x1f;
        pcStack_100 = (code *)0x69a491;
        local_c8 = pTVar23;
        o_12 = (uintptr_t)read_cpu_reg_sp_aarch64(s,(uint)((ulong)local_e0 >> 5) & 0x1f,1);
        if (local_80 == '\0') {
          pcStack_100 = (code *)0x69a4b5;
          tcg_gen_addi_i64_aarch64(pTVar15,(TCGv_i64)o_12,(TCGv_i64)o_12,(int64_t)local_c0);
        }
        uVar50 = (uint)local_e0;
        uVar41 = uVar50 & 0x1f;
        uVar42 = (uint)uVar35 & 0x1f;
        pcStack_100 = (code *)0x69a4d5;
        local_d8 = pTVar15;
        pTVar15 = (TCGContext_conflict1 *)clean_data_tbi(s,(TCGv_i64)o_12);
        if ((uVar50 >> 0x1a & 1) == 0) {
          pcStack_100 = (code *)0x69a4f7;
          local_e8 = (TCGContext_conflict1 *)s;
          pTVar13 = cpu_reg_aarch64(s,uVar41);
          pcStack_100 = (code *)0x69a506;
          pTVar19 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar42);
          pTVar23 = local_d8;
          if ((uVar50 >> 0x16 & 1) == 0) {
            do_gpr_st_memidx(s,pTVar13,(TCGv_i64)pTVar15,uVar11,
                             (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf,false,0,
                             false,false);
            pcStack_100 = (code *)0x69a55e;
            tcg_gen_addi_i64_aarch64
                      (local_d8,(TCGv_i64)pTVar15,(TCGv_i64)pTVar15,1L << ((byte)local_c8 & 0x3f));
            do_gpr_st_memidx(s,(TCGv_i64)pTVar19,(TCGv_i64)pTVar15,uVar11,
                             (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf,false,0,
                             false,false);
          }
          else {
            pcStack_100 = (code *)0x69b05e;
            local_e0 = pTVar19;
            pTVar56 = tcg_temp_new_internal_aarch64(local_d8,TCG_TYPE_I64,false);
            pTVar14 = (TCGv_i64)((long)pTVar56 - (long)pTVar23);
            do_gpr_ld_memidx(s,pTVar14,(TCGv_i64)pTVar15,uVar11,_Var33,false,
                             (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf,false,0,
                             false,false);
            pcStack_100 = (code *)0x69b0c0;
            tcg_gen_addi_i64_aarch64
                      (pTVar23,(TCGv_i64)pTVar15,(TCGv_i64)pTVar15,1L << ((byte)local_c8 & 0x3f));
            do_gpr_ld_memidx(s,(TCGv_i64)local_e0,(TCGv_i64)pTVar15,uVar11,_Var33,false,
                             (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf,false,0,
                             false,false);
            if (pTVar13 != pTVar14) {
              pcStack_100 = (code *)0x69b119;
              tcg_gen_op2_aarch64(pTVar23,INDEX_op_mov_i64,(TCGArg)(pTVar13 + (long)pTVar23),
                                  (TCGArg)pTVar56);
            }
            pcStack_100 = (code *)0x69b127;
            tcg_temp_free_internal_aarch64(pTVar23,(TCGTemp *)(pTVar14 + (long)pTVar23));
          }
        }
        else {
          pTVar19 = (TCGContext_conflict1 *)(1L << ((byte)local_c8 & 0x3f));
          local_e8 = (TCGContext_conflict1 *)s;
          if ((uVar50 >> 0x16 & 1) == 0) {
code_r0x0069a5a2:
            pTVar57 = local_e8;
            pcStack_100 = (code *)0x69a5b7;
            do_fp_st((DisasContext_conflict1 *)local_e8,uVar41,(TCGv_i64)pTVar15,(int)pTVar23);
            pcStack_100 = (code *)0x69a5ca;
            tcg_gen_addi_i64_aarch64(local_d8,(TCGv_i64)pTVar15,(TCGv_i64)pTVar15,(int64_t)pTVar19);
            pcStack_100 = (code *)0x69a5da;
            do_fp_st((DisasContext_conflict1 *)pTVar57,uVar42,(TCGv_i64)pTVar15,(int)pTVar23);
          }
          else {
            pcStack_100 = (code *)0x69b13e;
            do_fp_ld(s,uVar41,(TCGv_i64)pTVar15,uVar11);
            pcStack_100 = (code *)0x69b151;
            tcg_gen_addi_i64_aarch64(local_d8,(TCGv_i64)pTVar15,(TCGv_i64)pTVar15,(int64_t)pTVar19);
            pcStack_100 = (code *)0x69b161;
            do_fp_ld(s,uVar42,(TCGv_i64)pTVar15,uVar11);
          }
        }
        s = (DisasContext_conflict1 *)local_e8;
        puVar59 = auStack_f8;
        if ((char)local_d0 == '\0') goto LAB_0069a72e;
        if (local_80 != '\0') {
          pcStack_100 = (code *)0x69b190;
          tcg_gen_addi_i64_aarch64(local_d8,(TCGv_i64)o_12,(TCGv_i64)o_12,(int64_t)local_c0);
        }
        uVar53 = *(uintptr_t *)
                  (*(long *)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8) + 0xaeb0 +
                  (local_90 & 0xffffffff) * 8);
        puVar59 = auStack_f8;
        if (uVar53 == o_12) goto LAB_0069a72e;
        pTVar13 = (TCGv_i64)((long)&local_d8->pool_cur + uVar53);
        pTVar23 = (TCGContext_conflict1 *)o_12;
LAB_0069b1c2:
        puVar59 = (undefined1 *)((long)&local_d8->pool_cur + (long)&pTVar23->pool_cur);
        TVar44 = INDEX_op_mov_i64;
        pTVar15 = local_d8;
        goto LAB_00698e72;
      }
      if ((char)((TCGContext_conflict1 *)s)->initial_buffer_size == '\x01') goto LAB_0069e94a;
      *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
      uVar54 = (uint)((TCGContext_conflict1 *)s)->frame_start;
      ppcVar39 = (code **)auStack_f8;
      if (uVar54 == 0) goto LAB_0069a44e;
      goto LAB_0069cdb5;
    }
    if ((0x3300000000000000U >> uVar11 & 1) == 0) {
      if (uVar11 != 0x1c) goto LAB_0069993d;
      goto LAB_00699968;
    }
    uVar11 = uVar50 & 0x1f;
    uVar53 = (uintptr_t)uVar11;
    uVar35 = (ulong)local_e0 >> 0x16;
    uVar41 = (uint)uVar35;
    uVar10 = uVar41 & 3;
    uVar42 = (uint)((ulong)local_e0 >> 0x1e) & 3;
    if (((ushort)((ulong)local_e0 >> 0x18) & 3) == 1) {
      pTVar23 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      if ((uVar50 >> 0x1a & 1) != 0) {
        uVar42 = uVar42 + (uVar41 & 2) * 2;
        puVar38 = auStack_f8;
        o_12 = uVar53;
        if (4 < uVar42) goto LAB_0069a729;
        if ((char)((TCGContext_conflict1 *)s)->initial_buffer_size == '\x01') goto LAB_0069e94a;
        *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
        uVar54 = (uint)((TCGContext_conflict1 *)s)->frame_start;
        ppcVar39 = (code **)auStack_f8;
        if (uVar54 == 0) {
          uVar10 = uVar41 & 1;
          local_d8 = (TCGContext_conflict1 *)((ulong)local_d8._4_4_ << 0x20);
          local_d0 = (TCGContext_conflict1 *)((ulong)local_d0._4_4_ << 0x20);
          goto LAB_0069bd60;
        }
        goto LAB_0069cdb5;
      }
      puVar59 = auStack_f8;
      o_12 = uVar53;
      if (uVar10 == 2 && uVar42 == 3) goto LAB_0069a72e;
      if (-1 < (int)uVar50 || uVar10 != 3) {
        local_d8 = (TCGContext_conflict1 *)
                   (CONCAT44(local_d8._4_4_,(int)((ulong)local_e0 >> 0x17)) & 0xffffffff00000001);
        if (uVar42 == 3) {
          local_d0 = (TCGContext_conflict1 *)((ulong)local_d0._4_4_ << 0x20);
          uVar42 = 3;
        }
        else {
          local_d0 = (TCGContext_conflict1 *)(CONCAT44(local_d0._4_4_,uVar41) & 0xffffffff00000001);
        }
LAB_0069bd60:
        uVar35 = (ulong)local_e0 >> 10;
        pcStack_100 = (code *)0x69bd85;
        o_12 = uVar53;
        pTVar13 = read_cpu_reg_sp_aarch64(s,(uint)((ulong)local_e0 >> 5) & 0x1f,1);
        pcStack_100 = (code *)0x69bd9e;
        tcg_gen_addi_i64_aarch64
                  (pTVar23,pTVar13,pTVar13,(ulong)(((uint)uVar35 & 0xfff) << (sbyte)uVar42));
        pcStack_100 = (code *)0x69bda9;
        pTVar13 = clean_data_tbi(s,pTVar13);
        uVar53 = o_12;
        uVar50 = (uint)local_e0;
        uVar11 = (uint)o_12;
        if ((uVar50 >> 0x1a & 1) == 0) {
          pcStack_100 = (code *)0x69bdea;
          pTVar14 = cpu_reg_aarch64(s,uVar11);
          cVar8 = (char)local_d8;
          bVar62 = uVar42 == 3;
          if (cVar8 != '\0') {
            bVar62 = (uVar50 >> 0x16 & 1) == 0;
          }
          uVar11 = (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf;
          if (uVar10 == 0) {
LAB_0069d88c:
            do_gpr_st_memidx(s,pTVar14,pTVar13,uVar42,uVar11,true,(uint)uVar53,bVar62,false);
            puVar59 = auStack_f8;
            goto LAB_0069a72e;
          }
          extend = (undefined1)local_d0;
LAB_0069be2b:
          do_gpr_ld_memidx(s,pTVar14,pTVar13,uVar42,(_Bool)cVar8,(_Bool)extend,uVar11,true,
                           (uint)uVar53,bVar62,false);
          puVar59 = auStack_f8;
          goto LAB_0069a72e;
        }
joined_r0x0069bdc1:
        if (uVar10 == 0) {
          pcStack_100 = (code *)0x69d83a;
          do_fp_st(s,uVar11,pTVar13,uVar42);
          puVar59 = auStack_f8;
        }
        else {
          pcStack_100 = (code *)0x69bdd2;
          do_fp_ld(s,uVar11,pTVar13,uVar42);
          puVar59 = auStack_f8;
        }
        goto LAB_0069a72e;
      }
      goto LAB_0069a729;
    }
    puVar37 = auStack_f8;
    if (((ulong)local_e0 & 0x3000000) != 0) goto switchD_00698b3f_caseD_0;
    uVar46 = (ulong)local_e0 >> 10;
    if ((uVar50 >> 0x15 & 1) == 0) {
      uVar58 = (uint)uVar46 & 3;
      bVar62 = (uVar50 >> 0x1a & 1) == 0;
      pTVar15 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      if (bVar62) {
        if (uVar10 == 2 && uVar42 == 3) {
          puVar59 = auStack_f8;
          puVar37 = auStack_f8;
          if ((uVar46 & 3) == 0) goto LAB_0069a72e;
        }
        else {
          puVar37 = auStack_f8;
          if (-1 < (int)uVar50 || uVar10 != 3) {
            bVar40 = (uVar35 & 3) == 0;
            local_88 = (_Bool)((byte)((ulong)local_e0 >> 0x17) & 1);
            if (uVar42 == 3) {
              _Var33 = false;
              uVar42 = 3;
            }
            else {
              _Var33 = (_Bool)((byte)uVar35 & 1);
            }
            goto LAB_0069c7ca;
          }
        }
        goto switchD_00698b3f_caseD_0;
      }
      uVar42 = uVar42 + (uVar41 & 2) * 2;
      puVar37 = auStack_f8;
      if (uVar58 == 2 || 4 < uVar42) goto switchD_00698b3f_caseD_0;
      if ((char)((TCGContext_conflict1 *)s)->initial_buffer_size == '\x01') goto LAB_0069e94a;
      *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
      uVar54 = (uint)((TCGContext_conflict1 *)s)->frame_start;
      ppcVar39 = (code **)auStack_f8;
      if (uVar54 != 0) goto LAB_0069cdb5;
      bVar40 = (byte)uVar10 ^ 1;
      _Var33 = false;
      local_88 = false;
LAB_0069c7ca:
      uVar54 = (uint)((ulong)local_e0 >> 5);
      uVar41 = uVar54 & 0x1f;
      local_c8 = (TCGContext_conflict1 *)CONCAT44(local_c8._4_4_,(int)(uVar50 << 0xb) >> 0x17);
      local_c0 = (TCGv_i64)(CONCAT44(local_c0._4_4_,uVar54) & 0xffffffff0000001f);
      local_d8 = pTVar15;
      switch(uVar58) {
      default:
        o_12 = (ulong)o_12._4_4_ << 0x20;
        break;
      case 1:
        pcStack_100 = (code *)0x69c839;
        local_e8 = (TCGContext_conflict1 *)s;
        pTVar23 = (TCGContext_conflict1 *)read_cpu_reg_sp_aarch64(s,uVar41,1);
        bVar6 = true;
        uVar35 = CONCAT71((int7)((ulong)s >> 8),1);
        goto LAB_0069c882;
      case 3:
        o_12 = CONCAT44(o_12._4_4_,
                        (int)CONCAT71((int7)((ulong)((long)&switchD_0069c804::switchdataD_00d783fc +
                                                    (long)(int)(&switchD_0069c804::
                                                                 switchdataD_00d783fc)[uVar58]) >> 8
                                            ),1));
      }
      pcStack_100 = (code *)0x69c85a;
      local_e8 = (TCGContext_conflict1 *)s;
      pTVar23 = (TCGContext_conflict1 *)read_cpu_reg_sp_aarch64(s,uVar41,1);
      pcStack_100 = (code *)0x69c872;
      tcg_gen_addi_i64_aarch64
                (local_d8,(TCGv_i64)pTVar23,(TCGv_i64)pTVar23,(long)(int)(MemOp)local_c8);
      bVar6 = false;
      uVar35 = o_12 & 0xffffffff;
LAB_0069c882:
      pcStack_100 = (code *)0x69c891;
      local_d0 = pTVar23;
      pTVar13 = clean_data_tbi((DisasContext_conflict1 *)local_e8,(TCGv_i64)pTVar23);
      pTVar23 = local_e8;
      if (((uint)local_e0 >> 0x1a & 1) == 0) {
        o_12 = CONCAT44(o_12._4_4_,(int)uVar35);
        pcStack_100 = (code *)0x69c8d7;
        pTVar14 = cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,uVar11);
        s = (DisasContext_conflict1 *)local_e8;
        uVar50 = (uint)pTVar23->current_frame_offset;
        if ((uVar58 == 2) && (*(char *)((long)&local_e8->initial_buffer_size + 4) == '\x01')) {
          uVar50 = uVar50 - 0x12;
          if ((7 < uVar50) || ((0xdbU >> (uVar50 & 0x1f) & 1) == 0)) {
            pcStack_100 = reset_btype;
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                       ,0x84,(char *)0x0);
          }
          uVar50 = *(uint *)(&DAT_00d79ad8 + (ulong)uVar50 * 4);
        }
        uVar35 = o_12 & 0xffffffff;
        iss_sf = uVar42 == 3;
        if (local_88 != false) {
          iss_sf = ((uint)local_e0 >> 0x16 & 1) == 0;
        }
        if ((bVar40 & 1) == 0) {
          do_gpr_ld_memidx((DisasContext_conflict1 *)local_e8,pTVar14,pTVar13,uVar42,local_88,_Var33
                           ,uVar50 & 0xf,bVar62,uVar11,iss_sf,false);
        }
        else {
          do_gpr_st_memidx((DisasContext_conflict1 *)local_e8,pTVar14,pTVar13,uVar42,uVar50 & 0xf,
                           bVar62,uVar11,iss_sf,false);
        }
      }
      else {
        s = (DisasContext_conflict1 *)pTVar23;
        if ((bVar40 & 1) == 0) {
          pcStack_100 = (code *)0x69c92c;
          do_fp_ld((DisasContext_conflict1 *)local_e8,uVar11,pTVar13,uVar42);
        }
        else {
          pcStack_100 = (code *)0x69c8b5;
          do_fp_st((DisasContext_conflict1 *)local_e8,uVar11,pTVar13,uVar42);
        }
      }
      puVar59 = auStack_f8;
      if ((char)uVar35 == '\0') goto LAB_0069a72e;
      pTVar23 = *(TCGContext_conflict1 **)
                 (*(long *)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8) + 0xaeb0 +
                 ((ulong)local_c0 & 0xffffffff) * 8);
      if (bVar6) {
        pcStack_100 = (code *)0x69ca12;
        tcg_gen_addi_i64_aarch64
                  (local_d8,(TCGv_i64)local_d0,(TCGv_i64)local_d0,(long)(int)(MemOp)local_c8);
      }
      puVar59 = auStack_f8;
      if (pTVar23 == local_d0) goto LAB_0069a72e;
      pTVar13 = (TCGv_i64)((long)&local_d8->pool_cur + (long)&pTVar23->pool_cur);
      puVar59 = (undefined1 *)((long)&local_d8->pool_cur + (long)&local_d0->pool_cur);
      TVar44 = INDEX_op_mov_i64;
      pTVar15 = local_d8;
      goto LAB_00698e72;
    }
    pTVar19 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
    if (((ushort)uVar46 & 3) == 2) {
      puVar37 = auStack_f8;
      if ((uVar50 >> 0xe & 1) != 0) {
        if ((uVar50 >> 0x1a & 1) == 0) {
          puVar59 = auStack_f8;
          if (uVar10 == 2 && uVar42 == 3) goto LAB_0069a72e;
          puVar37 = auStack_f8;
          if (-1 < (int)uVar50 || uVar10 != 3) {
            local_d0 = (TCGContext_conflict1 *)
                       (CONCAT44(local_d0._4_4_,(int)((ulong)local_e0 >> 0x17)) & 0xffffffff00000001
                       );
            if (uVar42 == 3) {
              local_c8 = (TCGContext_conflict1 *)((ulong)local_c8._4_4_ << 0x20);
              uVar42 = 3;
            }
            else {
              local_c8 = (TCGContext_conflict1 *)
                         (CONCAT44(local_c8._4_4_,uVar41) & 0xffffffff00000001);
            }
            goto LAB_0069d77f;
          }
        }
        else {
          uVar42 = uVar42 + (uVar41 & 2) * 2;
          puVar37 = auStack_f8;
          if (uVar42 < 5) {
            if ((char)((TCGContext_conflict1 *)s)->initial_buffer_size == '\x01') goto LAB_0069e94a;
            *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
            uVar54 = (uint)((TCGContext_conflict1 *)s)->frame_start;
            ppcVar39 = (code **)auStack_f8;
            if (uVar54 != 0) goto LAB_0069cdb5;
            uVar10 = uVar41 & 1;
            local_c8 = (TCGContext_conflict1 *)((ulong)local_c8._4_4_ << 0x20);
            local_d0 = (TCGContext_conflict1 *)((ulong)local_d0._4_4_ << 0x20);
LAB_0069d77f:
            local_d8 = (TCGContext_conflict1 *)
                       (CONCAT44(local_d8._4_4_,(int)((ulong)local_e0 >> 0xd)) & 0xffffffff00000007)
            ;
            pcStack_100 = (code *)0x69d7ab;
            o_12 = (uintptr_t)read_cpu_reg_sp_aarch64(s,(uint)((ulong)local_e0 >> 5) & 0x1f,1);
            pcStack_100 = (code *)0x69d7bf;
            pTVar13 = read_cpu_reg_aarch64(s,local_78 & 0x1f,1);
            pcStack_100 = (code *)0x69d7e7;
            ext_and_shift_reg(pTVar19,pTVar13,pTVar13,(int)local_d8,
                              ((int)local_e0 << 0x13) >> 0x1f & uVar42);
            TVar28 = (long)&pTVar19->pool_cur + o_12;
            pcStack_100 = (code *)0x69d806;
            tcg_gen_op3_aarch64(pTVar19,INDEX_op_add_i64,TVar28,TVar28,
                                (TCGArg)(pTVar13 + (long)pTVar19));
            pcStack_100 = (code *)0x69d813;
            pTVar13 = clean_data_tbi(s,(TCGv_i64)o_12);
            uVar50 = (uint)local_e0;
            if ((uVar50 >> 0x1a & 1) == 0) {
              pcStack_100 = (code *)0x69d84a;
              pTVar14 = cpu_reg_aarch64(s,uVar11);
              cVar8 = (char)local_d0;
              bVar62 = uVar42 == 3;
              if (cVar8 != '\0') {
                bVar62 = (uVar50 >> 0x16 & 1) == 0;
              }
              uVar11 = (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf;
              if (uVar10 == 0) goto LAB_0069d88c;
              extend = (undefined1)local_c8;
              goto LAB_0069be2b;
            }
            goto joined_r0x0069bdc1;
          }
        }
      }
      goto switchD_00698b3f_caseD_0;
    }
    if ((uVar46 & 3) != 0) {
      puVar37 = auStack_f8;
      if ((uVar42 != 3 || ((ulong)local_e0 & 0x4000000) != 0) ||
         (puVar37 = auStack_f8,
         (*(uint *)(*(long *)&((TCGContext_conflict1 *)s)->nb_labels + 0x50) & 0xff000ff0) == 0))
      goto switchD_00698b3f_caseD_0;
      uVar11 = (uint)((ulong)local_e0 >> 5) & 0x1f;
      pcStack_100 = (code *)0x69b283;
      o_12 = uVar53;
      local_d8 = pTVar19;
      local_d0 = (TCGContext_conflict1 *)read_cpu_reg_sp_aarch64(s,uVar11,1);
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
        args[0] = (TCGTemp *)(local_d8->cpu_env + (long)local_d8);
        if ((uVar50 >> 0x17 & 1) == 0) {
          pcVar45 = helper_autda_aarch64;
        }
        else {
          pcVar45 = helper_autdb_aarch64;
        }
        pcStack_100 = (code *)0x69d40d;
        tcg_gen_callN_aarch64
                  (local_d8,pcVar45,
                   (TCGTemp *)((long)&local_d0->pool_cur + (long)&local_d8->pool_cur),3,args);
        pTVar15 = local_e0;
      }
      pTVar23 = local_d0;
      pcStack_100 = (code *)0x69d451;
      tcg_gen_addi_i64_aarch64
                (local_d8,(TCGv_i64)local_d0,(TCGv_i64)local_d0,
                 (long)((ulong)((uint)((ulong)pTVar15 >> 9) & 0xff8 | (uint)uVar46 & 0x1000) << 0x33
                       ) >> 0x33);
      pcStack_100 = (code *)0x69d45f;
      pTVar13 = clean_data_tbi(s,(TCGv_i64)pTVar23);
      pcStack_100 = (code *)0x69d472;
      uVar50 = (uint)o_12;
      pTVar14 = cpu_reg_aarch64(s,uVar50);
      do_gpr_ld_memidx(s,pTVar14,pTVar13,3,false,false,
                       (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf,
                       ((uint)pTVar15 >> 0xb & 1) == 0,uVar50,true,false);
      puVar59 = auStack_f8;
      if ((((uint)pTVar15 >> 0xb & 1) == 0) ||
         (pTVar23 = *(TCGContext_conflict1 **)
                     (*(long *)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8) + 0xaeb0 +
                     (ulong)uVar11 * 8), puVar59 = auStack_f8, pTVar23 == local_d0))
      goto LAB_0069a72e;
      pTVar13 = (TCGv_i64)((long)&local_d8->pool_cur + (long)&pTVar23->pool_cur);
      pTVar23 = local_d0;
      goto LAB_0069b1c2;
    }
    puVar37 = auStack_f8;
    if ((((uVar50 >> 0x1a & 1) != 0) ||
        (puVar37 = auStack_f8,
        (*(byte *)(*(long *)&((TCGContext_conflict1 *)s)->nb_labels + 0x4a) & 0xf0) == 0)) ||
       (uVar54 = (uint)((ulong)local_e0 >> 0xc) & 0xf, puVar37 = auStack_f8, 0xc < uVar54))
    goto switchD_00698b3f_caseD_0;
    puVar37 = auStack_f8;
    switch(uVar54) {
    case 0:
      o_12 = (uintptr_t)tcg_gen_atomic_fetch_add_i64_aarch64;
      break;
    case 1:
      o_12 = (uintptr_t)tcg_gen_atomic_fetch_and_i64_aarch64;
      break;
    case 2:
      o_12 = (uintptr_t)tcg_gen_atomic_fetch_xor_i64_aarch64;
      break;
    case 3:
      o_12 = (uintptr_t)tcg_gen_atomic_fetch_or_i64_aarch64;
      break;
    case 4:
      o_12 = (uintptr_t)tcg_gen_atomic_fetch_smax_i64_aarch64;
      break;
    case 5:
      o_12 = (uintptr_t)tcg_gen_atomic_fetch_smin_i64_aarch64;
      break;
    case 6:
      o_12 = (uintptr_t)tcg_gen_atomic_fetch_umax_i64_aarch64;
      break;
    case 7:
      o_12 = (uintptr_t)tcg_gen_atomic_fetch_umin_i64_aarch64;
      break;
    case 8:
      o_12 = (uintptr_t)tcg_gen_atomic_xchg_i64_aarch64;
      break;
    default:
      goto switchD_00698b3f_caseD_0;
    case 0xc:
      puVar37 = auStack_f8;
      if ((((uVar50 & 0xc00000) == 0x800000) && (puVar37 = auStack_f8, (local_78 & 0x1f) == 0x1f))
         && (puVar37 = auStack_f8,
            (*(ulong *)(*(long *)&((TCGContext_conflict1 *)s)->nb_labels + 0x50) & 0xf00000) != 0))
      break;
      goto switchD_00698b3f_caseD_0;
    }
    uVar50 = uVar50 >> 5 & 0x1f;
    ppTVar29 = pTVar19->cpu_X + uVar50;
    if (uVar50 == 0x1f) {
      ppTVar29 = pTVar19->cpu_X + 0x1f;
    }
    pcStack_100 = (code *)0x69d965;
    local_d8 = pTVar19;
    pTVar23 = (TCGContext_conflict1 *)clean_data_tbi(s,*ppTVar29);
    if (uVar54 == 0xc) {
      pcStack_100 = (code *)0x69d978;
      pTVar13 = cpu_reg_aarch64(s,uVar11);
      do_gpr_ld_memidx(s,pTVar13,(TCGv_i64)pTVar23,uVar42,false,false,
                       (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf,true,uVar11,
                       uVar42 == 3,true);
      pcStack_100 = (code *)0x69afa6;
      tcg_gen_mb_aarch64(local_d8,TCG_BAR_LDAQ|TCG_MO_ALL);
      puVar59 = auStack_f8;
    }
    else {
      pcStack_100 = (code *)0x69d9d5;
      local_e0 = pTVar23;
      pTVar13 = read_cpu_reg_aarch64(s,local_78 & 0x1f,1);
      if (uVar54 == 1) {
        pcStack_100 = (code *)0x69d9ed;
        tcg_gen_not_i64_aarch64(local_d8,pTVar13,pTVar13);
      }
      pcStack_100 = (code *)0x69d9f8;
      pTVar14 = cpu_reg_aarch64(s,uVar11);
      pcStack_100 = (code *)0x69da1f;
      (*(code *)o_12)(local_d8,pTVar14,local_e0,pTVar13,
                      (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf,
                      uVar42 | ((TCGContext_conflict1 *)s)->reserved_regs | 0x70);
      puVar59 = auStack_f8;
    }
    goto LAB_0069a72e;
  }
  if (uVar11 == 8) {
    (*(code *)(&DAT_00d7841c +
              *(int *)(&DAT_00d7841c +
                      (ulong)((uint)((ulong)local_e0 >> 0x14) & 0xe |
                             (uint)((ulong)local_e0 >> 0xf) & 1) * 4)))();
    return;
  }
  if (uVar11 != 0xc) {
    puVar37 = auStack_f8;
    if (((uVar11 != 0xd) || (puVar37 = auStack_f8, (int)uVar50 < 0)) ||
       (puVar37 = auStack_f8,
       ((ulong)local_e0 & 0x1f0000) != 0 && ((ulong)local_e0 >> 0x17 & 1) == 0))
    goto switchD_00698b3f_caseD_0;
    uVar53 = *(uintptr_t *)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
    uVar11 = (uint)((ulong)local_e0 >> 10) & 3;
    pTVar19 = (TCGContext_conflict1 *)(ulong)uVar11;
    uVar35 = (ulong)local_e0 >> 0xc;
    uVar46 = (ulong)local_e0 >> 0x16;
    uVar54 = (uint)((ulong)local_e0 >> 0x1b) & 8;
    local_c0 = (TCGv_i64)(ulong)uVar54;
    uVar54 = uVar54 + ((uint)uVar35 & 1) * 4;
    uVar11 = uVar54 + uVar11;
    uVar41 = (uint)((ulong)local_e0 >> 0xe) & 3;
    switch(uVar41) {
    case 0:
      bVar62 = false;
      pTVar19 = (TCGContext_conflict1 *)(ulong)uVar41;
LAB_0069b52f:
      if ((char)((TCGContext_conflict1 *)s)->initial_buffer_size == '\x01') goto LAB_0069e94a;
      *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
      uVar54 = (uint)((TCGContext_conflict1 *)s)->frame_start;
      ppcVar39 = (code **)auStack_f8;
      if (uVar54 != 0) goto LAB_0069cdb5;
      local_70 = local_78 & 0x1f;
      uVar50 = (uint)((ulong)local_e0 >> 5) & 0x1f;
      uVar54 = (uint)((ulong)local_e0 >> 0x15) & 1;
      uVar41 = (uint)uVar35 & 2;
      puVar22 = (undefined8 *)(uVar53 + 0xaeb0 + (ulong)uVar50 * 8);
      if (uVar50 == 0x1f) {
        puVar22 = (undefined8 *)(uVar53 + 0xafa8);
      }
      pTVar13 = (TCGv_i64)*puVar22;
      pcStack_100 = (code *)0x69b5c4;
      o_12 = uVar53;
      local_e8 = (TCGContext_conflict1 *)s;
      local_d8 = pTVar19;
      pTVar57 = (TCGContext_conflict1 *)clean_data_tbi(s,pTVar13);
      pcStack_100 = (code *)0x69b5d4;
      pTVar14 = tcg_const_i64_aarch64
                          ((TCGContext_conflict1 *)o_12,(ulong)(uint)(1 << (sbyte)pTVar19));
      local_c0 = (TCGv_i64)(ulong)((int)local_c0 + 8);
      local_c8 = (TCGContext_conflict1 *)((long)&pTVar57->pool_cur + o_12);
      pTVar56 = (TCGTemp *)(pTVar14 + o_12);
      iVar55 = uVar54 + uVar41 + 1;
      uVar35 = (ulong)pTVar15 & 0xffffffff;
      pTVar23 = (TCGContext_conflict1 *)o_12;
      local_d0 = pTVar57;
      do {
        uVar50 = (uint)uVar35 & 0x1f;
        if (bVar62) {
          pcStack_100 = (code *)0x69b62e;
          pTVar61 = tcg_temp_new_internal_aarch64(pTVar23,TCG_TYPE_I64,false);
          pTVar15 = local_e8;
          pTVar14 = (TCGv_i64)((long)pTVar61 - (long)pTVar23);
          uVar42 = (uint)local_d8;
          pcStack_100 = (code *)0x69b661;
          tcg_gen_qemu_ld_i64_aarch64
                    ((TCGContext_conflict1 *)o_12,pTVar14,(TCGv_i64)local_d0,
                     (ulong)((uint)local_e8->current_frame_offset & 0xf),
                     local_e8->reserved_regs + uVar42);
          pTVar23 = (TCGContext_conflict1 *)o_12;
          pcStack_100 = (code *)0x69b68d;
          tcg_gen_gvec_dup_i64_aarch64
                    ((TCGContext_conflict1 *)o_12,uVar42,uVar50 * 0x100 + 0xc10,(uint32_t)local_c0,
                     (uint32_t)pTVar15->frame_end,pTVar14);
          pcStack_100 = (code *)0x69b6a0;
          tcg_temp_free_internal_aarch64(pTVar23,pTVar61);
        }
        else if ((uVar46 & 1) == 0) {
          pcStack_100 = (code *)0x69b6c7;
          do_vec_st((DisasContext_conflict1 *)local_e8,uVar50,uVar11,(TCGv_i64)local_d0,
                    (int)local_d8,local_e8->reserved_regs);
        }
        else {
          pcStack_100 = (code *)0x69b6de;
          do_vec_ld((DisasContext_conflict1 *)local_e8,uVar50,uVar11,(TCGv_i64)local_d0,
                    (int)local_d8,local_e8->reserved_regs);
        }
        pcStack_100 = (code *)0x69b6f6;
        tcg_gen_op3_aarch64(pTVar23,INDEX_op_add_i64,(TCGArg)local_c8,(TCGArg)local_c8,
                            (TCGArg)pTVar56);
        uVar35 = (ulong)(uVar50 + 1);
        iVar55 = iVar55 + -1;
      } while (iVar55 != 0);
      pcStack_100 = (code *)0x69b70c;
      tcg_temp_free_internal_aarch64(pTVar23,pTVar56);
      pTVar23 = local_e8;
      puVar59 = auStack_f8;
      s = (DisasContext_conflict1 *)local_e8;
      if (((uint)local_e0 >> 0x17 & 1) == 0) goto LAB_0069a72e;
      if (local_70 != 0x1f) {
        pcStack_100 = (code *)0x69cf72;
        pTVar14 = cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,local_70);
        goto LAB_0069d112;
      }
      uVar11 = uVar41 + uVar54 + 1 << ((byte)local_d8 & 0x1f);
      goto LAB_0069c6f9;
    case 1:
      puVar37 = auStack_f8;
      if ((uVar50 >> 10 & 1) == 0) {
        uVar11 = uVar11 >> 1;
        pTVar19 = (TCGContext_conflict1 *)&DAT_00000001;
LAB_0069b52c:
        bVar62 = false;
        goto LAB_0069b52f;
      }
      break;
    case 2:
      puVar37 = auStack_f8;
      if ((uVar50 >> 0xb & 1) == 0) {
        if ((uVar50 >> 10 & 1) == 0) {
          uVar11 = uVar54 >> 2;
          bVar62 = false;
          pTVar19 = (TCGContext_conflict1 *)&DAT_00000002;
          goto LAB_0069b52f;
        }
        puVar37 = auStack_f8;
        if ((uVar35 & 1) == 0) {
          uVar11 = (uint)((ulong)local_e0 >> 0x1e) & 3;
          pTVar19 = (TCGContext_conflict1 *)0x3;
          goto LAB_0069b52c;
        }
      }
      break;
    case 3:
      bVar62 = true;
      puVar37 = auStack_f8;
      if (((byte)uVar46 & (uVar35 & 1) == 0) != 0) goto LAB_0069b52f;
    }
    goto switchD_00698b3f_caseD_0;
  }
  puVar37 = auStack_f8;
  if (((((ulong)local_e0 & 0x80200000) != 0) ||
      (puVar37 = auStack_f8, ((ulong)local_e0 & 0x1f0000) != 0 && ((ulong)local_e0 >> 0x17 & 1) == 0
      )) || (uVar35 = ((ulong)local_e0 & 0xffff) >> 0xc, puVar37 = auStack_f8, 10 < (ushort)uVar35))
  goto switchD_00698b3f_caseD_0;
  pTVar23 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
  uVar11 = (uint)((ulong)local_e0 >> 10) & 3;
  bVar62 = true;
  iVar52 = 1;
  iVar51 = 4;
  puVar37 = auStack_f8;
  iVar55 = 1;
  switch(uVar35) {
  case 0:
    goto switchD_00699720_caseD_0;
  default:
    goto switchD_00698b3f_caseD_0;
  case 2:
    break;
  case 4:
    iVar51 = 3;
    goto switchD_00699720_caseD_0;
  case 6:
    iVar51 = 3;
    break;
  case 7:
    goto switchD_00699720_caseD_7;
  case 8:
    iVar51 = 2;
switchD_00699720_caseD_0:
    puVar37 = auStack_f8;
    if (uVar11 == 3 && ((ulong)local_e0 & 0x40000000) == 0) goto switchD_00698b3f_caseD_0;
    bVar62 = false;
    iVar55 = iVar51;
switchD_00699720_caseD_7:
    iVar52 = iVar55;
    iVar51 = 1;
    break;
  case 10:
    iVar51 = 2;
  }
  o_12 = (uintptr_t)pTVar23;
  if ((char)((TCGContext_conflict1 *)s)->initial_buffer_size == '\x01') {
LAB_0069e94a:
    pcStack_100 = (code *)0x69e969;
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
  uVar54 = (uint)((TCGContext_conflict1 *)s)->frame_start;
  ppcVar39 = (code **)auStack_f8;
  if (uVar54 == 0) {
    local_c0 = (TCGv_i64)CONCAT44(local_c0._4_4_,iVar52);
    local_78 = local_78 & 0x1f;
    TVar48 = ((TCGContext_conflict1 *)s)->reserved_regs;
    if (((ulong)local_e0 >> 10 & 3) == 0) {
      TVar48 = uVar11;
    }
    local_d0 = (TCGContext_conflict1 *)CONCAT44(local_d0._4_4_,TVar48);
    uVar50 = 3;
    if (TVar48 != 0) {
      uVar50 = uVar11;
    }
    if (!bVar62) {
      uVar50 = uVar11;
    }
    local_d8 = (TCGContext_conflict1 *)CONCAT44(local_d8._4_4_,uVar50);
    uVar11 = ((uint)((ulong)local_e0 >> 0x1b) & 8) + 8 >> (sbyte)uVar50;
    pTVar13 = pTVar23->cpu_X[(uint)((ulong)local_e0 >> 5) & 0x1f];
    pcStack_100 = (code *)0x69c59e;
    local_e8 = (TCGContext_conflict1 *)s;
    pTVar14 = clean_data_tbi(s,pTVar13);
    pcStack_100 = (code *)0x69c5ac;
    pTVar36 = tcg_const_i64_aarch64(pTVar23,(ulong)(uint)(1 << (sbyte)uVar50));
    iVar55 = 0;
    local_c8 = (TCGContext_conflict1 *)CONCAT44(local_c8._4_4_,(int)local_e0);
    do {
      uVar50 = 0;
      do {
        uVar54 = (MemOp)local_c8;
        iVar52 = (int)local_c0;
        do {
          if (((uint)local_e0 >> 0x16 & 1) == 0) {
            pcStack_100 = (code *)0x69c5ff;
            do_vec_st((DisasContext_conflict1 *)local_e8,uVar54 & 0x1f,uVar50,pTVar14,(int)local_d8,
                      (MemOp)local_d0);
          }
          else {
            pcStack_100 = (code *)0x69c61b;
            do_vec_ld((DisasContext_conflict1 *)local_e8,uVar54 & 0x1f,uVar50,pTVar14,(int)local_d8,
                      (MemOp)local_d0);
          }
          pcStack_100 = (code *)0x69c633;
          tcg_gen_op3_aarch64((TCGContext_conflict1 *)o_12,INDEX_op_add_i64,
                              (TCGArg)(pTVar14 + (long)pTVar23),(TCGArg)(pTVar14 + (long)pTVar23),
                              (TCGArg)(pTVar36 + (long)pTVar23));
          pTVar15 = local_e0;
          uVar54 = uVar54 + 1;
          iVar52 = iVar52 + -1;
        } while (iVar52 != 0);
        uVar50 = uVar50 + 1;
      } while (uVar50 != uVar11);
      iVar55 = iVar55 + 1;
      local_c8 = (TCGContext_conflict1 *)CONCAT44(local_c8._4_4_,(MemOp)local_c8 + 1);
    } while (iVar55 != iVar51);
    pcStack_100 = (code *)0x69c672;
    tcg_temp_free_internal_aarch64
              ((TCGContext_conflict1 *)o_12,(TCGTemp *)(pTVar36 + (long)pTVar23));
    s = (DisasContext_conflict1 *)local_e8;
    if (((uint)pTVar15 >> 0x16 & 1) != 0) {
      iVar55 = iVar51 * (int)local_c0;
      uVar35 = (ulong)local_e0 >> 0x1e;
      do {
        pcStack_100 = (code *)0x69c6b4;
        clear_vec_high((DisasContext_conflict1 *)(ulong)(uint)((TCGContext_conflict1 *)s)->frame_end
                       ,SUB81(*(undefined8 *)
                               (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8),0),
                       (uint)uVar35 & 1);
        iVar55 = iVar55 + -1;
      } while (iVar55 != 0);
    }
    pTVar23 = local_e8;
    puVar59 = auStack_f8;
    if (((uint)local_e0 >> 0x17 & 1) != 0) {
      if (local_78 == 0x1f) {
        uVar11 = iVar51 * (int)local_c0 * uVar11 << ((byte)local_d8 & 0x1f);
LAB_0069c6f9:
        pcStack_100 = (code *)0x69c704;
        tcg_gen_addi_i64_aarch64((TCGContext_conflict1 *)o_12,pTVar13,pTVar13,(ulong)uVar11);
        puVar59 = auStack_f8;
        s = (DisasContext_conflict1 *)local_e8;
      }
      else {
        pcStack_100 = (code *)0x69d105;
        pTVar14 = cpu_reg_aarch64((DisasContext_conflict1 *)local_e8,local_78);
LAB_0069d112:
        pcStack_100 = (code *)0x69d126;
        tcg_gen_op3_aarch64((TCGContext_conflict1 *)o_12,INDEX_op_add_i64,(TCGArg)(pTVar13 + o_12),
                            (TCGArg)(pTVar13 + o_12),(TCGArg)(pTVar14 + o_12));
        puVar59 = auStack_f8;
        s = (DisasContext_conflict1 *)pTVar23;
      }
    }
  }
  else {
LAB_0069cdb5:
    pc_00 = *(TCGPool **)&((TCGContext_conflict1 *)s)->nb_temps;
    iVar55 = 1;
    uVar9 = 0x1fe0000a;
    puVar32 = (undefined1 *)ppcVar39;
LAB_0069cdc6:
    *(undefined8 *)(puVar32 + -8) = 0x69cdcb;
    gen_exception_insn(s,(uint64_t)pc_00,iVar55,uVar9,uVar54);
    puVar59 = puVar32;
  }
  goto LAB_0069a72e;
}

Assistant:

static void disas_a64_insn(CPUARMState *env, DisasContext *s)
{
    uint32_t insn;

    s->pc_curr = s->base.pc_next;
    insn = arm_ldl_code(env, s->base.pc_next, s->sctlr_b);

    s->insn = insn;
    s->base.pc_next += 4;

    // Unicorn: trace this instruction on request
    if (HOOK_EXISTS_BOUNDED(env->uc, UC_HOOK_CODE, s->pc_curr)) {

        // Sync PC in advance
        TCGContext *tcg_ctx = env->uc->tcg_ctx;
        gen_a64_set_pc_im(tcg_ctx, s->pc_curr);

        gen_uc_tracecode(tcg_ctx, 4, UC_HOOK_CODE_IDX, env->uc, s->pc_curr);
        // the callback might want to stop emulation immediately
        check_exit_request(tcg_ctx);
    }

    s->fp_access_checked = false;

    if (dc_isar_feature(aa64_bti, s)) {
        if (s->base.num_insns == 1) {
            /*
             * At the first insn of the TB, compute s->guarded_page.
             * We delayed computing this until successfully reading
             * the first insn of the TB, above.  This (mostly) ensures
             * that the softmmu tlb entry has been populated, and the
             * page table GP bit is available.
             *
             * Note that we need to compute this even if btype == 0,
             * because this value is used for BR instructions later
             * where ENV is not available.
             */
            s->guarded_page = is_guarded_page(env, s);

            /* First insn can have btype set to non-zero.  */
            tcg_debug_assert(s->btype >= 0);

            /*
             * Note that the Branch Target Exception has fairly high
             * priority -- below debugging exceptions but above most
             * everything else.  This allows us to handle this now
             * instead of waiting until the insn is otherwise decoded.
             */
            if (s->btype != 0
                && s->guarded_page
                && !btype_destination_ok(insn, s->bt, s->btype)) {
                gen_exception_insn(s, s->pc_curr, EXCP_UDEF,
                                   syn_btitrap(s->btype),
                                   default_exception_el(s));
                return;
            }
        } else {
            /* Not the first insn: btype must be 0.  */
            tcg_debug_assert(s->btype == 0);
        }
    }

    switch (extract32(insn, 25, 4)) {
    case 0x0: case 0x1: case 0x3: /* UNALLOCATED */
        unallocated_encoding(s);
        break;
    case 0x2:
        if (!dc_isar_feature(aa64_sve, s) || !disas_sve(s, insn)) {
            unallocated_encoding(s);
        }
        break;
    case 0x8: case 0x9: /* Data processing - immediate */
        disas_data_proc_imm(s, insn);
        break;
    case 0xa: case 0xb: /* Branch, exception generation and system insns */
        disas_b_exc_sys(s, insn);
        break;
    case 0x4:
    case 0x6:
    case 0xc:
    case 0xe:      /* Loads and stores */
        disas_ldst(s, insn);
        break;
    case 0x5:
    case 0xd:      /* Data processing - register */
        disas_data_proc_reg(s, insn);
        break;
    case 0x7:
    case 0xf:      /* Data processing - SIMD and floating point */
        disas_data_proc_simd_fp(s, insn);
        break;
    default:
        assert(FALSE); /* all 15 cases should be handled above */
        break;
    }

    /* if we allocated any temporaries, free them here */
    free_tmp_a64(s);

    /*
     * After execution of most insns, btype is reset to 0.
     * Note that we set btype == -1 when the insn sets btype.
     */
    if (s->btype > 0 && s->base.is_jmp != DISAS_NORETURN) {
        reset_btype(s);
    }
}